

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx512::forward_fp16s
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  _func_int *p_Var6;
  int *piVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  bool bVar11;
  byte bVar12;
  ulong uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float afVar116 [16];
  float afVar117 [16];
  float afVar118 [16];
  float afVar119 [16];
  float afVar120 [16];
  float afVar121 [16];
  float afVar122 [16];
  float afVar123 [16];
  float afVar124 [16];
  float afVar125 [16];
  float afVar126 [16];
  float afVar127 [16];
  float afVar128 [16];
  float afVar129 [16];
  int iVar130;
  float fVar131;
  long lVar132;
  long lVar133;
  long lVar134;
  ulong uVar135;
  undefined1 (*pauVar136) [32];
  int iVar137;
  uint uVar138;
  int iVar139;
  undefined1 (*pauVar140) [16];
  long lVar141;
  ulong uVar142;
  uint uVar143;
  long lVar144;
  long lVar145;
  long lVar146;
  ulong uVar147;
  long lVar148;
  long lVar149;
  long lVar150;
  undefined1 (*pauVar151) [32];
  long lVar152;
  long lVar153;
  undefined1 (*pauVar154) [16];
  long lVar155;
  long lVar156;
  undefined1 (*pauVar157) [16];
  long lVar158;
  uint uVar159;
  long lVar160;
  long lVar161;
  undefined1 (*pauVar162) [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar221 [16];
  undefined4 extraout_XMM0_Db_04;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined1 auVar226 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  v4sf one_4;
  undefined1 auVar227 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar235 [64];
  undefined1 auVar236 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar256;
  undefined1 auVar247 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  float fVar257;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  v4sf one;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar300 [64];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [64];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [64];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [64];
  undefined1 auVar326 [16];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [64];
  undefined1 auVar331 [16];
  undefined1 auVar330 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar335 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar336 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM29 [64];
  Option opt_flatten;
  undefined4 in_stack_fffffffffffffbec;
  int local_404;
  undefined1 (*local_3a8) [32];
  int *piStack_3a0;
  size_t local_398;
  int local_390;
  Allocator *local_388;
  int local_380;
  int local_37c;
  undefined8 local_378;
  int local_370;
  size_t local_368;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  float local_328;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  ulong local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [32];
  undefined1 local_288 [16];
  float local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined8 local_268;
  undefined1 local_258 [16];
  float local_248;
  undefined1 local_238 [16];
  ulong local_228;
  ulong local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  undefined1 auVar209 [32];
  
  auVar163 = in_ZMM29._0_16_;
  local_380 = bottom_blob->dims;
  if (local_380 == 2) {
    iVar130 = *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
              *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
    local_37c = bottom_blob->w;
    if (bottom_blob->w == iVar130) {
      local_37c = iVar130;
      if (1 < bottom_blob->elempack * bottom_blob->h) {
        Mat::create(top_blob,*(int *)(&this->field_0xd0 +
                                     (long)this->_vptr_InnerProduct_x86_avx512[-3]),bottom_blob->h,
                    bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
        innerproduct_gemm_fp16s_sse
                  (bottom_blob,top_blob,&this->weight_data_tm,
                   *(Mat **)(&this->field_0x178 + (long)p_Var6),
                   *(int *)(&this->field_0xe0 + (long)p_Var6),
                   (Mat *)(&this->field_0xe8 + (long)p_Var6),
                   (Option *)CONCAT44(in_stack_fffffffffffffbec,(uint)opt->use_packing_layout));
        return 0;
      }
    }
  }
  else {
    local_37c = bottom_blob->w;
  }
  piVar7 = bottom_blob->refcount;
  local_3a8 = (undefined1 (*) [32])bottom_blob->data;
  piStack_3a0 = bottom_blob->refcount;
  local_398 = bottom_blob->elemsize;
  local_390 = bottom_blob->elempack;
  local_388 = bottom_blob->allocator;
  local_378._0_4_ = bottom_blob->h;
  local_378._4_4_ = bottom_blob->d;
  local_370 = bottom_blob->c;
  local_368 = bottom_blob->cstep;
  iVar130 = local_380;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
    iVar130 = bottom_blob->dims;
  }
  if (iVar130 != 1) {
    auStack_68 = SUB6448(*opt,0x10);
    local_78 = SUB648(*opt,0);
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_3a8);
  }
  uVar143 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
  uVar159 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar143 & 0xf) == 0) {
      uVar159 = 0x10;
    }
    else if ((uVar143 & 7) == 0) {
      uVar159 = 8;
    }
    else {
      uVar159 = (uint)((uVar143 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(int)uVar143 / (int)uVar159,
              (ulong)uVar159 * (local_398 / (ulong)(long)local_390),uVar159,opt->blob_allocator);
  afVar129 = _ps512_cephes_log_q2;
  afVar128 = _ps512_cephes_log_q1;
  afVar127 = _ps512_cephes_log_p8;
  afVar126 = _ps512_cephes_log_p7;
  afVar125 = _ps512_cephes_exp_p5;
  afVar124 = _ps512_cephes_exp_p4;
  afVar123 = _ps512_cephes_exp_p3;
  afVar122 = _ps512_cephes_exp_p2;
  afVar121 = _ps512_cephes_exp_p1;
  afVar120 = _ps512_cephes_exp_p0;
  afVar119 = _ps512_cephes_LOG2EF;
  afVar118 = _ps512_exp_lo;
  afVar117 = _ps512_exp_hi;
  afVar116 = _ps512_1;
  local_404 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_002f0330;
  if (uVar159 < 8) {
    if (uVar159 == 1) {
      local_404 = 0;
      p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
      uVar5 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var6);
      lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
      uVar143 = local_390 * local_37c;
      iVar130 = top_blob->w;
      uVar135 = (ulong)iVar130;
      if (0 < iVar130 >> 3) {
        uVar142 = (ulong)(uint)(iVar130 >> 3);
        lVar148 = 1;
        lVar141 = 2;
        lVar144 = 3;
        lVar149 = 4;
        lVar152 = 5;
        lVar153 = 6;
        lVar155 = 7;
        lVar161 = 0;
        uVar147 = 0;
        local_228 = uVar142;
        do {
          local_220 = uVar147 * 8;
          auVar300 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar8 != 0) {
            auVar300 = ZEXT3264(*(undefined1 (*) [32])(lVar8 + uVar147 * 0x20));
          }
          auVar194 = auVar300._0_32_;
          lVar146 = (long)(this->weight_data_tm).w;
          pvVar9 = (this->weight_data_tm).data;
          sVar10 = (this->weight_data_tm).elemsize;
          pauVar136 = local_3a8;
          if ((int)uVar143 < 8) {
            lVar146 = sVar10 * lVar146;
            lVar132 = lVar146 * local_220;
            lVar133 = (local_220 | 1) * lVar146;
            lVar134 = (local_220 | 2) * lVar146;
            lVar158 = (local_220 | 3) * lVar146;
            lVar145 = (local_220 | 4) * lVar146;
            lVar150 = (local_220 | 5) * lVar146;
            lVar160 = (local_220 | 6) * lVar146;
            lVar146 = lVar146 * (local_220 | 7);
            uVar159 = 0;
            local_118 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            local_178 = SUB6432(ZEXT864(0),0);
            local_138 = SUB6432(ZEXT864(0),0);
            local_158 = SUB6432(ZEXT864(0),0);
            local_d8 = SUB6432(ZEXT864(0),0);
            local_f8 = SUB6432(ZEXT864(0),0);
            local_b8 = SUB6432(ZEXT864(0),0);
            local_98 = SUB6432(ZEXT864(0),0);
          }
          else {
            lVar132 = sVar10 * lVar161 * lVar146;
            lVar133 = sVar10 * lVar148 * lVar146;
            lVar134 = sVar10 * lVar141 * lVar146;
            lVar158 = sVar10 * lVar144 * lVar146;
            lVar145 = sVar10 * lVar149 * lVar146;
            lVar150 = sVar10 * lVar152 * lVar146;
            lVar160 = sVar10 * lVar153 * lVar146;
            lVar146 = sVar10 * lVar155 * lVar146;
            local_2a8._0_8_ = pvVar9;
            auVar309 = ZEXT864(0);
            auVar314 = ZEXT864(0);
            auVar325 = ZEXT864(0);
            auVar319 = ZEXT864(0);
            auVar235 = ZEXT864(0);
            auVar334 = ZEXT864(0);
            auVar255 = ZEXT864(0);
            auVar329 = ZEXT1664((undefined1  [16])0x0);
            iVar137 = 7;
            lVar156 = 0;
            do {
              auVar195 = *(undefined1 (*) [32])(*local_3a8 + lVar156 * 2);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar156 + lVar132));
              auVar189 = vcvtph2ps_f16c(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar156 + lVar133));
              auVar190 = vcvtph2ps_f16c(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar156 + lVar134));
              auVar191 = vcvtph2ps_f16c(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar156 + lVar158));
              auVar192 = vcvtph2ps_f16c(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar156 + lVar145));
              auVar193 = vcvtph2ps_f16c(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar156 + lVar150));
              auVar202 = vcvtph2ps_f16c(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar156 + lVar160));
              auVar203 = vcvtph2ps_f16c(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar156 + lVar146));
              auVar250 = vcvtph2ps_f16c(auVar163);
              auVar163 = vfmadd231ps_fma(auVar329._0_32_,auVar195,auVar189);
              auVar329 = ZEXT1664(auVar163);
              local_118 = ZEXT1632(auVar163);
              local_178 = vfmadd231ps_avx512vl(auVar255._0_32_,auVar195,auVar190);
              auVar255 = ZEXT3264(local_178);
              auVar163 = vfmadd231ps_fma(auVar334._0_32_,auVar195,auVar191);
              auVar334 = ZEXT1664(auVar163);
              local_138 = ZEXT1632(auVar163);
              auVar163 = vfmadd231ps_fma(auVar235._0_32_,auVar195,auVar192);
              auVar235 = ZEXT1664(auVar163);
              local_158 = ZEXT1632(auVar163);
              auVar163 = vfmadd231ps_fma(auVar319._0_32_,auVar195,auVar193);
              auVar319 = ZEXT1664(auVar163);
              local_d8 = ZEXT1632(auVar163);
              auVar163 = vfmadd231ps_fma(auVar325._0_32_,auVar195,auVar202);
              auVar325 = ZEXT1664(auVar163);
              local_f8 = ZEXT1632(auVar163);
              auVar163 = vfmadd231ps_fma(auVar314._0_32_,auVar195,auVar203);
              auVar314 = ZEXT1664(auVar163);
              local_b8 = ZEXT1632(auVar163);
              auVar163 = vfmadd231ps_fma(auVar309._0_32_,auVar195,auVar250);
              auVar309 = ZEXT1664(auVar163);
              local_98 = ZEXT1632(auVar163);
              pauVar136 = pauVar136 + 1;
              lVar156 = lVar156 + 0x10;
              iVar137 = iVar137 + 8;
            } while (iVar137 < (int)uVar143);
            lVar132 = lVar132 + lVar156;
            lVar133 = lVar133 + lVar156;
            lVar134 = lVar134 + lVar156;
            lVar158 = lVar158 + lVar156;
            lVar145 = lVar145 + lVar156;
            lVar150 = lVar150 + lVar156;
            lVar160 = lVar160 + lVar156;
            lVar146 = lVar146 + lVar156;
            uVar142 = local_228;
            uVar159 = uVar143 & 0xfffffff8;
          }
          local_338._0_8_ = (long)pvVar9 + lVar132;
          local_348._0_8_ = (long)pvVar9 + lVar133;
          local_358._0_8_ = (long)pvVar9 + lVar134;
          local_2f8 = uVar147;
          local_2f0 = lVar161;
          local_2e8 = lVar153;
          local_2e0 = lVar152;
          local_2d8 = lVar149;
          local_2d0 = lVar144;
          local_2c8 = lVar141;
          local_2c0 = lVar148;
          if ((int)uVar159 < (int)uVar143) {
            lVar148 = 0;
            do {
              local_2a8 = auVar300._0_32_;
              local_308 = ZEXT416(*(uint *)(*pauVar136 + lVar148 * 4));
              fVar256 = float16_to_float32(*(unsigned_short *)(local_338._0_8_ + lVar148 * 2));
              auVar194 = _local_218;
              local_218._4_4_ = extraout_XMM0_Db;
              local_218._0_4_ = fVar256;
              fStack_210 = (float)extraout_XMM0_Dc;
              _fStack_208 = auVar194._16_16_;
              fStack_20c = (float)extraout_XMM0_Dd;
              local_318 = ZEXT416(*(uint *)(*pauVar136 + lVar148 * 4));
              local_328 = float16_to_float32(*(unsigned_short *)(local_348._0_8_ + lVar148 * 2));
              local_238 = ZEXT416(*(uint *)(*pauVar136 + lVar148 * 4));
              local_248 = float16_to_float32(*(unsigned_short *)(local_358._0_8_ + lVar148 * 2));
              local_258 = ZEXT416(*(uint *)(*pauVar136 + lVar148 * 4));
              fVar256 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar148 * 2 + lVar158)
                                          );
              local_268 = CONCAT44(extraout_XMM0_Db_00,fVar256);
              local_2b8 = ZEXT416(*(uint *)(*pauVar136 + lVar148 * 4));
              local_278 = float16_to_float32(*(unsigned_short *)
                                              ((long)pvVar9 + lVar148 * 2 + lVar145));
              local_198._0_16_ = ZEXT416(*(uint *)(*pauVar136 + lVar148 * 4));
              uStack_274 = extraout_XMM0_Db_01;
              uStack_270 = extraout_XMM0_Dc_00;
              uStack_26c = extraout_XMM0_Dd_00;
              fVar256 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar148 * 2 + lVar150)
                                          );
              auVar194 = local_1b8;
              local_1b8._4_4_ = extraout_XMM0_Db_02;
              local_1b8._0_4_ = fVar256;
              local_1b8._8_4_ = extraout_XMM0_Dc_01;
              local_1b8._16_16_ = auVar194._16_16_;
              local_1b8._12_4_ = extraout_XMM0_Dd_01;
              local_1d8._0_16_ = ZEXT416(*(uint *)(*pauVar136 + lVar148 * 4));
              fVar256 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar148 * 2 + lVar160)
                                          );
              auVar194 = local_1f8;
              local_1f8._4_4_ = extraout_XMM0_Db_03;
              local_1f8._0_4_ = fVar256;
              local_1f8._8_4_ = extraout_XMM0_Dc_02;
              local_1f8._16_16_ = auVar194._16_16_;
              local_1f8._12_4_ = extraout_XMM0_Dd_02;
              local_288 = ZEXT416(*(uint *)(*pauVar136 + lVar148 * 4));
              auVar300._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar148 * 2 + lVar146));
              auVar300._4_60_ = extraout_var;
              auVar163._4_4_ = uStack_274;
              auVar163._0_4_ = local_278;
              auVar163._8_4_ = uStack_270;
              auVar163._12_4_ = uStack_26c;
              auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_1b8._0_4_),0x10);
              auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_1f8._0_4_),0x20);
              auVar163 = vinsertps_avx(auVar163,auVar300._0_16_,0x30);
              auVar164 = vinsertps_avx(_local_218,ZEXT416((uint)local_328),0x10);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_248),0x20);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_268),0x30);
              auVar194._16_16_ = auVar163;
              auVar194._0_16_ = auVar164;
              auVar163 = vinsertps_avx(local_2b8,ZEXT416((uint)local_198._0_4_),0x10);
              auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_1d8._0_4_),0x20);
              auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_288._0_4_),0x30);
              auVar164 = vinsertps_avx(local_308,ZEXT416((uint)local_318._0_4_),0x10);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_238._0_4_),0x20);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_258._0_4_),0x30);
              auVar195._16_16_ = auVar163;
              auVar195._0_16_ = auVar164;
              auVar163 = vfmadd231ps_fma(local_2a8,auVar194,auVar195);
              auVar300 = ZEXT1664(auVar163);
              auVar194 = ZEXT1632(auVar163);
              lVar148 = lVar148 + 1;
            } while (uVar143 - uVar159 != (int)lVar148);
          }
          auVar195 = vhaddps_avx(local_118,local_178);
          auVar189 = vhaddps_avx(local_138,local_158);
          auVar189 = vhaddps_avx(auVar195,auVar189);
          auVar195 = vhaddps_avx(local_d8,local_f8);
          auVar190 = vhaddps_avx(local_b8,local_98);
          auVar190 = vhaddps_avx(auVar195,auVar190);
          auVar195 = vblendps_avx(auVar189,auVar190,0xf0);
          auVar190 = vperm2f128_avx(auVar189,auVar190,0x21);
          auVar189._0_4_ = auVar194._0_4_ + auVar190._0_4_ + auVar195._0_4_;
          auVar189._4_4_ = auVar194._4_4_ + auVar190._4_4_ + auVar195._4_4_;
          auVar189._8_4_ = auVar194._8_4_ + auVar190._8_4_ + auVar195._8_4_;
          auVar189._12_4_ = auVar194._12_4_ + auVar190._12_4_ + auVar195._12_4_;
          auVar189._16_4_ = auVar194._16_4_ + auVar190._16_4_ + auVar195._16_4_;
          auVar189._20_4_ = auVar194._20_4_ + auVar190._20_4_ + auVar195._20_4_;
          auVar189._24_4_ = auVar194._24_4_ + auVar190._24_4_ + auVar195._24_4_;
          auVar189._28_4_ = auVar194._28_4_ + auVar190._28_4_ + auVar195._28_4_;
          switch(uVar5) {
          case 1:
            auVar189 = vmaxps_avx(auVar189,_DAT_00527820);
            break;
          case 2:
            auVar194 = vmaxps_avx(auVar189,ZEXT832(0) << 0x20);
            auVar195 = vminps_avx(auVar189,ZEXT832(0) << 0x20);
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar87._4_4_ = uVar1;
            auVar87._0_4_ = uVar1;
            auVar87._8_4_ = uVar1;
            auVar87._12_4_ = uVar1;
            auVar87._16_4_ = uVar1;
            auVar87._20_4_ = uVar1;
            auVar87._24_4_ = uVar1;
            auVar87._28_4_ = uVar1;
            auVar189 = vfmadd132ps_avx512vl(auVar195,auVar194,auVar87);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar85._4_4_ = uVar1;
            auVar85._0_4_ = uVar1;
            auVar85._8_4_ = uVar1;
            auVar85._12_4_ = uVar1;
            auVar85._16_4_ = uVar1;
            auVar85._20_4_ = uVar1;
            auVar85._24_4_ = uVar1;
            auVar85._28_4_ = uVar1;
            auVar194 = vmaxps_avx512vl(auVar189,auVar85);
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar86._4_4_ = uVar1;
            auVar86._0_4_ = uVar1;
            auVar86._8_4_ = uVar1;
            auVar86._12_4_ = uVar1;
            auVar86._16_4_ = uVar1;
            auVar86._20_4_ = uVar1;
            auVar86._24_4_ = uVar1;
            auVar86._28_4_ = uVar1;
            auVar189 = vminps_avx512vl(auVar194,auVar86);
            break;
          case 4:
            auVar74._8_4_ = 0x80000000;
            auVar74._0_8_ = 0x8000000080000000;
            auVar74._12_4_ = 0x80000000;
            auVar74._16_4_ = 0x80000000;
            auVar74._20_4_ = 0x80000000;
            auVar74._24_4_ = 0x80000000;
            auVar74._28_4_ = 0x80000000;
            auVar194 = vxorps_avx512vl(auVar189,auVar74);
            auVar75._8_4_ = 0x42b0c0a5;
            auVar75._0_8_ = 0x42b0c0a542b0c0a5;
            auVar75._12_4_ = 0x42b0c0a5;
            auVar75._16_4_ = 0x42b0c0a5;
            auVar75._20_4_ = 0x42b0c0a5;
            auVar75._24_4_ = 0x42b0c0a5;
            auVar75._28_4_ = 0x42b0c0a5;
            auVar194 = vminps_avx512vl(auVar194,auVar75);
            auVar76._8_4_ = 0xc2b0c0a5;
            auVar76._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar76._12_4_ = 0xc2b0c0a5;
            auVar76._16_4_ = 0xc2b0c0a5;
            auVar76._20_4_ = 0xc2b0c0a5;
            auVar76._24_4_ = 0xc2b0c0a5;
            auVar76._28_4_ = 0xc2b0c0a5;
            auVar195 = vmaxps_avx512vl(auVar194,auVar76);
            auVar275._8_4_ = 0x3f000000;
            auVar275._0_8_ = 0x3f0000003f000000;
            auVar275._12_4_ = 0x3f000000;
            auVar275._16_4_ = 0x3f000000;
            auVar275._20_4_ = 0x3f000000;
            auVar275._24_4_ = 0x3f000000;
            auVar275._28_4_ = 0x3f000000;
            auVar77._8_4_ = 0x3fb8aa3b;
            auVar77._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar77._12_4_ = 0x3fb8aa3b;
            auVar77._16_4_ = 0x3fb8aa3b;
            auVar77._20_4_ = 0x3fb8aa3b;
            auVar77._24_4_ = 0x3fb8aa3b;
            auVar77._28_4_ = 0x3fb8aa3b;
            auVar189 = vfmadd231ps_avx512vl(auVar275,auVar195,auVar77);
            auVar194 = vroundps_avx(auVar189,1);
            uVar147 = vcmpps_avx512vl(auVar189,auVar194,1);
            auVar284._8_4_ = 0x3f800000;
            auVar284._0_8_ = 0x3f8000003f800000;
            auVar284._12_4_ = 0x3f800000;
            auVar284._16_4_ = 0x3f800000;
            auVar284._20_4_ = 0x3f800000;
            auVar284._24_4_ = 0x3f800000;
            auVar284._28_4_ = 0x3f800000;
            auVar190 = vsubps_avx512vl(auVar194,auVar284);
            bVar11 = (bool)((byte)uVar147 & 1);
            auVar201._0_4_ = (float)((uint)bVar11 * auVar190._0_4_ | (uint)!bVar11 * auVar194._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar147 >> 1) & 1);
            auVar201._4_4_ = (float)((uint)bVar11 * auVar190._4_4_ | (uint)!bVar11 * auVar194._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar147 >> 2) & 1);
            auVar201._8_4_ = (float)((uint)bVar11 * auVar190._8_4_ | (uint)!bVar11 * auVar194._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar147 >> 3) & 1);
            auVar201._12_4_ =
                 (float)((uint)bVar11 * auVar190._12_4_ | (uint)!bVar11 * auVar194._12_4_);
            bVar11 = (bool)((byte)(uVar147 >> 4) & 1);
            auVar201._16_4_ =
                 (float)((uint)bVar11 * auVar190._16_4_ | (uint)!bVar11 * auVar194._16_4_);
            bVar11 = (bool)((byte)(uVar147 >> 5) & 1);
            auVar201._20_4_ =
                 (float)((uint)bVar11 * auVar190._20_4_ | (uint)!bVar11 * auVar194._20_4_);
            bVar11 = (bool)((byte)(uVar147 >> 6) & 1);
            auVar201._24_4_ =
                 (float)((uint)bVar11 * auVar190._24_4_ | (uint)!bVar11 * auVar194._24_4_);
            bVar11 = SUB81(uVar147 >> 7,0);
            auVar201._28_4_ =
                 (float)((uint)bVar11 * auVar190._28_4_ | (uint)!bVar11 * auVar194._28_4_);
            auVar78._8_4_ = 0x3f318000;
            auVar78._0_8_ = 0x3f3180003f318000;
            auVar78._12_4_ = 0x3f318000;
            auVar78._16_4_ = 0x3f318000;
            auVar78._20_4_ = 0x3f318000;
            auVar78._24_4_ = 0x3f318000;
            auVar78._28_4_ = 0x3f318000;
            auVar194 = vfmsub231ps_avx512vl(auVar195,auVar201,auVar78);
            auVar79._8_4_ = 0x395e8083;
            auVar79._0_8_ = 0x395e8083395e8083;
            auVar79._12_4_ = 0x395e8083;
            auVar79._16_4_ = 0x395e8083;
            auVar79._20_4_ = 0x395e8083;
            auVar79._24_4_ = 0x395e8083;
            auVar79._28_4_ = 0x395e8083;
            auVar194 = vfmsub231ps_avx512vl(auVar194,auVar201,auVar79);
            auVar115._4_4_ = auVar194._4_4_ * auVar194._4_4_;
            auVar115._0_4_ = auVar194._0_4_ * auVar194._0_4_;
            auVar115._8_4_ = auVar194._8_4_ * auVar194._8_4_;
            auVar115._12_4_ = auVar194._12_4_ * auVar194._12_4_;
            auVar115._16_4_ = auVar194._16_4_ * auVar194._16_4_;
            auVar115._20_4_ = auVar194._20_4_ * auVar194._20_4_;
            auVar115._24_4_ = auVar194._24_4_ * auVar194._24_4_;
            auVar115._28_4_ = auVar189._28_4_;
            auVar269._8_4_ = 0x39506967;
            auVar269._0_8_ = 0x3950696739506967;
            auVar269._12_4_ = 0x39506967;
            auVar269._16_4_ = 0x39506967;
            auVar269._20_4_ = 0x39506967;
            auVar269._24_4_ = 0x39506967;
            auVar269._28_4_ = 0x39506967;
            auVar80._8_4_ = 0x3ab743ce;
            auVar80._0_8_ = 0x3ab743ce3ab743ce;
            auVar80._12_4_ = 0x3ab743ce;
            auVar80._16_4_ = 0x3ab743ce;
            auVar80._20_4_ = 0x3ab743ce;
            auVar80._24_4_ = 0x3ab743ce;
            auVar80._28_4_ = 0x3ab743ce;
            auVar195 = vfmadd213ps_avx512vl(auVar269,auVar194,auVar80);
            auVar81._8_4_ = 0x3c088908;
            auVar81._0_8_ = 0x3c0889083c088908;
            auVar81._12_4_ = 0x3c088908;
            auVar81._16_4_ = 0x3c088908;
            auVar81._20_4_ = 0x3c088908;
            auVar81._24_4_ = 0x3c088908;
            auVar81._28_4_ = 0x3c088908;
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar194,auVar81);
            auVar82._8_4_ = 0x3d2aa9c1;
            auVar82._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar82._12_4_ = 0x3d2aa9c1;
            auVar82._16_4_ = 0x3d2aa9c1;
            auVar82._20_4_ = 0x3d2aa9c1;
            auVar82._24_4_ = 0x3d2aa9c1;
            auVar82._28_4_ = 0x3d2aa9c1;
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar194,auVar82);
            auVar83._8_4_ = 0x3e2aaaaa;
            auVar83._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar83._12_4_ = 0x3e2aaaaa;
            auVar83._16_4_ = 0x3e2aaaaa;
            auVar83._20_4_ = 0x3e2aaaaa;
            auVar83._24_4_ = 0x3e2aaaaa;
            auVar83._28_4_ = 0x3e2aaaaa;
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar194,auVar83);
            auVar163 = vfmadd213ps_fma(auVar195,auVar194,auVar275);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar115,auVar194);
            auVar233._0_4_ = auVar163._0_4_ + 1.0;
            auVar233._4_4_ = auVar163._4_4_ + 1.0;
            auVar233._8_4_ = auVar163._8_4_ + 1.0;
            auVar233._12_4_ = auVar163._12_4_ + 1.0;
            auVar233._16_4_ = 0x3f800000;
            auVar233._20_4_ = 0x3f800000;
            auVar233._24_4_ = 0x3f800000;
            auVar233._28_4_ = 0x3f800000;
            auVar226._0_4_ = (int)auVar201._0_4_;
            auVar226._4_4_ = (int)auVar201._4_4_;
            auVar226._8_4_ = (int)auVar201._8_4_;
            auVar226._12_4_ = (int)auVar201._12_4_;
            auVar226._16_4_ = (int)auVar201._16_4_;
            auVar226._20_4_ = (int)auVar201._20_4_;
            auVar226._24_4_ = (int)auVar201._24_4_;
            auVar226._28_4_ = (int)auVar201._28_4_;
            auVar194 = vpslld_avx2(auVar226,0x17);
            auVar84._8_4_ = 0x3f800000;
            auVar84._0_8_ = 0x3f8000003f800000;
            auVar84._12_4_ = 0x3f800000;
            auVar84._16_4_ = 0x3f800000;
            auVar84._20_4_ = 0x3f800000;
            auVar84._24_4_ = 0x3f800000;
            auVar84._28_4_ = 0x3f800000;
            auVar194 = vpaddd_avx512vl(auVar194,auVar84);
            auVar163 = vfmadd213ps_fma(auVar194,auVar233,auVar284);
            auVar194 = vrcpps_avx(ZEXT1632(auVar163));
            auVar163 = vfmsub213ps_fma(ZEXT1632(auVar163),auVar194,auVar284);
            auVar163 = vfnmadd132ps_fma(ZEXT1632(auVar163),auVar194,auVar194);
            auVar189 = ZEXT1632(auVar163);
            break;
          case 5:
            auVar288._8_4_ = 0x42b0c0a5;
            auVar288._0_8_ = 0x42b0c0a542b0c0a5;
            auVar288._12_4_ = 0x42b0c0a5;
            auVar288._16_4_ = 0x42b0c0a5;
            auVar288._20_4_ = 0x42b0c0a5;
            auVar288._24_4_ = 0x42b0c0a5;
            auVar288._28_4_ = 0x42b0c0a5;
            auVar194 = vminps_avx(auVar189,auVar288);
            auVar293._8_4_ = 0xc2b0c0a5;
            auVar293._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar293._12_4_ = 0xc2b0c0a5;
            auVar293._16_4_ = 0xc2b0c0a5;
            auVar293._20_4_ = 0xc2b0c0a5;
            auVar293._24_4_ = 0xc2b0c0a5;
            auVar293._28_4_ = 0xc2b0c0a5;
            auVar194 = vmaxps_avx(auVar194,auVar293);
            auVar303._8_4_ = 0x3fb8aa3b;
            auVar303._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar303._12_4_ = 0x3fb8aa3b;
            auVar303._16_4_ = 0x3fb8aa3b;
            auVar303._20_4_ = 0x3fb8aa3b;
            auVar303._24_4_ = 0x3fb8aa3b;
            auVar303._28_4_ = 0x3fb8aa3b;
            auVar297._8_4_ = 0x3f000000;
            auVar297._0_8_ = 0x3f0000003f000000;
            auVar297._12_4_ = 0x3f000000;
            auVar297._16_4_ = 0x3f000000;
            auVar297._20_4_ = 0x3f000000;
            auVar297._24_4_ = 0x3f000000;
            auVar297._28_4_ = 0x3f000000;
            auVar163 = vfmadd213ps_fma(auVar303,auVar194,auVar297);
            auVar195 = vroundps_avx(ZEXT1632(auVar163),1);
            uVar147 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar195,1);
            auVar307._8_4_ = 0x3f800000;
            auVar307._0_8_ = 0x3f8000003f800000;
            auVar307._12_4_ = 0x3f800000;
            auVar307._16_4_ = 0x3f800000;
            auVar307._20_4_ = 0x3f800000;
            auVar307._24_4_ = 0x3f800000;
            auVar307._28_4_ = 0x3f800000;
            auVar190 = vsubps_avx512vl(auVar195,auVar307);
            bVar11 = (bool)((byte)uVar147 & 1);
            auVar196._0_4_ = (float)((uint)bVar11 * auVar190._0_4_ | (uint)!bVar11 * auVar195._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar147 >> 1) & 1);
            auVar196._4_4_ = (float)((uint)bVar11 * auVar190._4_4_ | (uint)!bVar11 * auVar195._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar147 >> 2) & 1);
            auVar196._8_4_ = (float)((uint)bVar11 * auVar190._8_4_ | (uint)!bVar11 * auVar195._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar147 >> 3) & 1);
            auVar196._12_4_ =
                 (float)((uint)bVar11 * auVar190._12_4_ | (uint)!bVar11 * auVar195._12_4_);
            bVar11 = (bool)((byte)(uVar147 >> 4) & 1);
            auVar196._16_4_ =
                 (float)((uint)bVar11 * auVar190._16_4_ | (uint)!bVar11 * auVar195._16_4_);
            bVar11 = (bool)((byte)(uVar147 >> 5) & 1);
            auVar196._20_4_ =
                 (float)((uint)bVar11 * auVar190._20_4_ | (uint)!bVar11 * auVar195._20_4_);
            bVar11 = (bool)((byte)(uVar147 >> 6) & 1);
            auVar196._24_4_ =
                 (float)((uint)bVar11 * auVar190._24_4_ | (uint)!bVar11 * auVar195._24_4_);
            bVar11 = SUB81(uVar147 >> 7,0);
            auVar196._28_4_ =
                 (float)((uint)bVar11 * auVar190._28_4_ | (uint)!bVar11 * auVar195._28_4_);
            auVar312._8_4_ = 0x3f318000;
            auVar312._0_8_ = 0x3f3180003f318000;
            auVar312._12_4_ = 0x3f318000;
            auVar312._16_4_ = 0x3f318000;
            auVar312._20_4_ = 0x3f318000;
            auVar312._24_4_ = 0x3f318000;
            auVar312._28_4_ = 0x3f318000;
            auVar163 = vfmsub231ps_fma(auVar194,auVar196,auVar312);
            auVar190 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar194 = vfnmsub231ps_avx512vl(ZEXT1632(auVar163),auVar196,auVar190);
            auVar248._0_4_ = auVar194._0_4_ * auVar194._0_4_;
            auVar248._4_4_ = auVar194._4_4_ * auVar194._4_4_;
            auVar248._8_4_ = auVar194._8_4_ * auVar194._8_4_;
            auVar248._12_4_ = auVar194._12_4_ * auVar194._12_4_;
            auVar248._16_4_ = auVar194._16_4_ * auVar194._16_4_;
            auVar248._20_4_ = auVar194._20_4_ * auVar194._20_4_;
            auVar248._24_4_ = auVar194._24_4_ * auVar194._24_4_;
            auVar248._28_4_ = 0;
            auVar317._8_4_ = 0x39506967;
            auVar317._0_8_ = 0x3950696739506967;
            auVar317._12_4_ = 0x39506967;
            auVar317._16_4_ = 0x39506967;
            auVar317._20_4_ = 0x39506967;
            auVar317._24_4_ = 0x39506967;
            auVar317._28_4_ = 0x39506967;
            auVar323._8_4_ = 0x3ab743ce;
            auVar323._0_8_ = 0x3ab743ce3ab743ce;
            auVar323._12_4_ = 0x3ab743ce;
            auVar323._16_4_ = 0x3ab743ce;
            auVar323._20_4_ = 0x3ab743ce;
            auVar323._24_4_ = 0x3ab743ce;
            auVar323._28_4_ = 0x3ab743ce;
            auVar163 = vfmadd213ps_fma(auVar317,auVar194,auVar323);
            auVar327._8_4_ = 0x3c088908;
            auVar327._0_8_ = 0x3c0889083c088908;
            auVar327._12_4_ = 0x3c088908;
            auVar327._16_4_ = 0x3c088908;
            auVar327._20_4_ = 0x3c088908;
            auVar327._24_4_ = 0x3c088908;
            auVar327._28_4_ = 0x3c088908;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar194,auVar327);
            auVar332._8_4_ = 0x3d2aa9c1;
            auVar332._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar332._12_4_ = 0x3d2aa9c1;
            auVar332._16_4_ = 0x3d2aa9c1;
            auVar332._20_4_ = 0x3d2aa9c1;
            auVar332._24_4_ = 0x3d2aa9c1;
            auVar332._28_4_ = 0x3d2aa9c1;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar194,auVar332);
            auVar191 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar195 = vfmadd213ps_avx512vl(ZEXT1632(auVar163),auVar194,auVar191);
            auVar163 = vfmadd213ps_fma(auVar195,auVar194,auVar297);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar248,auVar194);
            auVar231._0_4_ = auVar163._0_4_ + 1.0;
            auVar231._4_4_ = auVar163._4_4_ + 1.0;
            auVar231._8_4_ = auVar163._8_4_ + 1.0;
            auVar231._12_4_ = auVar163._12_4_ + 1.0;
            auVar231._16_4_ = 0x3f800000;
            auVar231._20_4_ = 0x3f800000;
            auVar231._24_4_ = 0x3f800000;
            auVar231._28_4_ = 0x3f800000;
            auVar249._0_4_ = (int)auVar196._0_4_;
            auVar249._4_4_ = (int)auVar196._4_4_;
            auVar249._8_4_ = (int)auVar196._8_4_;
            auVar249._12_4_ = (int)auVar196._12_4_;
            auVar249._16_4_ = (int)auVar196._16_4_;
            auVar249._20_4_ = (int)auVar196._20_4_;
            auVar249._24_4_ = (int)auVar196._24_4_;
            auVar249._28_4_ = (int)auVar196._28_4_;
            auVar194 = vpslld_avx2(auVar249,0x17);
            auVar192 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar194 = vpaddd_avx512vl(auVar194,auVar192);
            auVar163 = vfmadd213ps_fma(auVar194,auVar231,auVar307);
            uVar147 = vcmpps_avx512vl(ZEXT1632(auVar163),_DAT_00527820,2);
            auVar193._8_4_ = 0x800000;
            auVar193._0_8_ = 0x80000000800000;
            auVar193._12_4_ = 0x800000;
            auVar193._16_4_ = 0x800000;
            auVar193._20_4_ = 0x800000;
            auVar193._24_4_ = 0x800000;
            auVar193._28_4_ = 0x800000;
            auVar194 = vmaxps_avx512vl(ZEXT1632(auVar163),auVar193);
            auVar250 = vpsrld_avx2(auVar194,0x17);
            auVar268._8_4_ = 0x807fffff;
            auVar268._0_8_ = 0x807fffff807fffff;
            auVar268._12_4_ = 0x807fffff;
            auVar268._16_4_ = 0x807fffff;
            auVar268._20_4_ = 0x807fffff;
            auVar268._24_4_ = 0x807fffff;
            auVar268._28_4_ = 0x807fffff;
            auVar202._8_4_ = 0x3f000000;
            auVar202._0_8_ = 0x3f0000003f000000;
            auVar202._12_4_ = 0x3f000000;
            auVar202._16_4_ = 0x3f000000;
            auVar202._20_4_ = 0x3f000000;
            auVar202._24_4_ = 0x3f000000;
            auVar202._28_4_ = 0x3f000000;
            auVar194 = vpternlogd_avx512vl(auVar194,auVar268,auVar202,0xea);
            auVar203._8_4_ = 0x3f3504f3;
            auVar203._0_8_ = 0x3f3504f33f3504f3;
            auVar203._12_4_ = 0x3f3504f3;
            auVar203._16_4_ = 0x3f3504f3;
            auVar203._20_4_ = 0x3f3504f3;
            auVar203._24_4_ = 0x3f3504f3;
            auVar203._28_4_ = 0x3f3504f3;
            uVar13 = vcmpps_avx512vl(auVar194,auVar203,1);
            auVar193 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
            auVar195 = vaddps_avx512vl(auVar194,auVar193);
            auVar202 = vaddps_avx512vl(auVar195,auVar194);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar197._0_4_ = (float)((uint)bVar11 * auVar202._0_4_ | (uint)!bVar11 * auVar195._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar197._4_4_ = (float)((uint)bVar11 * auVar202._4_4_ | (uint)!bVar11 * auVar195._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar197._8_4_ = (float)((uint)bVar11 * auVar202._8_4_ | (uint)!bVar11 * auVar195._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar197._12_4_ =
                 (float)((uint)bVar11 * auVar202._12_4_ | (uint)!bVar11 * auVar195._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar197._16_4_ =
                 (float)((uint)bVar11 * auVar202._16_4_ | (uint)!bVar11 * auVar195._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar197._20_4_ =
                 (float)((uint)bVar11 * auVar202._20_4_ | (uint)!bVar11 * auVar195._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar197._24_4_ =
                 (float)((uint)bVar11 * auVar202._24_4_ | (uint)!bVar11 * auVar195._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar197._28_4_ = (uint)bVar11 * auVar202._28_4_ | (uint)!bVar11 * auVar195._28_4_;
            auVar113._4_4_ = auVar197._4_4_ * auVar197._4_4_;
            auVar113._0_4_ = auVar197._0_4_ * auVar197._0_4_;
            auVar113._8_4_ = auVar197._8_4_ * auVar197._8_4_;
            auVar113._12_4_ = auVar197._12_4_ * auVar197._12_4_;
            auVar113._16_4_ = auVar197._16_4_ * auVar197._16_4_;
            auVar113._20_4_ = auVar197._20_4_ * auVar197._20_4_;
            auVar113._24_4_ = auVar197._24_4_ * auVar197._24_4_;
            auVar113._28_4_ = auVar194._28_4_;
            auVar274._8_4_ = 0x3d9021bb;
            auVar274._0_8_ = 0x3d9021bb3d9021bb;
            auVar274._12_4_ = 0x3d9021bb;
            auVar274._16_4_ = 0x3d9021bb;
            auVar274._20_4_ = 0x3d9021bb;
            auVar274._24_4_ = 0x3d9021bb;
            auVar274._28_4_ = 0x3d9021bb;
            auVar65._8_4_ = 0xbdebd1b8;
            auVar65._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar65._12_4_ = 0xbdebd1b8;
            auVar65._16_4_ = 0xbdebd1b8;
            auVar65._20_4_ = 0xbdebd1b8;
            auVar65._24_4_ = 0xbdebd1b8;
            auVar65._28_4_ = 0xbdebd1b8;
            auVar194 = vfmadd213ps_avx512vl(auVar274,auVar197,auVar65);
            auVar66._8_4_ = 0x3def251a;
            auVar66._0_8_ = 0x3def251a3def251a;
            auVar66._12_4_ = 0x3def251a;
            auVar66._16_4_ = 0x3def251a;
            auVar66._20_4_ = 0x3def251a;
            auVar66._24_4_ = 0x3def251a;
            auVar66._28_4_ = 0x3def251a;
            auVar194 = vfmadd213ps_avx512vl(auVar194,auVar197,auVar66);
            auVar67._8_4_ = 0xbdfe5d4f;
            auVar67._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar67._12_4_ = 0xbdfe5d4f;
            auVar67._16_4_ = 0xbdfe5d4f;
            auVar67._20_4_ = 0xbdfe5d4f;
            auVar67._24_4_ = 0xbdfe5d4f;
            auVar67._28_4_ = 0xbdfe5d4f;
            auVar194 = vfmadd213ps_avx512vl(auVar194,auVar197,auVar67);
            auVar68._8_4_ = 0x3e11e9bf;
            auVar68._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar68._12_4_ = 0x3e11e9bf;
            auVar68._16_4_ = 0x3e11e9bf;
            auVar68._20_4_ = 0x3e11e9bf;
            auVar68._24_4_ = 0x3e11e9bf;
            auVar68._28_4_ = 0x3e11e9bf;
            auVar194 = vfmadd213ps_avx512vl(auVar194,auVar197,auVar68);
            auVar69._8_4_ = 0xbe2aae50;
            auVar69._0_8_ = 0xbe2aae50be2aae50;
            auVar69._12_4_ = 0xbe2aae50;
            auVar69._16_4_ = 0xbe2aae50;
            auVar69._20_4_ = 0xbe2aae50;
            auVar69._24_4_ = 0xbe2aae50;
            auVar69._28_4_ = 0xbe2aae50;
            auVar194 = vfmadd213ps_avx512vl(auVar194,auVar197,auVar69);
            auVar70._8_4_ = 0x3e4cceac;
            auVar70._0_8_ = 0x3e4cceac3e4cceac;
            auVar70._12_4_ = 0x3e4cceac;
            auVar70._16_4_ = 0x3e4cceac;
            auVar70._20_4_ = 0x3e4cceac;
            auVar70._24_4_ = 0x3e4cceac;
            auVar70._28_4_ = 0x3e4cceac;
            auVar194 = vfmadd213ps_avx512vl(auVar194,auVar197,auVar70);
            auVar71._8_4_ = 0xbe7ffffc;
            auVar71._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar71._12_4_ = 0xbe7ffffc;
            auVar71._16_4_ = 0xbe7ffffc;
            auVar71._20_4_ = 0xbe7ffffc;
            auVar71._24_4_ = 0xbe7ffffc;
            auVar71._28_4_ = 0xbe7ffffc;
            auVar194 = vfmadd213ps_avx512vl(auVar194,auVar197,auVar71);
            auVar72._8_4_ = 0x3eaaaaaa;
            auVar72._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar72._12_4_ = 0x3eaaaaaa;
            auVar72._16_4_ = 0x3eaaaaaa;
            auVar72._20_4_ = 0x3eaaaaaa;
            auVar72._24_4_ = 0x3eaaaaaa;
            auVar72._28_4_ = 0x3eaaaaaa;
            auVar194 = vfmadd213ps_avx512vl(auVar194,auVar197,auVar72);
            auVar114._4_4_ = auVar197._4_4_ * auVar197._4_4_ * auVar197._4_4_ * auVar194._4_4_;
            auVar114._0_4_ = auVar197._0_4_ * auVar197._0_4_ * auVar197._0_4_ * auVar194._0_4_;
            auVar114._8_4_ = auVar197._8_4_ * auVar197._8_4_ * auVar197._8_4_ * auVar194._8_4_;
            auVar114._12_4_ = auVar197._12_4_ * auVar197._12_4_ * auVar197._12_4_ * auVar194._12_4_;
            auVar114._16_4_ = auVar197._16_4_ * auVar197._16_4_ * auVar197._16_4_ * auVar194._16_4_;
            auVar114._20_4_ = auVar197._20_4_ * auVar197._20_4_ * auVar197._20_4_ * auVar194._20_4_;
            auVar114._24_4_ = auVar197._24_4_ * auVar197._24_4_ * auVar197._24_4_ * auVar194._24_4_;
            auVar114._28_4_ = auVar194._28_4_;
            auVar73._8_4_ = 0xffffff82;
            auVar73._0_8_ = 0xffffff82ffffff82;
            auVar73._12_4_ = 0xffffff82;
            auVar73._16_4_ = 0xffffff82;
            auVar73._20_4_ = 0xffffff82;
            auVar73._24_4_ = 0xffffff82;
            auVar73._28_4_ = 0xffffff82;
            auVar194 = vpaddd_avx512vl(auVar250,auVar73);
            auVar194 = vcvtdq2ps_avx(auVar194);
            auVar195 = vsubps_avx512vl(auVar194,auVar307);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar198._0_4_ = (uint)bVar11 * auVar195._0_4_ | (uint)!bVar11 * auVar194._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar198._4_4_ = (uint)bVar11 * auVar195._4_4_ | (uint)!bVar11 * auVar194._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar198._8_4_ = (uint)bVar11 * auVar195._8_4_ | (uint)!bVar11 * auVar194._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar198._12_4_ = (uint)bVar11 * auVar195._12_4_ | (uint)!bVar11 * auVar194._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar198._16_4_ = (uint)bVar11 * auVar195._16_4_ | (uint)!bVar11 * auVar194._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar198._20_4_ = (uint)bVar11 * auVar195._20_4_ | (uint)!bVar11 * auVar194._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar198._24_4_ = (uint)bVar11 * auVar195._24_4_ | (uint)!bVar11 * auVar194._24_4_;
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar198._28_4_ = (uint)bVar11 * auVar195._28_4_ | (uint)!bVar11 * auVar194._28_4_;
            auVar194 = vfmadd231ps_avx512vl(auVar114,auVar198,auVar190);
            auVar163 = vfmsub231ps_fma(auVar194,auVar297,auVar113);
            auVar194 = vsubps_avx(ZEXT1632(auVar163),auVar197);
            auVar163 = vfmsub231ps_fma(auVar194,auVar312,auVar198);
            auVar283._8_4_ = 0xc0000000;
            auVar283._0_8_ = 0xc0000000c0000000;
            auVar283._12_4_ = 0xc0000000;
            auVar283._16_4_ = 0xc0000000;
            auVar283._20_4_ = 0xc0000000;
            auVar283._24_4_ = 0xc0000000;
            auVar283._28_4_ = 0xc0000000;
            auVar194 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar147 & 1);
            auVar199._0_4_ =
                 (uint)bVar11 * auVar194._0_4_ | (uint)!bVar11 * (int)(auVar163._0_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar147 >> 1) & 1);
            auVar199._4_4_ =
                 (uint)bVar11 * auVar194._4_4_ | (uint)!bVar11 * (int)(auVar163._4_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar147 >> 2) & 1);
            auVar199._8_4_ =
                 (uint)bVar11 * auVar194._8_4_ | (uint)!bVar11 * (int)(auVar163._8_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar147 >> 3) & 1);
            auVar199._12_4_ =
                 (uint)bVar11 * auVar194._12_4_ | (uint)!bVar11 * (int)(auVar163._12_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar147 >> 4) & 1);
            auVar199._16_4_ = (uint)bVar11 * auVar194._16_4_ | (uint)!bVar11 * -0x80000000;
            bVar11 = (bool)((byte)(uVar147 >> 5) & 1);
            auVar199._20_4_ = (uint)bVar11 * auVar194._20_4_ | (uint)!bVar11 * -0x80000000;
            bVar11 = (bool)((byte)(uVar147 >> 6) & 1);
            auVar199._24_4_ = (uint)bVar11 * auVar194._24_4_ | (uint)!bVar11 * -0x80000000;
            auVar199._28_4_ = (uint)(byte)(uVar147 >> 7) * auVar194._28_4_;
            auVar194 = vminps_avx(auVar199,auVar288);
            auVar194 = vmaxps_avx(auVar194,auVar293);
            auVar163 = vfmadd213ps_fma(auVar303,auVar194,auVar297);
            auVar195 = vroundps_avx(ZEXT1632(auVar163),1);
            uVar147 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar195,1);
            auVar202 = vsubps_avx512vl(auVar195,auVar307);
            bVar11 = (bool)((byte)uVar147 & 1);
            auVar200._0_4_ = (float)((uint)bVar11 * auVar202._0_4_ | (uint)!bVar11 * auVar195._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar147 >> 1) & 1);
            auVar200._4_4_ = (float)((uint)bVar11 * auVar202._4_4_ | (uint)!bVar11 * auVar195._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar147 >> 2) & 1);
            auVar200._8_4_ = (float)((uint)bVar11 * auVar202._8_4_ | (uint)!bVar11 * auVar195._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar147 >> 3) & 1);
            auVar200._12_4_ =
                 (float)((uint)bVar11 * auVar202._12_4_ | (uint)!bVar11 * auVar195._12_4_);
            bVar11 = (bool)((byte)(uVar147 >> 4) & 1);
            auVar200._16_4_ =
                 (float)((uint)bVar11 * auVar202._16_4_ | (uint)!bVar11 * auVar195._16_4_);
            bVar11 = (bool)((byte)(uVar147 >> 5) & 1);
            auVar200._20_4_ =
                 (float)((uint)bVar11 * auVar202._20_4_ | (uint)!bVar11 * auVar195._20_4_);
            bVar11 = (bool)((byte)(uVar147 >> 6) & 1);
            auVar200._24_4_ =
                 (float)((uint)bVar11 * auVar202._24_4_ | (uint)!bVar11 * auVar195._24_4_);
            bVar11 = SUB81(uVar147 >> 7,0);
            auVar200._28_4_ =
                 (float)((uint)bVar11 * auVar202._28_4_ | (uint)!bVar11 * auVar195._28_4_);
            auVar163 = vfmsub231ps_fma(auVar194,auVar200,auVar312);
            auVar194 = vfnmsub231ps_avx512vl(ZEXT1632(auVar163),auVar200,auVar190);
            auVar251._0_4_ = auVar194._0_4_ * auVar194._0_4_;
            auVar251._4_4_ = auVar194._4_4_ * auVar194._4_4_;
            auVar251._8_4_ = auVar194._8_4_ * auVar194._8_4_;
            auVar251._12_4_ = auVar194._12_4_ * auVar194._12_4_;
            auVar251._16_4_ = auVar194._16_4_ * auVar194._16_4_;
            auVar251._20_4_ = auVar194._20_4_ * auVar194._20_4_;
            auVar251._24_4_ = auVar194._24_4_ * auVar194._24_4_;
            auVar251._28_4_ = 0;
            auVar163 = vfmadd213ps_fma(auVar317,auVar194,auVar323);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar194,auVar327);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar194,auVar332);
            auVar195 = vfmadd213ps_avx512vl(ZEXT1632(auVar163),auVar194,auVar191);
            auVar163 = vfmadd213ps_fma(auVar195,auVar194,auVar297);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar251,auVar194);
            auVar232._0_4_ = auVar163._0_4_ + 1.0;
            auVar232._4_4_ = auVar163._4_4_ + 1.0;
            auVar232._8_4_ = auVar163._8_4_ + 1.0;
            auVar232._12_4_ = auVar163._12_4_ + 1.0;
            auVar232._16_4_ = 0x3f800000;
            auVar232._20_4_ = 0x3f800000;
            auVar232._24_4_ = 0x3f800000;
            auVar232._28_4_ = 0x3f800000;
            auVar252._0_4_ = (int)auVar200._0_4_;
            auVar252._4_4_ = (int)auVar200._4_4_;
            auVar252._8_4_ = (int)auVar200._8_4_;
            auVar252._12_4_ = (int)auVar200._12_4_;
            auVar252._16_4_ = (int)auVar200._16_4_;
            auVar252._20_4_ = (int)auVar200._20_4_;
            auVar252._24_4_ = (int)auVar200._24_4_;
            auVar252._28_4_ = (int)auVar200._28_4_;
            auVar194 = vpslld_avx2(auVar252,0x17);
            auVar194 = vpaddd_avx512vl(auVar194,auVar192);
            auVar163 = vfmadd213ps_fma(auVar194,auVar232,auVar307);
            auVar194 = vrcpps_avx(ZEXT1632(auVar163));
            auVar163 = vfmsub213ps_fma(ZEXT1632(auVar163),auVar194,auVar307);
            auVar163 = vfnmadd132ps_fma(ZEXT1632(auVar163),auVar194,auVar194);
            auVar194 = vfnmadd213ps_avx512vl(ZEXT1632(auVar163),auVar283,auVar193);
            auVar189._4_4_ = auVar194._4_4_ * auVar189._4_4_;
            auVar189._0_4_ = auVar194._0_4_ * auVar189._0_4_;
            auVar189._8_4_ = auVar194._8_4_ * auVar189._8_4_;
            auVar189._12_4_ = auVar194._12_4_ * auVar189._12_4_;
            auVar189._16_4_ = auVar194._16_4_ * auVar189._16_4_;
            auVar189._20_4_ = auVar194._20_4_ * auVar189._20_4_;
            auVar189._24_4_ = auVar194._24_4_ * auVar189._24_4_;
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar192._4_4_ = uVar1;
            auVar192._0_4_ = uVar1;
            auVar192._8_4_ = uVar1;
            auVar192._12_4_ = uVar1;
            auVar192._16_4_ = uVar1;
            auVar192._20_4_ = uVar1;
            auVar192._24_4_ = uVar1;
            auVar192._28_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar190._4_4_ = uVar1;
            auVar190._0_4_ = uVar1;
            auVar190._8_4_ = uVar1;
            auVar190._12_4_ = uVar1;
            auVar190._16_4_ = uVar1;
            auVar190._20_4_ = uVar1;
            auVar190._24_4_ = uVar1;
            auVar190._28_4_ = uVar1;
            auVar194 = vfmadd213ps_avx512vl(auVar192,auVar189,auVar190);
            auVar194 = vmaxps_avx(auVar194,_DAT_00527820);
            auVar191._8_4_ = 0x3f800000;
            auVar191._0_8_ = 0x3f8000003f800000;
            auVar191._12_4_ = 0x3f800000;
            auVar191._16_4_ = 0x3f800000;
            auVar191._20_4_ = 0x3f800000;
            auVar191._24_4_ = 0x3f800000;
            auVar191._28_4_ = 0x3f800000;
            auVar194 = vminps_avx512vl(auVar194,auVar191);
            auVar189._4_4_ = auVar194._4_4_ * auVar189._4_4_;
            auVar189._0_4_ = auVar194._0_4_ * auVar189._0_4_;
            auVar189._8_4_ = auVar194._8_4_ * auVar189._8_4_;
            auVar189._12_4_ = auVar194._12_4_ * auVar189._12_4_;
            auVar189._16_4_ = auVar194._16_4_ * auVar189._16_4_;
            auVar189._20_4_ = auVar194._20_4_ * auVar189._20_4_;
            auVar189._24_4_ = auVar194._24_4_ * auVar189._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + local_220 * 4) = auVar189;
          uVar147 = local_2f8 + 1;
          lVar161 = local_2f0 + 8;
          lVar148 = local_2c0 + 8;
          lVar141 = local_2c8 + 8;
          lVar144 = local_2d0 + 8;
          lVar149 = local_2d8 + 8;
          lVar152 = local_2e0 + 8;
          lVar153 = local_2e8 + 8;
          lVar155 = lVar155 + 8;
        } while (uVar147 != uVar142);
      }
      uVar142 = uVar135 & 0xfffffffffffffff8;
      fVar256 = (float)((uint)(uVar135 >> 2) & 1);
      if ((uVar135 >> 2 & 1) != 0) {
        uStack_274 = 0;
        if (lVar8 == 0) {
          auVar163 = ZEXT816(0) << 0x40;
        }
        else {
          auVar163 = *(undefined1 (*) [16])(lVar8 + uVar142 * 4);
        }
        lVar148 = (long)(this->weight_data_tm).w * (this->weight_data_tm).elemsize;
        pvVar9 = (this->weight_data_tm).data;
        pauVar140 = (undefined1 (*) [16])(lVar148 * uVar142 + (long)pvVar9);
        pauVar162 = (undefined1 (*) [16])((uVar142 | 1) * lVar148 + (long)pvVar9);
        pauVar154 = (undefined1 (*) [16])((uVar142 | 2) * lVar148 + (long)pvVar9);
        pauVar157 = (undefined1 (*) [16])(lVar148 * (uVar142 | 3) + (long)pvVar9);
        pauVar136 = local_3a8;
        if ((int)uVar143 < 8) {
          uVar159 = 0;
          local_1b8 = SUB6432(ZEXT864(0),0);
          local_1f8 = SUB6432(ZEXT864(0),0);
          local_1d8 = SUB6432(ZEXT864(0),0);
          local_198 = SUB6432(ZEXT864(0),0);
        }
        else {
          uVar159 = uVar143 & 0xfffffff8;
          auVar300 = ZEXT864(0);
          iVar137 = 7;
          auVar255 = ZEXT864(0);
          auVar309 = ZEXT864(0);
          auVar235 = ZEXT864(0);
          do {
            auVar194 = *pauVar136;
            auVar164 = vlddqu_avx(*pauVar140);
            auVar195 = vcvtph2ps_f16c(auVar164);
            auVar164 = vlddqu_avx(*pauVar162);
            auVar189 = vcvtph2ps_f16c(auVar164);
            auVar164 = vlddqu_avx(*pauVar154);
            auVar190 = vcvtph2ps_f16c(auVar164);
            auVar164 = vlddqu_avx(*pauVar157);
            auVar191 = vcvtph2ps_f16c(auVar164);
            auVar164 = vfmadd231ps_fma(auVar235._0_32_,auVar194,auVar195);
            auVar235 = ZEXT1664(auVar164);
            local_1b8 = ZEXT1632(auVar164);
            auVar164 = vfmadd231ps_fma(auVar309._0_32_,auVar194,auVar189);
            auVar309 = ZEXT1664(auVar164);
            local_1f8 = ZEXT1632(auVar164);
            auVar164 = vfmadd231ps_fma(auVar255._0_32_,auVar194,auVar190);
            auVar255 = ZEXT1664(auVar164);
            local_1d8 = ZEXT1632(auVar164);
            auVar164 = vfmadd231ps_fma(auVar300._0_32_,auVar194,auVar191);
            auVar300 = ZEXT1664(auVar164);
            local_198 = ZEXT1632(auVar164);
            pauVar136 = pauVar136 + 1;
            pauVar140 = pauVar140 + 1;
            pauVar162 = pauVar162 + 1;
            pauVar154 = pauVar154 + 1;
            pauVar157 = pauVar157 + 1;
            iVar137 = iVar137 + 8;
          } while (iVar137 < (int)uVar143);
        }
        local_288 = ZEXT816(0) << 0x40;
        local_2b8._0_8_ = uVar142;
        if ((int)(uVar159 | 3) < (int)uVar143) {
          auVar300 = ZEXT864(0);
          lVar148 = 0;
          auVar235 = ZEXT864(0);
          local_358 = ZEXT816(0);
          pauVar151 = pauVar136;
          uVar138 = uVar159;
          do {
            auVar164._8_8_ = 0;
            auVar164._0_8_ = *(ulong *)(*pauVar140 + lVar148);
            auVar168 = vcvtph2ps_f16c(auVar164);
            auVar165._8_8_ = 0;
            auVar165._0_8_ = *(ulong *)(*pauVar162 + lVar148);
            auVar165 = vcvtph2ps_f16c(auVar165);
            auVar166._8_8_ = 0;
            auVar166._0_8_ = *(ulong *)(*pauVar154 + lVar148);
            auVar166 = vcvtph2ps_f16c(auVar166);
            auVar164 = *(undefined1 (*) [16])(*pauVar136 + lVar148 * 2);
            auVar167._8_8_ = 0;
            auVar167._0_8_ = *(ulong *)(*pauVar157 + lVar148);
            auVar167 = vcvtph2ps_f16c(auVar167);
            local_288 = vfmadd231ps_fma(local_288,auVar164,auVar168);
            local_358 = vfmadd231ps_fma(local_358,auVar164,auVar165);
            local_348 = vfmadd231ps_fma(auVar235._0_16_,auVar164,auVar166);
            auVar235 = ZEXT1664(local_348);
            local_338 = vfmadd231ps_fma(auVar300._0_16_,auVar164,auVar167);
            auVar300 = ZEXT1664(local_338);
            pauVar151 = (undefined1 (*) [32])(*pauVar151 + 0x10);
            uVar159 = uVar138 + 4;
            lVar148 = lVar148 + 8;
            iVar137 = uVar138 + 7;
            uVar138 = uVar159;
          } while (iVar137 < (int)uVar143);
          pauVar140 = (undefined1 (*) [16])(*pauVar140 + lVar148);
          pauVar162 = (undefined1 (*) [16])(*pauVar162 + lVar148);
          pauVar154 = (undefined1 (*) [16])(*pauVar154 + lVar148);
          pauVar157 = (undefined1 (*) [16])(*pauVar157 + lVar148);
          pauVar136 = pauVar151;
        }
        else {
          local_358 = ZEXT816(0);
          local_348 = SUB6416(ZEXT864(0),0);
          local_338 = SUB6416(ZEXT864(0),0);
        }
        local_268 = (ulong)(uVar143 - uVar159);
        local_278 = fVar256;
        if (uVar143 - uVar159 != 0 && (int)uVar159 <= (int)uVar143) {
          lVar148 = 0;
          do {
            local_2a8._0_16_ = auVar163;
            local_308 = ZEXT416(*(uint *)(*pauVar136 + lVar148 * 4));
            fVar256 = float16_to_float32(*(unsigned_short *)(*pauVar140 + lVar148 * 2));
            auVar194 = _local_218;
            local_218._4_4_ = extraout_XMM0_Db_04;
            local_218._0_4_ = fVar256;
            fStack_210 = (float)extraout_XMM0_Dc_03;
            _fStack_208 = auVar194._16_16_;
            fStack_20c = (float)extraout_XMM0_Dd_03;
            local_318 = ZEXT416(*(uint *)(*pauVar136 + lVar148 * 4));
            local_328 = float16_to_float32(*(unsigned_short *)(*pauVar162 + lVar148 * 2));
            local_238 = ZEXT416(*(uint *)(*pauVar136 + lVar148 * 4));
            local_248 = float16_to_float32(*(unsigned_short *)(*pauVar154 + lVar148 * 2));
            local_258 = ZEXT416(*(uint *)(*pauVar136 + lVar148 * 4));
            auVar235._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar157 + lVar148 * 2));
            auVar235._4_60_ = extraout_var_00;
            auVar163 = vinsertps_avx(_local_218,ZEXT416((uint)local_328),0x10);
            auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_248),0x20);
            auVar163 = vinsertps_avx(auVar163,auVar235._0_16_,0x30);
            auVar164 = vinsertps_avx(local_308,ZEXT416((uint)local_318._0_4_),0x10);
            auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_238._0_4_),0x20);
            auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_258._0_4_),0x30);
            auVar163 = vfmadd231ps_fma(local_2a8._0_16_,auVar163,auVar164);
            lVar148 = lVar148 + 1;
          } while ((uint)local_268 != (int)lVar148);
        }
        auVar194 = vhaddps_avx(local_1b8,local_1f8);
        auVar195 = vhaddps_avx(local_1d8,local_198);
        auVar194 = vhaddps_avx(auVar194,auVar195);
        auVar165 = vunpcklps_avx(local_288,local_358);
        auVar166 = vunpcklps_avx(local_348,local_338);
        auVar167 = vunpckhps_avx(local_288,local_358);
        auVar168 = vunpckhps_avx(local_348,local_338);
        auVar164 = vmovlhps_avx(auVar165,auVar166);
        auVar166 = vunpckhpd_avx(auVar165,auVar166);
        auVar165 = vmovlhps_avx(auVar167,auVar168);
        auVar167 = vunpckhpd_avx(auVar167,auVar168);
        auVar168._0_4_ =
             auVar166._0_4_ + auVar164._0_4_ + auVar165._0_4_ + auVar167._0_4_ +
             auVar163._0_4_ + auVar194._0_4_ + auVar194._16_4_;
        auVar168._4_4_ =
             auVar166._4_4_ + auVar164._4_4_ + auVar165._4_4_ + auVar167._4_4_ +
             auVar163._4_4_ + auVar194._4_4_ + auVar194._20_4_;
        auVar168._8_4_ =
             auVar166._8_4_ + auVar164._8_4_ + auVar165._8_4_ + auVar167._8_4_ +
             auVar163._8_4_ + auVar194._8_4_ + auVar194._24_4_;
        auVar168._12_4_ =
             auVar166._12_4_ + auVar164._12_4_ + auVar165._12_4_ + auVar167._12_4_ +
             auVar163._12_4_ + auVar194._12_4_ + auVar194._28_4_;
        switch(uVar5) {
        case 1:
          auVar168 = vmaxps_avx(auVar168,ZEXT816(0) << 0x20);
          break;
        case 2:
          auVar163 = vmaxps_avx(auVar168,ZEXT816(0) << 0x20);
          auVar164 = vminps_avx(auVar168,ZEXT816(0) << 0x20);
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar53._4_4_ = uVar1;
          auVar53._0_4_ = uVar1;
          auVar53._8_4_ = uVar1;
          auVar53._12_4_ = uVar1;
          auVar168 = vfmadd132ps_avx512vl(auVar164,auVar163,auVar53);
          break;
        case 3:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar51._4_4_ = uVar1;
          auVar51._0_4_ = uVar1;
          auVar51._8_4_ = uVar1;
          auVar51._12_4_ = uVar1;
          auVar163 = vmaxps_avx512vl(auVar168,auVar51);
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar52._4_4_ = uVar1;
          auVar52._0_4_ = uVar1;
          auVar52._8_4_ = uVar1;
          auVar52._12_4_ = uVar1;
          auVar168 = vminps_avx512vl(auVar163,auVar52);
          break;
        case 4:
          auVar41._8_4_ = 0x80000000;
          auVar41._0_8_ = 0x8000000080000000;
          auVar41._12_4_ = 0x80000000;
          auVar163 = vxorps_avx512vl(auVar168,auVar41);
          auVar42._8_4_ = 0x42b0c0a5;
          auVar42._0_8_ = 0x42b0c0a542b0c0a5;
          auVar42._12_4_ = 0x42b0c0a5;
          auVar163 = vminps_avx512vl(auVar163,auVar42);
          auVar43._8_4_ = 0xc2b0c0a5;
          auVar43._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar43._12_4_ = 0xc2b0c0a5;
          auVar165 = vmaxps_avx512vl(auVar163,auVar43);
          auVar229._8_4_ = 0x3f000000;
          auVar229._0_8_ = 0x3f0000003f000000;
          auVar229._12_4_ = 0x3f000000;
          auVar245._8_4_ = 0x3fb8aa3b;
          auVar245._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar245._12_4_ = 0x3fb8aa3b;
          auVar164 = vfmadd213ps_fma(auVar245,auVar165,auVar229);
          auVar267._0_4_ = (int)auVar164._0_4_;
          auVar267._4_4_ = (int)auVar164._4_4_;
          auVar267._8_4_ = (int)auVar164._8_4_;
          auVar267._12_4_ = (int)auVar164._12_4_;
          auVar163 = vcvtdq2ps_avx(auVar267);
          auVar273._8_4_ = 0x3f800000;
          auVar273._0_8_ = 0x3f8000003f800000;
          auVar273._12_4_ = 0x3f800000;
          uVar142 = vcmpps_avx512vl(auVar164,auVar163,1);
          auVar164 = vsubps_avx512vl(auVar163,auVar273);
          bVar11 = (bool)((byte)uVar142 & 1);
          auVar188._0_4_ = (float)((uint)bVar11 * auVar164._0_4_ | (uint)!bVar11 * auVar163._0_4_);
          bVar11 = (bool)((byte)(uVar142 >> 1) & 1);
          auVar188._4_4_ = (float)((uint)bVar11 * auVar164._4_4_ | (uint)!bVar11 * auVar163._4_4_);
          bVar11 = (bool)((byte)(uVar142 >> 2) & 1);
          auVar188._8_4_ = (float)((uint)bVar11 * auVar164._8_4_ | (uint)!bVar11 * auVar163._8_4_);
          bVar11 = (bool)((byte)(uVar142 >> 3) & 1);
          auVar188._12_4_ =
               (float)((uint)bVar11 * auVar164._12_4_ | (uint)!bVar11 * auVar163._12_4_);
          auVar44._8_4_ = 0x3f318000;
          auVar44._0_8_ = 0x3f3180003f318000;
          auVar44._12_4_ = 0x3f318000;
          auVar163 = vfmsub231ps_avx512vl(auVar165,auVar188,auVar44);
          auVar45._8_4_ = 0x395e8083;
          auVar45._0_8_ = 0x395e8083395e8083;
          auVar45._12_4_ = 0x395e8083;
          auVar164 = vfmsub231ps_avx512vl(auVar163,auVar188,auVar45);
          auVar246._8_4_ = 0x39506967;
          auVar246._0_8_ = 0x3950696739506967;
          auVar246._12_4_ = 0x39506967;
          auVar46._8_4_ = 0x3ab743ce;
          auVar46._0_8_ = 0x3ab743ce3ab743ce;
          auVar46._12_4_ = 0x3ab743ce;
          auVar163 = vfmadd213ps_avx512vl(auVar246,auVar164,auVar46);
          auVar47._8_4_ = 0x3c088908;
          auVar47._0_8_ = 0x3c0889083c088908;
          auVar47._12_4_ = 0x3c088908;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar164,auVar47);
          auVar48._8_4_ = 0x3d2aa9c1;
          auVar48._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar48._12_4_ = 0x3d2aa9c1;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar164,auVar48);
          auVar49._8_4_ = 0x3e2aaaaa;
          auVar49._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar49._12_4_ = 0x3e2aaaaa;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar164,auVar49);
          auVar282._0_4_ = auVar164._0_4_ * auVar164._0_4_;
          auVar282._4_4_ = auVar164._4_4_ * auVar164._4_4_;
          auVar282._8_4_ = auVar164._8_4_ * auVar164._8_4_;
          auVar282._12_4_ = auVar164._12_4_ * auVar164._12_4_;
          auVar163 = vfmadd213ps_fma(auVar163,auVar164,auVar229);
          auVar163 = vfmadd213ps_fma(auVar163,auVar282,auVar164);
          auVar230._0_4_ = auVar163._0_4_ + 1.0;
          auVar230._4_4_ = auVar163._4_4_ + 1.0;
          auVar230._8_4_ = auVar163._8_4_ + 1.0;
          auVar230._12_4_ = auVar163._12_4_ + 1.0;
          auVar222._0_4_ = (int)auVar188._0_4_;
          auVar222._4_4_ = (int)auVar188._4_4_;
          auVar222._8_4_ = (int)auVar188._8_4_;
          auVar222._12_4_ = (int)auVar188._12_4_;
          auVar163 = vpslld_avx(auVar222,0x17);
          auVar50._8_4_ = 0x3f800000;
          auVar50._0_8_ = 0x3f8000003f800000;
          auVar50._12_4_ = 0x3f800000;
          auVar163 = vpaddd_avx512vl(auVar163,auVar50);
          auVar164 = vfmadd213ps_fma(auVar163,auVar230,auVar273);
          auVar163 = vrcpps_avx(auVar164);
          auVar164 = vfmsub213ps_fma(auVar164,auVar163,auVar273);
          auVar168 = vfnmadd132ps_fma(auVar164,auVar163,auVar163);
          break;
        case 5:
          auVar287._8_4_ = 0x42b0c0a5;
          auVar287._0_8_ = 0x42b0c0a542b0c0a5;
          auVar287._12_4_ = 0x42b0c0a5;
          auVar163 = vminps_avx(auVar168,auVar287);
          auVar291._8_4_ = 0xc2b0c0a5;
          auVar291._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar291._12_4_ = 0xc2b0c0a5;
          auVar271._8_4_ = 0x3fb8aa3b;
          auVar271._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar271._12_4_ = 0x3fb8aa3b;
          auVar164 = vmaxps_avx(auVar163,auVar291);
          auVar242._8_4_ = 0x3f000000;
          auVar242._0_8_ = 0x3f0000003f000000;
          auVar242._12_4_ = 0x3f000000;
          auVar165 = vfmadd213ps_fma(auVar271,auVar164,auVar242);
          auVar264._0_4_ = (int)auVar165._0_4_;
          auVar264._4_4_ = (int)auVar165._4_4_;
          auVar264._8_4_ = (int)auVar165._8_4_;
          auVar264._12_4_ = (int)auVar165._12_4_;
          auVar163 = vcvtdq2ps_avx(auVar264);
          uVar142 = vcmpps_avx512vl(auVar165,auVar163,1);
          auVar228._8_4_ = 0x3f800000;
          auVar228._0_8_ = 0x3f8000003f800000;
          auVar228._12_4_ = 0x3f800000;
          auVar265._8_4_ = 0x3f318000;
          auVar265._0_8_ = 0x3f3180003f318000;
          auVar265._12_4_ = 0x3f318000;
          auVar165 = vsubps_avx512vl(auVar163,auVar228);
          bVar11 = (bool)((byte)uVar142 & 1);
          auVar183._0_4_ = (float)((uint)bVar11 * auVar165._0_4_ | (uint)!bVar11 * auVar163._0_4_);
          bVar11 = (bool)((byte)(uVar142 >> 1) & 1);
          auVar183._4_4_ = (float)((uint)bVar11 * auVar165._4_4_ | (uint)!bVar11 * auVar163._4_4_);
          bVar11 = (bool)((byte)(uVar142 >> 2) & 1);
          auVar183._8_4_ = (float)((uint)bVar11 * auVar165._8_4_ | (uint)!bVar11 * auVar163._8_4_);
          bVar11 = (bool)((byte)(uVar142 >> 3) & 1);
          auVar183._12_4_ =
               (float)((uint)bVar11 * auVar165._12_4_ | (uint)!bVar11 * auVar163._12_4_);
          auVar163 = vfmsub231ps_fma(auVar164,auVar183,auVar265);
          auVar296._8_4_ = 0xb95e8083;
          auVar296._0_8_ = 0xb95e8083b95e8083;
          auVar296._12_4_ = 0xb95e8083;
          auVar163 = vfnmsub231ps_fma(auVar163,auVar183,auVar296);
          auVar331._0_4_ = auVar163._0_4_ * auVar163._0_4_;
          auVar331._4_4_ = auVar163._4_4_ * auVar163._4_4_;
          auVar331._8_4_ = auVar163._8_4_ * auVar163._8_4_;
          auVar331._12_4_ = auVar163._12_4_ * auVar163._12_4_;
          auVar302._8_4_ = 0x3ab743ce;
          auVar302._0_8_ = 0x3ab743ce3ab743ce;
          auVar302._12_4_ = 0x3ab743ce;
          auVar281._8_4_ = 0x39506967;
          auVar281._0_8_ = 0x3950696739506967;
          auVar281._12_4_ = 0x39506967;
          auVar164 = vfmadd213ps_avx512vl(auVar281,auVar163,auVar302);
          auVar306._8_4_ = 0x3c088908;
          auVar306._0_8_ = 0x3c0889083c088908;
          auVar306._12_4_ = 0x3c088908;
          auVar311._8_4_ = 0x3d2aa9c1;
          auVar311._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar311._12_4_ = 0x3d2aa9c1;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar163,auVar306);
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar163,auVar311);
          auVar316._8_4_ = 0x3e2aaaaa;
          auVar316._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar316._12_4_ = 0x3e2aaaaa;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar163,auVar316);
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar163,auVar242);
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar331,auVar163);
          auVar165 = vaddps_avx512vl(auVar164,auVar228);
          auVar321._0_4_ = (int)auVar183._0_4_;
          auVar321._4_4_ = (int)auVar183._4_4_;
          auVar321._8_4_ = (int)auVar183._8_4_;
          auVar321._12_4_ = (int)auVar183._12_4_;
          auVar163 = vpslld_avx(auVar321,0x17);
          auVar322._8_4_ = 0x3f800000;
          auVar322._0_8_ = 0x3f8000003f800000;
          auVar322._12_4_ = 0x3f800000;
          auVar163 = vpaddd_avx(auVar163,auVar322);
          auVar163 = vfmadd213ps_fma(auVar163,auVar165,auVar228);
          auVar171._8_4_ = 0x800000;
          auVar171._0_8_ = 0x80000000800000;
          auVar171._12_4_ = 0x800000;
          auVar165 = vmaxps_avx512vl(auVar163,auVar171);
          auVar164 = vxorps_avx512vl(auVar164,auVar164);
          auVar166 = vpsrld_avx512vl(auVar165,0x17);
          auVar167 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
          auVar172._8_4_ = 0x807fffff;
          auVar172._0_8_ = 0x807fffff807fffff;
          auVar172._12_4_ = 0x807fffff;
          auVar165 = vpternlogd_avx512vl(auVar167,auVar165,auVar172,0xf8);
          auVar173._8_4_ = 0xffffff82;
          auVar173._0_8_ = 0xffffff82ffffff82;
          auVar173._12_4_ = 0xffffff82;
          auVar166 = vpaddd_avx512vl(auVar166,auVar173);
          uVar142 = vcmpps_avx512vl(auVar163,auVar164,2);
          auVar163 = vcvtdq2ps_avx(auVar166);
          auVar174._8_4_ = 0x3f3504f3;
          auVar174._0_8_ = 0x3f3504f33f3504f3;
          auVar174._12_4_ = 0x3f3504f3;
          uVar147 = vcmpps_avx512vl(auVar165,auVar174,1);
          auVar31._8_4_ = 0xbf800000;
          auVar31._0_8_ = 0xbf800000bf800000;
          auVar31._12_4_ = 0xbf800000;
          auVar164 = vaddps_avx512vl(auVar165,auVar31);
          auVar166 = vsubps_avx512vl(auVar163,auVar228);
          bVar11 = (bool)((byte)uVar147 & 1);
          auVar184._0_4_ = (uint)bVar11 * auVar166._0_4_ | (uint)!bVar11 * auVar163._0_4_;
          bVar11 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar184._4_4_ = (uint)bVar11 * auVar166._4_4_ | (uint)!bVar11 * auVar163._4_4_;
          bVar11 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar184._8_4_ = (uint)bVar11 * auVar166._8_4_ | (uint)!bVar11 * auVar163._8_4_;
          bVar11 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar184._12_4_ = (uint)bVar11 * auVar166._12_4_ | (uint)!bVar11 * auVar163._12_4_;
          auVar163 = vaddps_avx512vl(auVar164,auVar165);
          bVar11 = (bool)((byte)uVar147 & 1);
          auVar185._0_4_ = (uint)bVar11 * auVar163._0_4_ | (uint)!bVar11 * auVar164._0_4_;
          bVar11 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar185._4_4_ = (uint)bVar11 * auVar163._4_4_ | (uint)!bVar11 * auVar164._4_4_;
          bVar11 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar185._8_4_ = (uint)bVar11 * auVar163._8_4_ | (uint)!bVar11 * auVar164._8_4_;
          bVar11 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar185._12_4_ = (uint)bVar11 * auVar163._12_4_ | (uint)!bVar11 * auVar164._12_4_;
          auVar163 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar32._8_4_ = 0xbdebd1b8;
          auVar32._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar32._12_4_ = 0xbdebd1b8;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar32);
          auVar33._8_4_ = 0x3def251a;
          auVar33._0_8_ = 0x3def251a3def251a;
          auVar33._12_4_ = 0x3def251a;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar33);
          auVar34._8_4_ = 0xbdfe5d4f;
          auVar34._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar34._12_4_ = 0xbdfe5d4f;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar34);
          auVar35._8_4_ = 0x3e11e9bf;
          auVar35._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar35._12_4_ = 0x3e11e9bf;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar35);
          auVar36._8_4_ = 0xbe2aae50;
          auVar36._0_8_ = 0xbe2aae50be2aae50;
          auVar36._12_4_ = 0xbe2aae50;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar36);
          auVar37._8_4_ = 0x3e4cceac;
          auVar37._0_8_ = 0x3e4cceac3e4cceac;
          auVar37._12_4_ = 0x3e4cceac;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar37);
          auVar38._8_4_ = 0xbe7ffffc;
          auVar38._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar38._12_4_ = 0xbe7ffffc;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar38);
          auVar164 = vmulps_avx512vl(auVar185,auVar185);
          auVar39._8_4_ = 0x3eaaaaaa;
          auVar39._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar39._12_4_ = 0x3eaaaaaa;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar39);
          auVar165 = vmulps_avx512vl(auVar164,auVar185);
          auVar163 = vmulps_avx512vl(auVar165,auVar163);
          auVar163 = vfmadd231ps_avx512vl(auVar163,auVar184,auVar296);
          auVar163 = vfmsub231ps_avx512vl(auVar163,auVar242,auVar164);
          auVar163 = vsubps_avx512vl(auVar163,auVar185);
          auVar163 = vfnmadd231ps_fma(auVar163,auVar265,auVar184);
          auVar164 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar11 = (bool)((byte)uVar142 & 1);
          auVar186._0_4_ =
               (uint)bVar11 * auVar164._0_4_ |
               (uint)!bVar11 * (int)(auVar163._0_4_ + auVar163._0_4_);
          bVar11 = (bool)((byte)(uVar142 >> 1) & 1);
          auVar186._4_4_ =
               (uint)bVar11 * auVar164._4_4_ |
               (uint)!bVar11 * (int)(auVar163._4_4_ + auVar163._4_4_);
          bVar11 = (bool)((byte)(uVar142 >> 2) & 1);
          auVar186._8_4_ =
               (uint)bVar11 * auVar164._8_4_ |
               (uint)!bVar11 * (int)(auVar163._8_4_ + auVar163._8_4_);
          bVar11 = (bool)((byte)(uVar142 >> 3) & 1);
          auVar186._12_4_ =
               (uint)bVar11 * auVar164._12_4_ |
               (uint)!bVar11 * (int)(auVar163._12_4_ + auVar163._12_4_);
          auVar163 = vminps_avx(auVar186,auVar287);
          auVar164 = vmaxps_avx(auVar163,auVar291);
          auVar165 = vfmadd213ps_fma(auVar271,auVar164,auVar242);
          auVar292._0_4_ = (int)auVar165._0_4_;
          auVar292._4_4_ = (int)auVar165._4_4_;
          auVar292._8_4_ = (int)auVar165._8_4_;
          auVar292._12_4_ = (int)auVar165._12_4_;
          auVar163 = vcvtdq2ps_avx(auVar292);
          uVar142 = vcmpps_avx512vl(auVar165,auVar163,1);
          auVar165 = vsubps_avx512vl(auVar163,auVar228);
          bVar11 = (bool)((byte)uVar142 & 1);
          auVar187._0_4_ = (float)((uint)bVar11 * auVar165._0_4_ | (uint)!bVar11 * auVar163._0_4_);
          bVar11 = (bool)((byte)(uVar142 >> 1) & 1);
          auVar187._4_4_ = (float)((uint)bVar11 * auVar165._4_4_ | (uint)!bVar11 * auVar163._4_4_);
          bVar11 = (bool)((byte)(uVar142 >> 2) & 1);
          auVar187._8_4_ = (float)((uint)bVar11 * auVar165._8_4_ | (uint)!bVar11 * auVar163._8_4_);
          bVar11 = (bool)((byte)(uVar142 >> 3) & 1);
          auVar187._12_4_ =
               (float)((uint)bVar11 * auVar165._12_4_ | (uint)!bVar11 * auVar163._12_4_);
          auVar163 = vfmsub213ps_fma(auVar265,auVar187,auVar164);
          auVar164 = vfnmsub231ps_fma(auVar163,auVar187,auVar296);
          auVar272._0_4_ = auVar164._0_4_ * auVar164._0_4_;
          auVar272._4_4_ = auVar164._4_4_ * auVar164._4_4_;
          auVar272._8_4_ = auVar164._8_4_ * auVar164._8_4_;
          auVar272._12_4_ = auVar164._12_4_ * auVar164._12_4_;
          auVar163 = vfmadd213ps_fma(auVar281,auVar164,auVar302);
          auVar163 = vfmadd213ps_fma(auVar163,auVar164,auVar306);
          auVar163 = vfmadd213ps_fma(auVar163,auVar164,auVar311);
          auVar163 = vfmadd213ps_fma(auVar163,auVar164,auVar316);
          auVar163 = vfmadd213ps_fma(auVar163,auVar164,auVar242);
          auVar163 = vfmadd213ps_fma(auVar163,auVar272,auVar164);
          auVar243._0_4_ = auVar163._0_4_ + 1.0;
          auVar243._4_4_ = auVar163._4_4_ + 1.0;
          auVar243._8_4_ = auVar163._8_4_ + 1.0;
          auVar243._12_4_ = auVar163._12_4_ + 1.0;
          auVar266._0_4_ = (int)auVar187._0_4_;
          auVar266._4_4_ = (int)auVar187._4_4_;
          auVar266._8_4_ = (int)auVar187._8_4_;
          auVar266._12_4_ = (int)auVar187._12_4_;
          auVar163 = vpslld_avx(auVar266,0x17);
          auVar163 = vpaddd_avx(auVar322,auVar163);
          auVar164 = vfmadd213ps_fma(auVar163,auVar243,auVar228);
          auVar163 = vrcpps_avx(auVar164);
          auVar244._0_4_ = auVar163._0_4_ + auVar163._0_4_;
          auVar244._4_4_ = auVar163._4_4_ + auVar163._4_4_;
          auVar244._8_4_ = auVar163._8_4_ + auVar163._8_4_;
          auVar244._12_4_ = auVar163._12_4_ + auVar163._12_4_;
          auVar40._8_4_ = 0x40000000;
          auVar40._0_8_ = 0x4000000040000000;
          auVar40._12_4_ = 0x40000000;
          auVar164 = vfmsub213ps_avx512vl(auVar164,auVar244,auVar40);
          auVar163 = vfnmadd213ps_fma(auVar164,auVar163,auVar244);
          auVar168 = vfmsub231ps_fma(auVar168,auVar168,auVar163);
          break;
        case 6:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar175._4_4_ = uVar1;
          auVar175._0_4_ = uVar1;
          auVar175._8_4_ = uVar1;
          auVar175._12_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar169._4_4_ = uVar1;
          auVar169._0_4_ = uVar1;
          auVar169._8_4_ = uVar1;
          auVar169._12_4_ = uVar1;
          auVar163 = vfmadd213ps_avx512vl(auVar175,auVar168,auVar169);
          auVar221._12_4_ = 0;
          auVar221._0_12_ = ZEXT412(0);
          auVar163 = vmaxps_avx(auVar163,auVar221 << 0x20);
          auVar170._8_4_ = 0x3f800000;
          auVar170._0_8_ = 0x3f8000003f800000;
          auVar170._12_4_ = 0x3f800000;
          auVar163 = vminps_avx512vl(auVar163,auVar170);
          auVar168._0_4_ = auVar163._0_4_ * auVar168._0_4_;
          auVar168._4_4_ = auVar163._4_4_ * auVar168._4_4_;
          auVar168._8_4_ = auVar163._8_4_ * auVar168._8_4_;
          auVar168._12_4_ = auVar163._12_4_ * auVar168._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + local_2b8._0_8_ * 4) = auVar168;
        uVar142 = local_2b8._0_8_;
        fVar256 = local_278;
      }
      iVar137 = (int)uVar142 + (int)fVar256 * 4;
      if (iVar130 <= iVar137) goto LAB_002f0330;
      local_328 = (float)(uVar143 & 0xfffffff8);
      uVar142 = (ulong)iVar137;
      do {
        auVar300 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar8 != 0) {
          auVar300 = ZEXT464(*(uint *)(lVar8 + uVar142 * 4));
        }
        fVar256 = auVar300._0_4_;
        pauVar140 = (undefined1 (*) [16])
                    ((long)(this->weight_data_tm).w * uVar142 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        pauVar136 = local_3a8;
        if ((int)uVar143 < 8) {
          _local_218 = SUB6432(ZEXT864(0),0);
          fVar131 = 0.0;
        }
        else {
          auVar235 = ZEXT864(0);
          iVar130 = 7;
          do {
            auVar163 = vlddqu_avx(*pauVar140);
            auVar194 = vcvtph2ps_f16c(auVar163);
            auVar163 = vfmadd231ps_fma(auVar235._0_32_,auVar194,*pauVar136);
            auVar235 = ZEXT1664(auVar163);
            _local_218 = ZEXT1632(auVar163);
            pauVar136 = pauVar136 + 1;
            pauVar140 = pauVar140 + 1;
            iVar130 = iVar130 + 8;
            fVar131 = local_328;
          } while (iVar130 < (int)uVar143);
        }
        local_318 = ZEXT816(0) << 0x40;
        uVar159 = (uint)fVar131 | 3;
        while ((int)uVar159 < (int)uVar143) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)*pauVar140;
          auVar163 = vcvtph2ps_f16c(auVar4);
          local_318 = vfmadd231ps_fma(local_318,auVar163,*(undefined1 (*) [16])*pauVar136);
          pauVar136 = (undefined1 (*) [32])(*pauVar136 + 0x10);
          pauVar140 = (undefined1 (*) [16])(*pauVar140 + 8);
          uVar159 = (int)fVar131 + 7;
          fVar131 = (float)((int)fVar131 + 4);
        }
        if ((int)fVar131 < (int)uVar143) {
          lVar148 = 0;
          do {
            local_2a8._0_4_ = auVar300._0_4_;
            local_308._0_4_ = *(undefined4 *)(*pauVar136 + lVar148 * 4);
            auVar255._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar140 + lVar148 * 2));
            auVar255._4_60_ = extraout_var_01;
            auVar163 = vfmadd231ss_fma(ZEXT416((uint)local_2a8._0_4_),auVar255._0_16_,
                                       ZEXT416((uint)local_308._0_4_));
            fVar256 = auVar163._0_4_;
            auVar300 = ZEXT1664(auVar163);
            lVar148 = lVar148 + 1;
          } while (uVar143 - (int)fVar131 != (int)lVar148);
        }
        auVar223._0_4_ = fStack_208 + (float)local_218._0_4_;
        auVar223._4_4_ = fStack_204 + (float)local_218._4_4_;
        auVar223._8_4_ = fStack_200 + fStack_210;
        auVar223._12_4_ = fStack_1fc + fStack_20c;
        auVar163 = vshufps_avx(local_318,auVar223,0x41);
        auVar164 = vshufps_avx(local_318,auVar223,0xeb);
        auVar224._0_4_ = auVar164._0_4_ + auVar163._0_4_;
        auVar224._4_4_ = auVar164._4_4_ + auVar163._4_4_;
        auVar224._8_4_ = auVar164._8_4_ + auVar163._8_4_;
        auVar224._12_4_ = auVar164._12_4_ + auVar163._12_4_;
        auVar163 = vshufpd_avx(auVar224,auVar224,1);
        auVar225._0_4_ = auVar224._0_4_ + auVar163._0_4_;
        auVar225._4_4_ = auVar224._4_4_ + auVar163._4_4_;
        auVar225._8_4_ = auVar224._8_4_ + auVar163._8_4_;
        auVar225._12_4_ = auVar224._12_4_ + auVar163._12_4_;
        auVar163 = vhaddps_avx(auVar225,auVar225);
        fVar256 = fVar256 + auVar163._0_4_;
        auVar163 = ZEXT416((uint)fVar256);
        fVar131 = fVar256;
        switch(uVar5) {
        case 1:
          auVar163 = vmaxss_avx(auVar163,ZEXT416(0));
          fVar131 = auVar163._0_4_;
          break;
        case 2:
          uVar14 = vcmpss_avx512f(auVar163,ZEXT416(0),0xe);
          bVar11 = (bool)((byte)uVar14 & 1);
          fVar131 = (float)((uint)bVar11 * 0x3f800000 +
                           (uint)!bVar11 * **(int **)(&this->field_0xe8 + (long)p_Var6)) * fVar256;
          break;
        case 3:
          fVar256 = (float)(*(uint **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar163 = vmaxss_avx(auVar163,ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var6)));
          fVar131 = auVar163._0_4_;
          if (fVar256 < auVar163._0_4_) {
            fVar131 = fVar256;
          }
          break;
        case 4:
          auVar163 = vminss_avx(auVar163,SUB6416(ZEXT464(0x42b0c0a5),0));
          auVar55._8_4_ = 0x80000000;
          auVar55._0_8_ = 0x8000000080000000;
          auVar55._12_4_ = 0x80000000;
          auVar164 = vxorps_avx512vl(auVar163,auVar55);
          uVar14 = vcmpss_avx512f(auVar163,ZEXT416(0xc2b0c0a5),1);
          bVar11 = (bool)((byte)uVar14 & 1);
          fVar256 = expf((float)((uint)bVar11 * 0x42b0c0a5 + (uint)!bVar11 * auVar164._0_4_));
          fVar131 = 1.0 / (fVar256 + 1.0);
          break;
        case 5:
          local_2a8._0_4_ = fVar256;
          fVar256 = expf(fVar256);
          fVar256 = logf(fVar256 + 1.0);
          fVar256 = tanhf(fVar256);
          fVar131 = fVar256 * (float)local_2a8._0_4_;
          break;
        case 6:
          fVar2 = **(float **)(&this->field_0xe8 + (long)p_Var6);
          auVar54._8_4_ = 0x80000000;
          auVar54._0_8_ = 0x8000000080000000;
          auVar54._12_4_ = 0x80000000;
          auVar165 = ZEXT416((uint)(*(float **)(&this->field_0xe8 + (long)p_Var6))[1]);
          auVar164 = vxorps_avx512vl(auVar165,auVar54);
          fVar257 = auVar164._0_4_ / fVar2;
          fVar131 = 0.0;
          if ((fVar257 <= fVar256) && (fVar131 = fVar256, fVar256 <= fVar257 + 1.0 / fVar2)) {
            auVar163 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar163,auVar165);
            fVar131 = auVar163._0_4_ * fVar256;
          }
        }
        *(float *)((long)top_blob->data + uVar142 * 4) = fVar131;
        uVar142 = uVar142 + 1;
      } while (uVar142 != uVar135);
    }
    else {
      local_404 = 0;
      if (uVar159 != 4) goto LAB_002f0330;
      local_404 = 0;
      iVar130 = top_blob->w;
      if ((long)iVar130 < 1) goto LAB_002f0330;
      p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
      uVar5 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var6);
      lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
      uVar143 = local_390 * local_37c;
      lVar148 = 0;
      auVar221 = ZEXT816(0) << 0x40;
      auVar163 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar164 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar270._8_4_ = 0x3f000000;
      auVar270._0_8_ = 0x3f0000003f000000;
      auVar270._12_4_ = 0x3f000000;
      auVar165 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar286._8_4_ = 0x3f800000;
      auVar286._0_8_ = 0x3f8000003f800000;
      auVar286._12_4_ = 0x3f800000;
      auVar290._8_4_ = 0x3f318000;
      auVar290._0_8_ = 0x3f3180003f318000;
      auVar290._12_4_ = 0x3f318000;
      auVar301._8_4_ = 0x39506967;
      auVar301._0_8_ = 0x3950696739506967;
      auVar301._12_4_ = 0x39506967;
      auVar305._8_4_ = 0x3ab743ce;
      auVar305._0_8_ = 0x3ab743ce3ab743ce;
      auVar305._12_4_ = 0x3ab743ce;
      auVar310._8_4_ = 0x3c088908;
      auVar310._0_8_ = 0x3c0889083c088908;
      auVar310._12_4_ = 0x3c088908;
      auVar315._8_4_ = 0x3d2aa9c1;
      auVar315._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar315._12_4_ = 0x3d2aa9c1;
      auVar320._8_4_ = 0x3e2aaaaa;
      auVar320._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar320._12_4_ = 0x3e2aaaaa;
      auVar326._8_4_ = 0x3f800000;
      auVar326._0_8_ = 0x3f8000003f800000;
      auVar326._12_4_ = 0x3f800000;
      auVar330._8_4_ = 0xb95e8083;
      auVar330._0_8_ = 0xb95e8083b95e8083;
      auVar330._12_4_ = 0xb95e8083;
      auVar166 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar167 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar168 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar169 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar170 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        auVar175 = ZEXT816(0) << 0x40;
        if (lVar8 != 0) {
          auVar175 = *(undefined1 (*) [16])(lVar8 + lVar148 * 0x10);
        }
        pauVar136 = (undefined1 (*) [32])
                    ((this->weight_data_tm).w * lVar148 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        auVar171 = in_ZMM16._0_16_;
        auVar172 = in_ZMM17._0_16_;
        auVar173 = in_ZMM18._0_16_;
        pauVar151 = local_3a8;
        if ((int)uVar143 < 8) {
          auVar194 = SUB6432(ZEXT864(0),0);
          auVar173 = vxorps_avx512vl(auVar173,auVar173);
          in_ZMM18 = ZEXT1664(auVar173);
          auVar172 = vxorps_avx512vl(auVar172,auVar172);
          in_ZMM17 = ZEXT1664(auVar172);
          auVar171 = vxorps_avx512vl(auVar171,auVar171);
          in_ZMM16 = ZEXT1664(auVar171);
          uVar159 = 0;
        }
        else {
          auVar171 = vxorps_avx512vl(auVar171,auVar171);
          in_ZMM16 = ZEXT1664(auVar171);
          iVar137 = 7;
          auVar171 = vxorps_avx512vl(auVar172,auVar172);
          in_ZMM17 = ZEXT1664(auVar171);
          auVar171 = vxorps_avx512vl(auVar173,auVar173);
          in_ZMM18 = ZEXT1664(auVar171);
          auVar300 = ZEXT864(0);
          do {
            auVar171 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar151));
            auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar151 + 4)));
            auVar173 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar151 + 8)));
            auVar174 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar151 + 0xc)));
            auVar189 = vinsertf32x4_avx512vl(ZEXT1632(auVar171),auVar172,1);
            auVar190 = vinsertf32x4_avx512vl(ZEXT1632(auVar173),auVar174,1);
            auVar171 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar151 + 0x10)));
            auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar151 + 0x14)));
            auVar173 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar151 + 0x18)));
            auVar191 = vinsertf32x4_avx512vl(ZEXT1632(auVar171),auVar172,1);
            auVar171 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar151 + 0x1c)));
            auVar192 = vinsertf32x4_avx512vl(ZEXT1632(auVar173),auVar171,1);
            auVar194 = vlddqu_avx(*pauVar136);
            auVar195 = vlddqu_avx(pauVar136[1]);
            auVar193 = vcvtph2ps_avx512vl(auVar194._0_16_);
            auVar189 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar189,auVar193);
            in_ZMM16 = ZEXT3264(auVar189);
            auVar194 = vcvtph2ps_f16c(auVar194._16_16_);
            auVar194 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar190,auVar194);
            in_ZMM17 = ZEXT3264(auVar194);
            auVar194 = vcvtph2ps_f16c(auVar195._0_16_);
            auVar194 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar191,auVar194);
            in_ZMM18 = ZEXT3264(auVar194);
            auVar194 = vcvtph2ps_f16c(auVar195._16_16_);
            auVar194 = vfmadd231ps_avx512vl(auVar300._0_32_,auVar192,auVar194);
            auVar300 = ZEXT3264(auVar194);
            pauVar151 = pauVar151 + 1;
            pauVar136 = pauVar136 + 2;
            iVar137 = iVar137 + 8;
            uVar159 = uVar143 & 0xfffffff8;
          } while (iVar137 < (int)uVar143);
        }
        uVar138 = uVar159 | 3;
        while( true ) {
          if ((int)uVar143 <= (int)uVar138) break;
          uVar1 = *(undefined4 *)*pauVar151;
          auVar247._4_4_ = uVar1;
          auVar247._0_4_ = uVar1;
          auVar247._8_4_ = uVar1;
          auVar247._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(*pauVar151 + 4);
          auVar247._20_4_ = uVar1;
          auVar247._16_4_ = uVar1;
          auVar247._24_4_ = uVar1;
          auVar247._28_4_ = uVar1;
          auVar171 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar151 + 8)));
          uVar1 = *(undefined4 *)(*pauVar151 + 0xc);
          auVar258._4_4_ = uVar1;
          auVar258._0_4_ = uVar1;
          auVar258._8_4_ = uVar1;
          auVar258._12_4_ = uVar1;
          auVar189 = vinsertf32x4_avx512vl(ZEXT1632(auVar171),auVar258,1);
          auVar195 = vlddqu_avx(*pauVar136);
          auVar190 = vcvtph2ps_avx512vl(auVar195._0_16_);
          auVar190 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar247,auVar190);
          in_ZMM16 = ZEXT3264(auVar190);
          auVar195 = vcvtph2ps_f16c(auVar195._16_16_);
          auVar195 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar189,auVar195);
          in_ZMM17 = ZEXT3264(auVar195);
          pauVar151 = (undefined1 (*) [32])(*pauVar151 + 0x10);
          pauVar136 = pauVar136 + 1;
          uVar138 = uVar159 + 7;
          uVar159 = uVar159 + 4;
        }
        if (uVar143 - uVar159 != 0 && (int)uVar159 <= (int)uVar143) {
          lVar153 = 0;
          do {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)(*pauVar136 + lVar153 * 8);
            auVar171 = vcvtph2ps_f16c(auVar3);
            uVar1 = *(undefined4 *)(*pauVar151 + lVar153 * 4);
            auVar15._4_4_ = uVar1;
            auVar15._0_4_ = uVar1;
            auVar15._8_4_ = uVar1;
            auVar15._12_4_ = uVar1;
            auVar175 = vfmadd231ps_avx512vl(auVar175,auVar171,auVar15);
            lVar153 = lVar153 + 1;
          } while (uVar143 - uVar159 != (int)lVar153);
        }
        auVar194 = vaddps_avx512vl(in_ZMM18._0_32_,auVar194);
        auVar195 = vaddps_avx512vl(in_ZMM17._0_32_,in_ZMM16._0_32_);
        fVar256 = auVar194._4_4_ + auVar195._4_4_;
        auVar181._0_4_ =
             auVar194._16_4_ + auVar195._16_4_ + auVar194._0_4_ + auVar195._0_4_ + auVar175._0_4_;
        auVar181._4_4_ = fVar256 + fVar256 + auVar175._4_4_;
        auVar181._8_4_ =
             auVar194._24_4_ + auVar195._24_4_ + auVar194._8_4_ + auVar195._8_4_ + auVar175._8_4_;
        auVar181._12_4_ =
             auVar194._28_4_ + auVar195._28_4_ + auVar194._12_4_ + auVar195._12_4_ + auVar175._12_4_
        ;
        switch(uVar5) {
        case 1:
          auVar181 = vmaxps_avx(auVar181,auVar221);
          break;
        case 2:
          auVar175 = vmaxps_avx(auVar181,auVar221);
          auVar171 = vminps_avx(auVar181,auVar221);
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar30._4_4_ = uVar1;
          auVar30._0_4_ = uVar1;
          auVar30._8_4_ = uVar1;
          auVar30._12_4_ = uVar1;
          auVar181 = vfmadd132ps_avx512vl(auVar171,auVar175,auVar30);
          break;
        case 3:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar28._4_4_ = uVar1;
          auVar28._0_4_ = uVar1;
          auVar28._8_4_ = uVar1;
          auVar28._12_4_ = uVar1;
          auVar175 = vmaxps_avx512vl(auVar181,auVar28);
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar29._4_4_ = uVar1;
          auVar29._0_4_ = uVar1;
          auVar29._8_4_ = uVar1;
          auVar29._12_4_ = uVar1;
          auVar181 = vminps_avx512vl(auVar175,auVar29);
          break;
        case 4:
          auVar26._8_4_ = 0x80000000;
          auVar26._0_8_ = 0x8000000080000000;
          auVar26._12_4_ = 0x80000000;
          auVar175 = vxorps_avx512vl(auVar181,auVar26);
          auVar175 = vminps_avx512vl(auVar175,auVar163);
          auVar171 = vmaxps_avx512vl(auVar175,auVar164);
          auVar172 = vfmadd231ps_avx512vl(auVar270,auVar171,auVar165);
          auVar263._0_4_ = (int)auVar172._0_4_;
          auVar263._4_4_ = (int)auVar172._4_4_;
          auVar263._8_4_ = (int)auVar172._8_4_;
          auVar263._12_4_ = (int)auVar172._12_4_;
          auVar175 = vcvtdq2ps_avx(auVar263);
          uVar135 = vcmpps_avx512vl(auVar172,auVar175,1);
          auVar172 = vsubps_avx512vl(auVar175,auVar286);
          bVar11 = (bool)((byte)uVar135 & 1);
          auVar182._0_4_ = (float)((uint)bVar11 * auVar172._0_4_ | (uint)!bVar11 * auVar175._0_4_);
          bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
          auVar182._4_4_ = (float)((uint)bVar11 * auVar172._4_4_ | (uint)!bVar11 * auVar175._4_4_);
          bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
          auVar182._8_4_ = (float)((uint)bVar11 * auVar172._8_4_ | (uint)!bVar11 * auVar175._8_4_);
          bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
          auVar182._12_4_ =
               (float)((uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * auVar175._12_4_);
          auVar175 = vfmsub231ps_fma(auVar171,auVar182,auVar290);
          auVar27._8_4_ = 0x395e8083;
          auVar27._0_8_ = 0x395e8083395e8083;
          auVar27._12_4_ = 0x395e8083;
          auVar171 = vfmsub231ps_avx512vl(auVar175,auVar182,auVar27);
          auVar239._0_4_ = auVar171._0_4_ * auVar171._0_4_;
          auVar239._4_4_ = auVar171._4_4_ * auVar171._4_4_;
          auVar239._8_4_ = auVar171._8_4_ * auVar171._8_4_;
          auVar239._12_4_ = auVar171._12_4_ * auVar171._12_4_;
          auVar175 = vfmadd213ps_fma(auVar301,auVar171,auVar305);
          auVar175 = vfmadd213ps_fma(auVar175,auVar171,auVar310);
          auVar175 = vfmadd213ps_fma(auVar175,auVar171,auVar315);
          auVar175 = vfmadd213ps_fma(auVar175,auVar171,auVar320);
          auVar175 = vfmadd213ps_fma(auVar175,auVar171,auVar270);
          auVar175 = vfmadd213ps_fma(auVar175,auVar239,auVar171);
          auVar240._0_4_ = auVar175._0_4_ + 1.0;
          auVar240._4_4_ = auVar175._4_4_ + 1.0;
          auVar240._8_4_ = auVar175._8_4_ + 1.0;
          auVar240._12_4_ = auVar175._12_4_ + 1.0;
          auVar227._0_4_ = (int)auVar182._0_4_;
          auVar227._4_4_ = (int)auVar182._4_4_;
          auVar227._8_4_ = (int)auVar182._8_4_;
          auVar227._12_4_ = (int)auVar182._12_4_;
          auVar175 = vpslld_avx(auVar227,0x17);
          auVar175 = vpaddd_avx(auVar326,auVar175);
          auVar171 = vfmadd213ps_fma(auVar175,auVar240,auVar286);
          auVar175 = vrcpps_avx(auVar171);
          auVar171 = vfmsub213ps_fma(auVar171,auVar175,auVar286);
          auVar181 = vfnmadd132ps_fma(auVar171,auVar175,auVar175);
          break;
        case 5:
          auVar175 = vminps_avx512vl(auVar181,auVar163);
          auVar172 = vmaxps_avx512vl(auVar175,auVar164);
          auVar171 = vfmadd213ps_fma(auVar165,auVar172,auVar270);
          auVar277._0_4_ = (int)auVar171._0_4_;
          auVar277._4_4_ = (int)auVar171._4_4_;
          auVar277._8_4_ = (int)auVar171._8_4_;
          auVar277._12_4_ = (int)auVar171._12_4_;
          auVar175 = vcvtdq2ps_avx(auVar277);
          uVar135 = vcmpps_avx512vl(auVar171,auVar175,1);
          auVar171 = vsubps_avx512vl(auVar175,auVar286);
          bVar11 = (bool)((byte)uVar135 & 1);
          auVar176._0_4_ = (float)((uint)bVar11 * auVar171._0_4_ | (uint)!bVar11 * auVar175._0_4_);
          bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
          auVar176._4_4_ = (float)((uint)bVar11 * auVar171._4_4_ | (uint)!bVar11 * auVar175._4_4_);
          bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
          auVar176._8_4_ = (float)((uint)bVar11 * auVar171._8_4_ | (uint)!bVar11 * auVar175._8_4_);
          bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
          auVar176._12_4_ =
               (float)((uint)bVar11 * auVar171._12_4_ | (uint)!bVar11 * auVar175._12_4_);
          auVar175 = vfmsub231ps_fma(auVar172,auVar176,auVar290);
          auVar171 = vfnmsub231ps_fma(auVar175,auVar176,auVar330);
          auVar259._0_4_ = auVar171._0_4_ * auVar171._0_4_;
          auVar259._4_4_ = auVar171._4_4_ * auVar171._4_4_;
          auVar259._8_4_ = auVar171._8_4_ * auVar171._8_4_;
          auVar259._12_4_ = auVar171._12_4_ * auVar171._12_4_;
          auVar175 = vfmadd213ps_fma(auVar301,auVar171,auVar305);
          auVar175 = vfmadd213ps_fma(auVar175,auVar171,auVar310);
          auVar175 = vfmadd213ps_fma(auVar175,auVar171,auVar315);
          auVar175 = vfmadd213ps_fma(auVar175,auVar171,auVar320);
          auVar175 = vfmadd213ps_fma(auVar175,auVar171,auVar270);
          auVar175 = vfmadd213ps_fma(auVar175,auVar259,auVar171);
          auVar236._0_4_ = auVar175._0_4_ + 1.0;
          auVar236._4_4_ = auVar175._4_4_ + 1.0;
          auVar236._8_4_ = auVar175._8_4_ + 1.0;
          auVar236._12_4_ = auVar175._12_4_ + 1.0;
          auVar260._0_4_ = (int)auVar176._0_4_;
          auVar260._4_4_ = (int)auVar176._4_4_;
          auVar260._8_4_ = (int)auVar176._8_4_;
          auVar260._12_4_ = (int)auVar176._12_4_;
          auVar175 = vpslld_avx(auVar260,0x17);
          auVar175 = vpaddd_avx(auVar326,auVar175);
          auVar175 = vfmadd213ps_fma(auVar175,auVar236,auVar286);
          uVar135 = vcmpps_avx512vl(auVar175,auVar221,2);
          auVar17._8_4_ = 0x800000;
          auVar17._0_8_ = 0x80000000800000;
          auVar17._12_4_ = 0x800000;
          auVar175 = vmaxps_avx512vl(auVar175,auVar17);
          auVar172 = vpsrld_avx(auVar175,0x17);
          auVar278._8_4_ = 0x807fffff;
          auVar278._0_8_ = 0x807fffff807fffff;
          auVar278._12_4_ = 0x807fffff;
          auVar18._8_4_ = 0x3f000000;
          auVar18._0_8_ = 0x3f0000003f000000;
          auVar18._12_4_ = 0x3f000000;
          auVar175 = vpternlogd_avx512vl(auVar175,auVar278,auVar18,0xea);
          auVar19._8_4_ = 0x3f3504f3;
          auVar19._0_8_ = 0x3f3504f33f3504f3;
          auVar19._12_4_ = 0x3f3504f3;
          uVar142 = vcmpps_avx512vl(auVar175,auVar19,1);
          auVar20._8_4_ = 0xbf800000;
          auVar20._0_8_ = 0xbf800000bf800000;
          auVar20._12_4_ = 0xbf800000;
          auVar171 = vaddps_avx512vl(auVar175,auVar20);
          auVar175 = vaddps_avx512vl(auVar171,auVar175);
          bVar11 = (bool)((byte)uVar142 & 1);
          auVar177._0_4_ = (float)((uint)bVar11 * auVar175._0_4_ | (uint)!bVar11 * auVar171._0_4_);
          bVar11 = (bool)((byte)(uVar142 >> 1) & 1);
          auVar177._4_4_ = (float)((uint)bVar11 * auVar175._4_4_ | (uint)!bVar11 * auVar171._4_4_);
          bVar11 = (bool)((byte)(uVar142 >> 2) & 1);
          auVar177._8_4_ = (float)((uint)bVar11 * auVar175._8_4_ | (uint)!bVar11 * auVar171._8_4_);
          bVar11 = (bool)((byte)(uVar142 >> 3) & 1);
          auVar177._12_4_ =
               (float)((uint)bVar11 * auVar175._12_4_ | (uint)!bVar11 * auVar171._12_4_);
          auVar237._0_4_ = auVar177._0_4_ * auVar177._0_4_;
          auVar237._4_4_ = auVar177._4_4_ * auVar177._4_4_;
          auVar237._8_4_ = auVar177._8_4_ * auVar177._8_4_;
          auVar237._12_4_ = auVar177._12_4_ * auVar177._12_4_;
          auVar295._8_4_ = 0x3d9021bb;
          auVar295._0_8_ = 0x3d9021bb3d9021bb;
          auVar295._12_4_ = 0x3d9021bb;
          auVar21._8_4_ = 0xbdebd1b8;
          auVar21._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar21._12_4_ = 0xbdebd1b8;
          auVar175 = vfmadd213ps_avx512vl(auVar295,auVar177,auVar21);
          auVar22._8_4_ = 0x3def251a;
          auVar22._0_8_ = 0x3def251a3def251a;
          auVar22._12_4_ = 0x3def251a;
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar22);
          auVar23._8_4_ = 0xbdfe5d4f;
          auVar23._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar23._12_4_ = 0xbdfe5d4f;
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar23);
          auVar24._8_4_ = 0x3e11e9bf;
          auVar24._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar24._12_4_ = 0x3e11e9bf;
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar24);
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar166);
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar167);
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar168);
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar169);
          auVar171 = vmulps_avx512vl(auVar237,auVar177);
          in_ZMM16 = ZEXT1664(auVar171);
          auVar171 = vmulps_avx512vl(auVar171,auVar175);
          auVar25._8_4_ = 0xffffff82;
          auVar25._0_8_ = 0xffffff82ffffff82;
          auVar25._12_4_ = 0xffffff82;
          auVar175 = vpaddd_avx512vl(auVar172,auVar25);
          auVar175 = vcvtdq2ps_avx(auVar175);
          auVar172 = vsubps_avx512vl(auVar175,auVar286);
          bVar11 = (bool)((byte)uVar142 & 1);
          auVar178._0_4_ = (uint)bVar11 * auVar172._0_4_ | (uint)!bVar11 * auVar175._0_4_;
          bVar11 = (bool)((byte)(uVar142 >> 1) & 1);
          auVar178._4_4_ = (uint)bVar11 * auVar172._4_4_ | (uint)!bVar11 * auVar175._4_4_;
          bVar11 = (bool)((byte)(uVar142 >> 2) & 1);
          auVar178._8_4_ = (uint)bVar11 * auVar172._8_4_ | (uint)!bVar11 * auVar175._8_4_;
          bVar11 = (bool)((byte)(uVar142 >> 3) & 1);
          auVar178._12_4_ = (uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * auVar175._12_4_;
          auVar175 = vfmadd231ps_fma(auVar171,auVar178,auVar330);
          auVar175 = vfmsub231ps_fma(auVar175,auVar270,auVar237);
          auVar175 = vsubps_avx(auVar175,auVar177);
          auVar175 = vfnmadd231ps_fma(auVar175,auVar290,auVar178);
          auVar171 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar11 = (bool)((byte)uVar135 & 1);
          auVar179._0_4_ =
               (uint)bVar11 * auVar171._0_4_ |
               (uint)!bVar11 * (int)(auVar175._0_4_ + auVar175._0_4_);
          bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
          auVar179._4_4_ =
               (uint)bVar11 * auVar171._4_4_ |
               (uint)!bVar11 * (int)(auVar175._4_4_ + auVar175._4_4_);
          bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
          auVar179._8_4_ =
               (uint)bVar11 * auVar171._8_4_ |
               (uint)!bVar11 * (int)(auVar175._8_4_ + auVar175._8_4_);
          bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
          auVar179._12_4_ =
               (uint)bVar11 * auVar171._12_4_ |
               (uint)!bVar11 * (int)(auVar175._12_4_ + auVar175._12_4_);
          auVar175 = vminps_avx512vl(auVar179,auVar163);
          auVar172 = vmaxps_avx512vl(auVar175,auVar164);
          auVar171 = vfmadd213ps_fma(auVar165,auVar172,auVar270);
          auVar279._0_4_ = (int)auVar171._0_4_;
          auVar279._4_4_ = (int)auVar171._4_4_;
          auVar279._8_4_ = (int)auVar171._8_4_;
          auVar279._12_4_ = (int)auVar171._12_4_;
          auVar175 = vcvtdq2ps_avx(auVar279);
          uVar135 = vcmpps_avx512vl(auVar171,auVar175,1);
          auVar171 = vsubps_avx512vl(auVar175,auVar286);
          bVar11 = (bool)((byte)uVar135 & 1);
          auVar180._0_4_ = (float)((uint)bVar11 * auVar171._0_4_ | (uint)!bVar11 * auVar175._0_4_);
          bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
          auVar180._4_4_ = (float)((uint)bVar11 * auVar171._4_4_ | (uint)!bVar11 * auVar175._4_4_);
          bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
          auVar180._8_4_ = (float)((uint)bVar11 * auVar171._8_4_ | (uint)!bVar11 * auVar175._8_4_);
          bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
          auVar180._12_4_ =
               (float)((uint)bVar11 * auVar171._12_4_ | (uint)!bVar11 * auVar175._12_4_);
          auVar175 = vfmsub231ps_fma(auVar172,auVar180,auVar290);
          auVar171 = vfnmsub231ps_fma(auVar175,auVar180,auVar330);
          auVar261._0_4_ = auVar171._0_4_ * auVar171._0_4_;
          auVar261._4_4_ = auVar171._4_4_ * auVar171._4_4_;
          auVar261._8_4_ = auVar171._8_4_ * auVar171._8_4_;
          auVar261._12_4_ = auVar171._12_4_ * auVar171._12_4_;
          auVar175 = vfmadd213ps_fma(auVar301,auVar171,auVar305);
          auVar175 = vfmadd213ps_fma(auVar175,auVar171,auVar310);
          auVar175 = vfmadd213ps_fma(auVar175,auVar171,auVar315);
          auVar175 = vfmadd213ps_fma(auVar175,auVar171,auVar320);
          auVar175 = vfmadd213ps_fma(auVar175,auVar171,auVar270);
          auVar175 = vfmadd213ps_fma(auVar175,auVar261,auVar171);
          auVar238._0_4_ = auVar175._0_4_ + 1.0;
          auVar238._4_4_ = auVar175._4_4_ + 1.0;
          auVar238._8_4_ = auVar175._8_4_ + 1.0;
          auVar238._12_4_ = auVar175._12_4_ + 1.0;
          auVar262._0_4_ = (int)auVar180._0_4_;
          auVar262._4_4_ = (int)auVar180._4_4_;
          auVar262._8_4_ = (int)auVar180._8_4_;
          auVar262._12_4_ = (int)auVar180._12_4_;
          auVar175 = vpslld_avx(auVar262,0x17);
          auVar175 = vpaddd_avx(auVar326,auVar175);
          auVar171 = vfmadd213ps_fma(auVar175,auVar238,auVar286);
          auVar175 = vrcpps_avx(auVar171);
          auVar280._0_4_ = auVar175._0_4_ + auVar175._0_4_;
          auVar280._4_4_ = auVar175._4_4_ + auVar175._4_4_;
          auVar280._8_4_ = auVar175._8_4_ + auVar175._8_4_;
          auVar280._12_4_ = auVar175._12_4_ + auVar175._12_4_;
          auVar171 = vfmsub213ps_avx512vl(auVar171,auVar280,auVar170);
          auVar175 = vfnmadd213ps_fma(auVar171,auVar175,auVar280);
          auVar181 = vfmsub231ps_fma(auVar181,auVar181,auVar175);
          break;
        case 6:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar241._4_4_ = uVar1;
          auVar241._0_4_ = uVar1;
          auVar241._8_4_ = uVar1;
          auVar241._12_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar16._4_4_ = uVar1;
          auVar16._0_4_ = uVar1;
          auVar16._8_4_ = uVar1;
          auVar16._12_4_ = uVar1;
          auVar175 = vfmadd213ps_avx512vl(auVar241,auVar181,auVar16);
          auVar175 = vmaxps_avx(auVar175,auVar221);
          auVar175 = vminps_avx(auVar175,auVar286);
          auVar181._0_4_ = auVar175._0_4_ * auVar181._0_4_;
          auVar181._4_4_ = auVar175._4_4_ * auVar181._4_4_;
          auVar181._8_4_ = auVar175._8_4_ * auVar181._8_4_;
          auVar181._12_4_ = auVar175._12_4_ * auVar181._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + lVar148 * 0x10) = auVar181;
        lVar148 = lVar148 + 1;
      } while (lVar148 != iVar130);
    }
  }
  else if (uVar159 == 8) {
    local_404 = 0;
    iVar130 = top_blob->w;
    if ((long)iVar130 < 1) goto LAB_002f0330;
    p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
    iVar137 = *(int *)(&this->field_0xe0 + (long)p_Var6);
    lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
    uVar143 = local_390 * local_37c;
    lVar148 = 0;
    auVar194 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar250._8_4_ = 0xc2b0c0a5;
    auVar250._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar250._12_4_ = 0xc2b0c0a5;
    auVar250._16_4_ = 0xc2b0c0a5;
    auVar250._20_4_ = 0xc2b0c0a5;
    auVar250._24_4_ = 0xc2b0c0a5;
    auVar250._28_4_ = 0xc2b0c0a5;
    auVar276._8_4_ = 0x3f000000;
    auVar276._0_8_ = 0x3f0000003f000000;
    auVar276._12_4_ = 0x3f000000;
    auVar276._16_4_ = 0x3f000000;
    auVar276._20_4_ = 0x3f000000;
    auVar276._24_4_ = 0x3f000000;
    auVar276._28_4_ = 0x3f000000;
    auVar285._8_4_ = 0x3fb8aa3b;
    auVar285._0_8_ = 0x3fb8aa3b3fb8aa3b;
    auVar285._12_4_ = 0x3fb8aa3b;
    auVar285._16_4_ = 0x3fb8aa3b;
    auVar285._20_4_ = 0x3fb8aa3b;
    auVar285._24_4_ = 0x3fb8aa3b;
    auVar285._28_4_ = 0x3fb8aa3b;
    auVar289._8_4_ = 0x3f800000;
    auVar289._0_8_ = 0x3f8000003f800000;
    auVar289._12_4_ = 0x3f800000;
    auVar289._16_4_ = 0x3f800000;
    auVar289._20_4_ = 0x3f800000;
    auVar289._24_4_ = 0x3f800000;
    auVar289._28_4_ = 0x3f800000;
    auVar294._8_4_ = 0x3f318000;
    auVar294._0_8_ = 0x3f3180003f318000;
    auVar294._12_4_ = 0x3f318000;
    auVar294._16_4_ = 0x3f318000;
    auVar294._20_4_ = 0x3f318000;
    auVar294._24_4_ = 0x3f318000;
    auVar294._28_4_ = 0x3f318000;
    auVar304._8_4_ = 0x39506967;
    auVar304._0_8_ = 0x3950696739506967;
    auVar304._12_4_ = 0x39506967;
    auVar304._16_4_ = 0x39506967;
    auVar304._20_4_ = 0x39506967;
    auVar304._24_4_ = 0x39506967;
    auVar304._28_4_ = 0x39506967;
    auVar308._8_4_ = 0x3ab743ce;
    auVar308._0_8_ = 0x3ab743ce3ab743ce;
    auVar308._12_4_ = 0x3ab743ce;
    auVar308._16_4_ = 0x3ab743ce;
    auVar308._20_4_ = 0x3ab743ce;
    auVar308._24_4_ = 0x3ab743ce;
    auVar308._28_4_ = 0x3ab743ce;
    auVar313._8_4_ = 0x3c088908;
    auVar313._0_8_ = 0x3c0889083c088908;
    auVar313._12_4_ = 0x3c088908;
    auVar313._16_4_ = 0x3c088908;
    auVar313._20_4_ = 0x3c088908;
    auVar313._24_4_ = 0x3c088908;
    auVar313._28_4_ = 0x3c088908;
    auVar318._8_4_ = 0x3d2aa9c1;
    auVar318._0_8_ = 0x3d2aa9c13d2aa9c1;
    auVar318._12_4_ = 0x3d2aa9c1;
    auVar318._16_4_ = 0x3d2aa9c1;
    auVar318._20_4_ = 0x3d2aa9c1;
    auVar318._24_4_ = 0x3d2aa9c1;
    auVar318._28_4_ = 0x3d2aa9c1;
    auVar324._8_4_ = 0x3e2aaaaa;
    auVar324._0_8_ = 0x3e2aaaaa3e2aaaaa;
    auVar324._12_4_ = 0x3e2aaaaa;
    auVar324._16_4_ = 0x3e2aaaaa;
    auVar324._20_4_ = 0x3e2aaaaa;
    auVar324._24_4_ = 0x3e2aaaaa;
    auVar324._28_4_ = 0x3e2aaaaa;
    auVar328._8_4_ = 0x3f800000;
    auVar328._0_8_ = 0x3f8000003f800000;
    auVar328._12_4_ = 0x3f800000;
    auVar328._16_4_ = 0x3f800000;
    auVar328._20_4_ = 0x3f800000;
    auVar328._24_4_ = 0x3f800000;
    auVar328._28_4_ = 0x3f800000;
    auVar333._8_4_ = 0xb95e8083;
    auVar333._0_8_ = 0xb95e8083b95e8083;
    auVar333._12_4_ = 0xb95e8083;
    auVar333._16_4_ = 0xb95e8083;
    auVar333._20_4_ = 0xb95e8083;
    auVar333._24_4_ = 0xb95e8083;
    auVar333._28_4_ = 0xb95e8083;
    auVar195 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
    auVar189 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
    auVar190 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
    auVar191 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
    auVar192 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
    auVar193 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
    auVar202 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
    auVar203 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
    do {
      auVar300 = ZEXT1664(ZEXT816(0) << 0x40);
      if (lVar8 != 0) {
        auVar300 = ZEXT3264(*(undefined1 (*) [32])(lVar8 + lVar148 * 0x20));
      }
      pauVar136 = (undefined1 (*) [32])
                  ((this->weight_data_tm).w * lVar148 * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
      auVar165 = in_ZMM18._0_16_;
      auVar164 = in_ZMM17._0_16_;
      auVar167 = in_ZMM20._0_16_;
      auVar166 = in_ZMM19._0_16_;
      auVar168 = in_ZMM23._0_16_;
      auVar163 = in_ZMM16._0_16_;
      pauVar151 = local_3a8;
      if ((int)uVar143 < 8) {
        auVar163 = vxorps_avx512vl(auVar163,auVar163);
        auVar206 = ZEXT1632(auVar163);
        auVar163 = vxorps_avx512vl(auVar168,auVar168);
        in_ZMM23 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar166,auVar166);
        in_ZMM19 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar167,auVar167);
        in_ZMM20 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar164,auVar164);
        in_ZMM17 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar165,auVar165);
        in_ZMM18 = ZEXT1664(auVar163);
        auVar235 = ZEXT864(0);
        uVar159 = 0;
      }
      else {
        auVar235 = ZEXT864(0);
        iVar139 = 7;
        auVar165 = vxorps_avx512vl(auVar165,auVar165);
        in_ZMM18 = ZEXT1664(auVar165);
        auVar164 = vxorps_avx512vl(auVar164,auVar164);
        in_ZMM17 = ZEXT1664(auVar164);
        auVar164 = vxorps_avx512vl(auVar167,auVar167);
        in_ZMM20 = ZEXT1664(auVar164);
        auVar164 = vxorps_avx512vl(auVar166,auVar166);
        in_ZMM19 = ZEXT1664(auVar164);
        auVar164 = vxorps_avx512vl(auVar168,auVar168);
        in_ZMM23 = ZEXT1664(auVar164);
        auVar163 = vxorps_avx512vl(auVar163,auVar163);
        auVar255 = ZEXT1664(auVar163);
        do {
          auVar206 = vlddqu_avx(*pauVar136);
          auVar204 = vcvtph2ps_avx512vl(auVar206._0_16_);
          uVar5 = *(undefined4 *)*pauVar151;
          auVar205._4_4_ = uVar5;
          auVar205._0_4_ = uVar5;
          auVar205._8_4_ = uVar5;
          auVar205._12_4_ = uVar5;
          auVar205._16_4_ = uVar5;
          auVar205._20_4_ = uVar5;
          auVar205._24_4_ = uVar5;
          auVar205._28_4_ = uVar5;
          auVar205 = vfmadd231ps_avx512vl(auVar300._0_32_,auVar204,auVar205);
          auVar300 = ZEXT3264(auVar205);
          auVar206 = vcvtph2ps_f16c(auVar206._16_16_);
          uVar5 = *(undefined4 *)(*pauVar151 + 4);
          auVar204._4_4_ = uVar5;
          auVar204._0_4_ = uVar5;
          auVar204._8_4_ = uVar5;
          auVar204._12_4_ = uVar5;
          auVar204._16_4_ = uVar5;
          auVar204._20_4_ = uVar5;
          auVar204._24_4_ = uVar5;
          auVar204._28_4_ = uVar5;
          auVar206 = vfmadd231ps_avx512vl(auVar235._0_32_,auVar206,auVar204);
          auVar235 = ZEXT3264(auVar206);
          auVar206 = vlddqu_avx(pauVar136[1]);
          auVar205 = vcvtph2ps_avx512vl(auVar206._0_16_);
          uVar5 = *(undefined4 *)(*pauVar151 + 8);
          auVar207._4_4_ = uVar5;
          auVar207._0_4_ = uVar5;
          auVar207._8_4_ = uVar5;
          auVar207._12_4_ = uVar5;
          auVar207._16_4_ = uVar5;
          auVar207._20_4_ = uVar5;
          auVar207._24_4_ = uVar5;
          auVar207._28_4_ = uVar5;
          auVar205 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar205,auVar207);
          in_ZMM18 = ZEXT3264(auVar205);
          auVar206 = vcvtph2ps_f16c(auVar206._16_16_);
          uVar5 = *(undefined4 *)(*pauVar151 + 0xc);
          auVar208._4_4_ = uVar5;
          auVar208._0_4_ = uVar5;
          auVar208._8_4_ = uVar5;
          auVar208._12_4_ = uVar5;
          auVar208._16_4_ = uVar5;
          auVar208._20_4_ = uVar5;
          auVar208._24_4_ = uVar5;
          auVar208._28_4_ = uVar5;
          auVar206 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar206,auVar208);
          in_ZMM17 = ZEXT3264(auVar206);
          auVar206 = vlddqu_avx(pauVar136[2]);
          auVar205 = vcvtph2ps_avx512vl(auVar206._0_16_);
          uVar5 = *(undefined4 *)(*pauVar151 + 0x10);
          auVar56._4_4_ = uVar5;
          auVar56._0_4_ = uVar5;
          auVar56._8_4_ = uVar5;
          auVar56._12_4_ = uVar5;
          auVar56._16_4_ = uVar5;
          auVar56._20_4_ = uVar5;
          auVar56._24_4_ = uVar5;
          auVar56._28_4_ = uVar5;
          auVar205 = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar205,auVar56);
          in_ZMM20 = ZEXT3264(auVar205);
          auVar206 = vcvtph2ps_f16c(auVar206._16_16_);
          uVar5 = *(undefined4 *)(*pauVar151 + 0x14);
          auVar57._4_4_ = uVar5;
          auVar57._0_4_ = uVar5;
          auVar57._8_4_ = uVar5;
          auVar57._12_4_ = uVar5;
          auVar57._16_4_ = uVar5;
          auVar57._20_4_ = uVar5;
          auVar57._24_4_ = uVar5;
          auVar57._28_4_ = uVar5;
          auVar206 = vfmadd231ps_avx512vl(in_ZMM19._0_32_,auVar206,auVar57);
          in_ZMM19 = ZEXT3264(auVar206);
          auVar206 = vlddqu_avx(pauVar136[3]);
          auVar205 = vcvtph2ps_avx512vl(auVar206._0_16_);
          uVar5 = *(undefined4 *)(*pauVar151 + 0x18);
          auVar58._4_4_ = uVar5;
          auVar58._0_4_ = uVar5;
          auVar58._8_4_ = uVar5;
          auVar58._12_4_ = uVar5;
          auVar58._16_4_ = uVar5;
          auVar58._20_4_ = uVar5;
          auVar58._24_4_ = uVar5;
          auVar58._28_4_ = uVar5;
          auVar205 = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar205,auVar58);
          in_ZMM23 = ZEXT3264(auVar205);
          auVar206 = vcvtph2ps_f16c(auVar206._16_16_);
          uVar5 = *(undefined4 *)(*pauVar151 + 0x1c);
          auVar59._4_4_ = uVar5;
          auVar59._0_4_ = uVar5;
          auVar59._8_4_ = uVar5;
          auVar59._12_4_ = uVar5;
          auVar59._16_4_ = uVar5;
          auVar59._20_4_ = uVar5;
          auVar59._24_4_ = uVar5;
          auVar59._28_4_ = uVar5;
          auVar206 = vfmadd231ps_avx512vl(auVar255._0_32_,auVar206,auVar59);
          auVar255 = ZEXT3264(auVar206);
          pauVar151 = pauVar151 + 1;
          pauVar136 = pauVar136 + 4;
          iVar139 = iVar139 + 8;
          uVar159 = uVar143 & 0xfffffff8;
        } while (iVar139 < (int)uVar143);
      }
      auVar205 = auVar235._0_32_;
      uVar138 = uVar159 | 3;
      while( true ) {
        auVar204 = auVar300._0_32_;
        if ((int)uVar143 <= (int)uVar138) break;
        auVar205 = vlddqu_avx(*pauVar136);
        auVar207 = vcvtph2ps_avx512vl(auVar205._0_16_);
        uVar5 = *(undefined4 *)*pauVar151;
        auVar60._4_4_ = uVar5;
        auVar60._0_4_ = uVar5;
        auVar60._8_4_ = uVar5;
        auVar60._12_4_ = uVar5;
        auVar60._16_4_ = uVar5;
        auVar60._20_4_ = uVar5;
        auVar60._24_4_ = uVar5;
        auVar60._28_4_ = uVar5;
        auVar204 = vfmadd231ps_avx512vl(auVar204,auVar207,auVar60);
        auVar300 = ZEXT3264(auVar204);
        auVar205 = vcvtph2ps_f16c(auVar205._16_16_);
        uVar5 = *(undefined4 *)(*pauVar151 + 4);
        auVar61._4_4_ = uVar5;
        auVar61._0_4_ = uVar5;
        auVar61._8_4_ = uVar5;
        auVar61._12_4_ = uVar5;
        auVar61._16_4_ = uVar5;
        auVar61._20_4_ = uVar5;
        auVar61._24_4_ = uVar5;
        auVar61._28_4_ = uVar5;
        auVar205 = vfmadd231ps_avx512vl(auVar235._0_32_,auVar205,auVar61);
        auVar235 = ZEXT3264(auVar205);
        auVar204 = vlddqu_avx(pauVar136[1]);
        auVar207 = vcvtph2ps_avx512vl(auVar204._0_16_);
        uVar5 = *(undefined4 *)(*pauVar151 + 8);
        auVar62._4_4_ = uVar5;
        auVar62._0_4_ = uVar5;
        auVar62._8_4_ = uVar5;
        auVar62._12_4_ = uVar5;
        auVar62._16_4_ = uVar5;
        auVar62._20_4_ = uVar5;
        auVar62._24_4_ = uVar5;
        auVar62._28_4_ = uVar5;
        auVar207 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar207,auVar62);
        in_ZMM18 = ZEXT3264(auVar207);
        auVar204 = vcvtph2ps_f16c(auVar204._16_16_);
        uVar5 = *(undefined4 *)(*pauVar151 + 0xc);
        auVar63._4_4_ = uVar5;
        auVar63._0_4_ = uVar5;
        auVar63._8_4_ = uVar5;
        auVar63._12_4_ = uVar5;
        auVar63._16_4_ = uVar5;
        auVar63._20_4_ = uVar5;
        auVar63._24_4_ = uVar5;
        auVar63._28_4_ = uVar5;
        auVar204 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar204,auVar63);
        in_ZMM17 = ZEXT3264(auVar204);
        pauVar151 = (undefined1 (*) [32])(*pauVar151 + 0x10);
        pauVar136 = pauVar136 + 2;
        uVar138 = uVar159 + 7;
        uVar159 = uVar159 + 4;
      }
      if (uVar143 - uVar159 != 0 && (int)uVar159 <= (int)uVar143) {
        lVar153 = 0;
        do {
          auVar163 = vlddqu_avx(*(undefined1 (*) [16])*pauVar136);
          auVar204 = vcvtph2ps_f16c(auVar163);
          uVar5 = *(undefined4 *)(*pauVar151 + lVar153 * 4);
          auVar64._4_4_ = uVar5;
          auVar64._0_4_ = uVar5;
          auVar64._8_4_ = uVar5;
          auVar64._12_4_ = uVar5;
          auVar64._16_4_ = uVar5;
          auVar64._20_4_ = uVar5;
          auVar64._24_4_ = uVar5;
          auVar64._28_4_ = uVar5;
          auVar204 = vfmadd231ps_avx512vl(auVar300._0_32_,auVar204,auVar64);
          auVar300 = ZEXT3264(auVar204);
          pauVar136 = (undefined1 (*) [32])(*pauVar136 + 0x10);
          lVar153 = lVar153 + 1;
        } while (uVar143 - uVar159 != (int)lVar153);
      }
      auVar206 = vaddps_avx512vl(in_ZMM23._0_32_,auVar206);
      auVar207 = vaddps_avx512vl(in_ZMM19._0_32_,in_ZMM20._0_32_);
      auVar207 = vaddps_avx512vl(auVar206,auVar207);
      auVar206 = vaddps_avx512vl(in_ZMM17._0_32_,in_ZMM18._0_32_);
      in_ZMM16 = ZEXT3264(auVar206);
      auVar205 = vaddps_avx512vl(auVar206,auVar205);
      auVar206._0_4_ = auVar205._0_4_ + auVar207._0_4_ + auVar204._0_4_;
      auVar206._4_4_ = auVar205._4_4_ + auVar207._4_4_ + auVar204._4_4_;
      auVar206._8_4_ = auVar205._8_4_ + auVar207._8_4_ + auVar204._8_4_;
      auVar206._12_4_ = auVar205._12_4_ + auVar207._12_4_ + auVar204._12_4_;
      auVar206._16_4_ = auVar205._16_4_ + auVar207._16_4_ + auVar204._16_4_;
      auVar206._20_4_ = auVar205._20_4_ + auVar207._20_4_ + auVar204._20_4_;
      auVar206._24_4_ = auVar205._24_4_ + auVar207._24_4_ + auVar204._24_4_;
      auVar206._28_4_ = auVar205._28_4_ + auVar207._28_4_ + auVar204._28_4_;
      if (iVar137 - 1U < 6) {
        auVar205 = ZEXT1632(ZEXT816(0) << 0x40);
        switch(iVar137) {
        case 1:
          auVar206 = vmaxps_avx(auVar206,ZEXT1632(ZEXT816(0) << 0x40));
          break;
        case 2:
          auVar204 = vmaxps_avx(auVar206,auVar205);
          auVar206 = vminps_avx(auVar206,auVar205);
          uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar100._4_4_ = uVar5;
          auVar100._0_4_ = uVar5;
          auVar100._8_4_ = uVar5;
          auVar100._12_4_ = uVar5;
          auVar100._16_4_ = uVar5;
          auVar100._20_4_ = uVar5;
          auVar100._24_4_ = uVar5;
          auVar100._28_4_ = uVar5;
          auVar206 = vfmadd132ps_avx512vl(auVar206,auVar204,auVar100);
          break;
        case 3:
          uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar98._4_4_ = uVar5;
          auVar98._0_4_ = uVar5;
          auVar98._8_4_ = uVar5;
          auVar98._12_4_ = uVar5;
          auVar98._16_4_ = uVar5;
          auVar98._20_4_ = uVar5;
          auVar98._24_4_ = uVar5;
          auVar98._28_4_ = uVar5;
          auVar206 = vmaxps_avx512vl(auVar206,auVar98);
          uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar99._4_4_ = uVar5;
          auVar99._0_4_ = uVar5;
          auVar99._8_4_ = uVar5;
          auVar99._12_4_ = uVar5;
          auVar99._16_4_ = uVar5;
          auVar99._20_4_ = uVar5;
          auVar99._24_4_ = uVar5;
          auVar99._28_4_ = uVar5;
          auVar206 = vminps_avx512vl(auVar206,auVar99);
          break;
        case 4:
          auVar96._8_4_ = 0x80000000;
          auVar96._0_8_ = 0x8000000080000000;
          auVar96._12_4_ = 0x80000000;
          auVar96._16_4_ = 0x80000000;
          auVar96._20_4_ = 0x80000000;
          auVar96._24_4_ = 0x80000000;
          auVar96._28_4_ = 0x80000000;
          auVar206 = vxorps_avx512vl(auVar206,auVar96);
          auVar206 = vminps_avx512vl(auVar206,auVar194);
          auVar206 = vmaxps_avx(auVar206,auVar250);
          auVar163 = vfmadd231ps_fma(auVar276,auVar206,auVar285);
          auVar205 = vroundps_avx(ZEXT1632(auVar163),1);
          uVar135 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar205,1);
          auVar204 = vsubps_avx512vl(auVar205,auVar289);
          bVar11 = (bool)((byte)uVar135 & 1);
          auVar214._0_4_ = (float)((uint)bVar11 * auVar204._0_4_ | (uint)!bVar11 * auVar205._0_4_);
          bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
          auVar214._4_4_ = (float)((uint)bVar11 * auVar204._4_4_ | (uint)!bVar11 * auVar205._4_4_);
          bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
          auVar214._8_4_ = (float)((uint)bVar11 * auVar204._8_4_ | (uint)!bVar11 * auVar205._8_4_);
          bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
          auVar214._12_4_ =
               (float)((uint)bVar11 * auVar204._12_4_ | (uint)!bVar11 * auVar205._12_4_);
          bVar11 = (bool)((byte)(uVar135 >> 4) & 1);
          auVar214._16_4_ =
               (float)((uint)bVar11 * auVar204._16_4_ | (uint)!bVar11 * auVar205._16_4_);
          bVar11 = (bool)((byte)(uVar135 >> 5) & 1);
          auVar214._20_4_ =
               (float)((uint)bVar11 * auVar204._20_4_ | (uint)!bVar11 * auVar205._20_4_);
          bVar11 = (bool)((byte)(uVar135 >> 6) & 1);
          auVar214._24_4_ =
               (float)((uint)bVar11 * auVar204._24_4_ | (uint)!bVar11 * auVar205._24_4_);
          bVar11 = SUB81(uVar135 >> 7,0);
          auVar214._28_4_ =
               (float)((uint)bVar11 * auVar204._28_4_ | (uint)!bVar11 * auVar205._28_4_);
          auVar163 = vfmsub231ps_fma(auVar206,auVar214,auVar294);
          auVar97._8_4_ = 0x395e8083;
          auVar97._0_8_ = 0x395e8083395e8083;
          auVar97._12_4_ = 0x395e8083;
          auVar97._16_4_ = 0x395e8083;
          auVar97._20_4_ = 0x395e8083;
          auVar97._24_4_ = 0x395e8083;
          auVar97._28_4_ = 0x395e8083;
          auVar206 = vfmsub231ps_avx512vl(ZEXT1632(auVar163),auVar214,auVar97);
          auVar253._0_4_ = auVar206._0_4_ * auVar206._0_4_;
          auVar253._4_4_ = auVar206._4_4_ * auVar206._4_4_;
          auVar253._8_4_ = auVar206._8_4_ * auVar206._8_4_;
          auVar253._12_4_ = auVar206._12_4_ * auVar206._12_4_;
          auVar253._16_4_ = auVar206._16_4_ * auVar206._16_4_;
          auVar253._20_4_ = auVar206._20_4_ * auVar206._20_4_;
          auVar253._24_4_ = auVar206._24_4_ * auVar206._24_4_;
          auVar253._28_4_ = 0;
          auVar205 = vfmadd213ps_avx512vl(auVar304,auVar206,auVar308);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar206,auVar313);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar206,auVar318);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar206,auVar324);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar206,auVar276);
          auVar206 = vfmadd213ps_avx512vl(auVar205,auVar253,auVar206);
          in_ZMM16 = ZEXT3264(auVar206);
          auVar205 = vaddps_avx512vl(auVar206,auVar289);
          auVar234._0_4_ = (int)auVar214._0_4_;
          auVar234._4_4_ = (int)auVar214._4_4_;
          auVar234._8_4_ = (int)auVar214._8_4_;
          auVar234._12_4_ = (int)auVar214._12_4_;
          auVar234._16_4_ = (int)auVar214._16_4_;
          auVar234._20_4_ = (int)auVar214._20_4_;
          auVar234._24_4_ = (int)auVar214._24_4_;
          auVar234._28_4_ = (int)auVar214._28_4_;
          auVar206 = vpslld_avx2(auVar234,0x17);
          auVar206 = vpaddd_avx2(auVar328,auVar206);
          auVar163 = vfmadd213ps_fma(auVar206,auVar205,auVar289);
          auVar206 = vrcpps_avx(ZEXT1632(auVar163));
          auVar163 = vfmsub213ps_fma(ZEXT1632(auVar163),auVar206,auVar289);
          auVar163 = vfnmadd132ps_fma(ZEXT1632(auVar163),auVar206,auVar206);
          auVar206 = ZEXT1632(auVar163);
          break;
        case 5:
          auVar204 = vminps_avx512vl(auVar206,auVar194);
          auVar204 = vmaxps_avx(auVar204,auVar250);
          auVar163 = vfmadd213ps_fma(auVar285,auVar204,auVar276);
          auVar207 = vrndscaleps_avx512vl(ZEXT1632(auVar163),1);
          uVar135 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar207,1);
          auVar208 = vsubps_avx512vl(auVar207,auVar289);
          bVar11 = (bool)((byte)uVar135 & 1);
          auVar209._0_4_ = (uint)bVar11 * auVar208._0_4_ | (uint)!bVar11 * auVar207._0_4_;
          bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
          auVar209._4_4_ = (uint)bVar11 * auVar208._4_4_ | (uint)!bVar11 * auVar207._4_4_;
          bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
          auVar209._8_4_ = (uint)bVar11 * auVar208._8_4_ | (uint)!bVar11 * auVar207._8_4_;
          bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
          auVar209._12_4_ = (uint)bVar11 * auVar208._12_4_ | (uint)!bVar11 * auVar207._12_4_;
          bVar11 = (bool)((byte)(uVar135 >> 4) & 1);
          auVar209._16_4_ = (uint)bVar11 * auVar208._16_4_ | (uint)!bVar11 * auVar207._16_4_;
          bVar11 = (bool)((byte)(uVar135 >> 5) & 1);
          auVar209._20_4_ = (uint)bVar11 * auVar208._20_4_ | (uint)!bVar11 * auVar207._20_4_;
          bVar11 = (bool)((byte)(uVar135 >> 6) & 1);
          auVar209._24_4_ = (uint)bVar11 * auVar208._24_4_ | (uint)!bVar11 * auVar207._24_4_;
          bVar11 = SUB81(uVar135 >> 7,0);
          auVar209._28_4_ = (uint)bVar11 * auVar208._28_4_ | (uint)!bVar11 * auVar207._28_4_;
          auVar204 = vfmsub231ps_avx512vl(auVar204,auVar209,auVar294);
          auVar204 = vfnmsub231ps_avx512vl(auVar204,auVar209,auVar333);
          auVar298._0_4_ = auVar204._0_4_ * auVar204._0_4_;
          auVar298._4_4_ = auVar204._4_4_ * auVar204._4_4_;
          auVar298._8_4_ = auVar204._8_4_ * auVar204._8_4_;
          auVar298._12_4_ = auVar204._12_4_ * auVar204._12_4_;
          auVar298._16_4_ = auVar204._16_4_ * auVar204._16_4_;
          auVar298._20_4_ = auVar204._20_4_ * auVar204._20_4_;
          auVar298._24_4_ = auVar204._24_4_ * auVar204._24_4_;
          auVar298._28_4_ = 0;
          auVar207 = vfmadd213ps_avx512vl(auVar304,auVar204,auVar308);
          auVar207 = vfmadd213ps_avx512vl(auVar207,auVar204,auVar313);
          auVar207 = vfmadd213ps_avx512vl(auVar207,auVar204,auVar318);
          auVar207 = vfmadd213ps_avx512vl(auVar207,auVar204,auVar324);
          auVar207 = vfmadd213ps_avx512vl(auVar207,auVar204,auVar276);
          auVar204 = vfmadd213ps_avx512vl(auVar207,auVar298,auVar204);
          auVar207 = vaddps_avx512vl(auVar204,auVar289);
          auVar204 = vcvttps2dq_avx512vl(auVar209);
          auVar204 = vpslld_avx2(auVar204,0x17);
          auVar204 = vpaddd_avx2(auVar204,auVar328);
          auVar163 = vfmadd213ps_fma(auVar204,auVar207,auVar289);
          uVar135 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar205,2);
          auVar89._8_4_ = 0x800000;
          auVar89._0_8_ = 0x80000000800000;
          auVar89._12_4_ = 0x800000;
          auVar89._16_4_ = 0x800000;
          auVar89._20_4_ = 0x800000;
          auVar89._24_4_ = 0x800000;
          auVar89._28_4_ = 0x800000;
          auVar205 = vmaxps_avx512vl(ZEXT1632(auVar163),auVar89);
          auVar208 = vpsrld_avx2(auVar205,0x17);
          auVar204 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
          auVar90._8_4_ = 0x3f000000;
          auVar90._0_8_ = 0x3f0000003f000000;
          auVar90._12_4_ = 0x3f000000;
          auVar90._16_4_ = 0x3f000000;
          auVar90._20_4_ = 0x3f000000;
          auVar90._24_4_ = 0x3f000000;
          auVar90._28_4_ = 0x3f000000;
          auVar205 = vpternlogd_avx512vl(auVar205,auVar204,auVar90,0xea);
          auVar91._8_4_ = 0x3f3504f3;
          auVar91._0_8_ = 0x3f3504f33f3504f3;
          auVar91._12_4_ = 0x3f3504f3;
          auVar91._16_4_ = 0x3f3504f3;
          auVar91._20_4_ = 0x3f3504f3;
          auVar91._24_4_ = 0x3f3504f3;
          auVar91._28_4_ = 0x3f3504f3;
          uVar142 = vcmpps_avx512vl(auVar205,auVar91,1);
          auVar204 = vaddps_avx512vl(auVar205,auVar195);
          auVar205 = vaddps_avx512vl(auVar204,auVar205);
          bVar11 = (bool)((byte)uVar142 & 1);
          auVar210._0_4_ = (uint)bVar11 * auVar205._0_4_ | (uint)!bVar11 * auVar204._0_4_;
          bVar11 = (bool)((byte)(uVar142 >> 1) & 1);
          auVar210._4_4_ = (uint)bVar11 * auVar205._4_4_ | (uint)!bVar11 * auVar204._4_4_;
          bVar11 = (bool)((byte)(uVar142 >> 2) & 1);
          auVar210._8_4_ = (uint)bVar11 * auVar205._8_4_ | (uint)!bVar11 * auVar204._8_4_;
          bVar11 = (bool)((byte)(uVar142 >> 3) & 1);
          auVar210._12_4_ = (uint)bVar11 * auVar205._12_4_ | (uint)!bVar11 * auVar204._12_4_;
          bVar11 = (bool)((byte)(uVar142 >> 4) & 1);
          auVar210._16_4_ = (uint)bVar11 * auVar205._16_4_ | (uint)!bVar11 * auVar204._16_4_;
          bVar11 = (bool)((byte)(uVar142 >> 5) & 1);
          auVar210._20_4_ = (uint)bVar11 * auVar205._20_4_ | (uint)!bVar11 * auVar204._20_4_;
          bVar11 = (bool)((byte)(uVar142 >> 6) & 1);
          auVar210._24_4_ = (uint)bVar11 * auVar205._24_4_ | (uint)!bVar11 * auVar204._24_4_;
          bVar11 = SUB81(uVar142 >> 7,0);
          auVar210._28_4_ = (uint)bVar11 * auVar205._28_4_ | (uint)!bVar11 * auVar204._28_4_;
          auVar204 = vmulps_avx512vl(auVar210,auVar210);
          auVar92._8_4_ = 0xbdebd1b8;
          auVar92._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar92._12_4_ = 0xbdebd1b8;
          auVar92._16_4_ = 0xbdebd1b8;
          auVar92._20_4_ = 0xbdebd1b8;
          auVar92._24_4_ = 0xbdebd1b8;
          auVar92._28_4_ = 0xbdebd1b8;
          auVar205 = vfmadd213ps_avx512vl(auVar189,auVar210,auVar92);
          auVar93._8_4_ = 0x3def251a;
          auVar93._0_8_ = 0x3def251a3def251a;
          auVar93._12_4_ = 0x3def251a;
          auVar93._16_4_ = 0x3def251a;
          auVar93._20_4_ = 0x3def251a;
          auVar93._24_4_ = 0x3def251a;
          auVar93._28_4_ = 0x3def251a;
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar210,auVar93);
          auVar94._8_4_ = 0xbdfe5d4f;
          auVar94._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar94._12_4_ = 0xbdfe5d4f;
          auVar94._16_4_ = 0xbdfe5d4f;
          auVar94._20_4_ = 0xbdfe5d4f;
          auVar94._24_4_ = 0xbdfe5d4f;
          auVar94._28_4_ = 0xbdfe5d4f;
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar210,auVar94);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar210,auVar190);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar210,auVar191);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar210,auVar192);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar210,auVar193);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar210,auVar202);
          auVar207 = vmulps_avx512vl(auVar204,auVar210);
          in_ZMM18 = ZEXT3264(auVar207);
          auVar207 = vmulps_avx512vl(auVar207,auVar205);
          auVar95._8_4_ = 0xffffff82;
          auVar95._0_8_ = 0xffffff82ffffff82;
          auVar95._12_4_ = 0xffffff82;
          auVar95._16_4_ = 0xffffff82;
          auVar95._20_4_ = 0xffffff82;
          auVar95._24_4_ = 0xffffff82;
          auVar95._28_4_ = 0xffffff82;
          auVar205 = vpaddd_avx512vl(auVar208,auVar95);
          auVar205 = vcvtdq2ps_avx(auVar205);
          auVar208 = vsubps_avx512vl(auVar205,auVar289);
          bVar11 = (bool)((byte)uVar142 & 1);
          auVar211._0_4_ = (uint)bVar11 * auVar208._0_4_ | (uint)!bVar11 * auVar205._0_4_;
          bVar11 = (bool)((byte)(uVar142 >> 1) & 1);
          auVar211._4_4_ = (uint)bVar11 * auVar208._4_4_ | (uint)!bVar11 * auVar205._4_4_;
          bVar11 = (bool)((byte)(uVar142 >> 2) & 1);
          auVar211._8_4_ = (uint)bVar11 * auVar208._8_4_ | (uint)!bVar11 * auVar205._8_4_;
          bVar11 = (bool)((byte)(uVar142 >> 3) & 1);
          auVar211._12_4_ = (uint)bVar11 * auVar208._12_4_ | (uint)!bVar11 * auVar205._12_4_;
          bVar11 = (bool)((byte)(uVar142 >> 4) & 1);
          auVar211._16_4_ = (uint)bVar11 * auVar208._16_4_ | (uint)!bVar11 * auVar205._16_4_;
          bVar11 = (bool)((byte)(uVar142 >> 5) & 1);
          auVar211._20_4_ = (uint)bVar11 * auVar208._20_4_ | (uint)!bVar11 * auVar205._20_4_;
          bVar11 = (bool)((byte)(uVar142 >> 6) & 1);
          auVar211._24_4_ = (uint)bVar11 * auVar208._24_4_ | (uint)!bVar11 * auVar205._24_4_;
          bVar11 = SUB81(uVar142 >> 7,0);
          auVar211._28_4_ = (uint)bVar11 * auVar208._28_4_ | (uint)!bVar11 * auVar205._28_4_;
          auVar205 = vfmadd231ps_avx512vl(auVar207,auVar211,auVar333);
          auVar205 = vfmsub231ps_avx512vl(auVar205,auVar276,auVar204);
          auVar205 = vsubps_avx512vl(auVar205,auVar210);
          auVar163 = vfmsub231ps_fma(auVar205,auVar294,auVar211);
          auVar205 = vmulps_avx512vl(ZEXT1632(auVar163),auVar203);
          auVar204 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar11 = (bool)((byte)uVar135 & 1);
          auVar212._0_4_ = (uint)bVar11 * auVar204._0_4_ | (uint)!bVar11 * auVar205._0_4_;
          bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
          auVar212._4_4_ = (uint)bVar11 * auVar204._4_4_ | (uint)!bVar11 * auVar205._4_4_;
          bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
          auVar212._8_4_ = (uint)bVar11 * auVar204._8_4_ | (uint)!bVar11 * auVar205._8_4_;
          bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
          auVar212._12_4_ = (uint)bVar11 * auVar204._12_4_ | (uint)!bVar11 * auVar205._12_4_;
          bVar11 = (bool)((byte)(uVar135 >> 4) & 1);
          auVar212._16_4_ = (uint)bVar11 * auVar204._16_4_ | (uint)!bVar11 * auVar205._16_4_;
          bVar11 = (bool)((byte)(uVar135 >> 5) & 1);
          auVar212._20_4_ = (uint)bVar11 * auVar204._20_4_ | (uint)!bVar11 * auVar205._20_4_;
          bVar11 = (bool)((byte)(uVar135 >> 6) & 1);
          auVar212._24_4_ = (uint)bVar11 * auVar204._24_4_ | (uint)!bVar11 * auVar205._24_4_;
          bVar11 = SUB81(uVar135 >> 7,0);
          auVar212._28_4_ = (uint)bVar11 * auVar204._28_4_ | (uint)!bVar11 * auVar205._28_4_;
          auVar205 = vminps_avx512vl(auVar212,auVar194);
          auVar205 = vmaxps_avx(auVar205,auVar250);
          auVar163 = vfmadd213ps_fma(auVar285,auVar205,auVar276);
          auVar204 = vrndscaleps_avx512vl(ZEXT1632(auVar163),1);
          uVar135 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar204,1);
          auVar207 = vsubps_avx512vl(auVar204,auVar289);
          bVar11 = (bool)((byte)uVar135 & 1);
          auVar213._0_4_ = (uint)bVar11 * auVar207._0_4_ | (uint)!bVar11 * auVar204._0_4_;
          bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
          auVar213._4_4_ = (uint)bVar11 * auVar207._4_4_ | (uint)!bVar11 * auVar204._4_4_;
          bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
          auVar213._8_4_ = (uint)bVar11 * auVar207._8_4_ | (uint)!bVar11 * auVar204._8_4_;
          bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
          auVar213._12_4_ = (uint)bVar11 * auVar207._12_4_ | (uint)!bVar11 * auVar204._12_4_;
          bVar11 = (bool)((byte)(uVar135 >> 4) & 1);
          auVar213._16_4_ = (uint)bVar11 * auVar207._16_4_ | (uint)!bVar11 * auVar204._16_4_;
          bVar11 = (bool)((byte)(uVar135 >> 5) & 1);
          auVar213._20_4_ = (uint)bVar11 * auVar207._20_4_ | (uint)!bVar11 * auVar204._20_4_;
          bVar11 = (bool)((byte)(uVar135 >> 6) & 1);
          auVar213._24_4_ = (uint)bVar11 * auVar207._24_4_ | (uint)!bVar11 * auVar204._24_4_;
          bVar11 = SUB81(uVar135 >> 7,0);
          auVar213._28_4_ = (uint)bVar11 * auVar207._28_4_ | (uint)!bVar11 * auVar204._28_4_;
          in_ZMM16 = ZEXT3264(auVar213);
          auVar205 = vfmsub231ps_avx512vl(auVar205,auVar213,auVar294);
          auVar205 = vfnmsub231ps_avx512vl(auVar205,auVar213,auVar333);
          auVar299._0_4_ = auVar205._0_4_ * auVar205._0_4_;
          auVar299._4_4_ = auVar205._4_4_ * auVar205._4_4_;
          auVar299._8_4_ = auVar205._8_4_ * auVar205._8_4_;
          auVar299._12_4_ = auVar205._12_4_ * auVar205._12_4_;
          auVar299._16_4_ = auVar205._16_4_ * auVar205._16_4_;
          auVar299._20_4_ = auVar205._20_4_ * auVar205._20_4_;
          auVar299._24_4_ = auVar205._24_4_ * auVar205._24_4_;
          auVar299._28_4_ = 0;
          auVar204 = vfmadd213ps_avx512vl(auVar304,auVar205,auVar308);
          auVar204 = vfmadd213ps_avx512vl(auVar204,auVar205,auVar313);
          auVar204 = vfmadd213ps_avx512vl(auVar204,auVar205,auVar318);
          auVar204 = vfmadd213ps_avx512vl(auVar204,auVar205,auVar324);
          auVar204 = vfmadd213ps_avx512vl(auVar204,auVar205,auVar276);
          auVar205 = vfmadd213ps_avx512vl(auVar204,auVar299,auVar205);
          in_ZMM17 = ZEXT3264(auVar205);
          auVar204 = vaddps_avx512vl(auVar205,auVar289);
          auVar205 = vcvttps2dq_avx512vl(auVar213);
          auVar205 = vpslld_avx2(auVar205,0x17);
          auVar205 = vpaddd_avx2(auVar205,auVar328);
          auVar163 = vfmadd213ps_fma(auVar205,auVar204,auVar289);
          auVar205 = vrcpps_avx(ZEXT1632(auVar163));
          auVar163 = vfmsub213ps_fma(ZEXT1632(auVar163),auVar205,auVar289);
          auVar163 = vfnmadd132ps_fma(ZEXT1632(auVar163),auVar205,auVar205);
          auVar205 = vfnmadd213ps_avx512vl(ZEXT1632(auVar163),auVar203,auVar195);
          auVar206._4_4_ = auVar205._4_4_ * auVar206._4_4_;
          auVar206._0_4_ = auVar205._0_4_ * auVar206._0_4_;
          auVar206._8_4_ = auVar205._8_4_ * auVar206._8_4_;
          auVar206._12_4_ = auVar205._12_4_ * auVar206._12_4_;
          auVar206._16_4_ = auVar205._16_4_ * auVar206._16_4_;
          auVar206._20_4_ = auVar205._20_4_ * auVar206._20_4_;
          auVar206._24_4_ = auVar205._24_4_ * auVar206._24_4_;
          break;
        case 6:
          uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar254._4_4_ = uVar5;
          auVar254._0_4_ = uVar5;
          auVar254._8_4_ = uVar5;
          auVar254._12_4_ = uVar5;
          auVar254._16_4_ = uVar5;
          auVar254._20_4_ = uVar5;
          auVar254._24_4_ = uVar5;
          auVar254._28_4_ = uVar5;
          uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar88._4_4_ = uVar5;
          auVar88._0_4_ = uVar5;
          auVar88._8_4_ = uVar5;
          auVar88._12_4_ = uVar5;
          auVar88._16_4_ = uVar5;
          auVar88._20_4_ = uVar5;
          auVar88._24_4_ = uVar5;
          auVar88._28_4_ = uVar5;
          auVar204 = vfmadd213ps_avx512vl(auVar254,auVar206,auVar88);
          auVar205 = vmaxps_avx(auVar204,auVar205);
          auVar205 = vminps_avx(auVar205,auVar289);
          auVar206._4_4_ = auVar205._4_4_ * auVar206._4_4_;
          auVar206._0_4_ = auVar205._0_4_ * auVar206._0_4_;
          auVar206._8_4_ = auVar205._8_4_ * auVar206._8_4_;
          auVar206._12_4_ = auVar205._12_4_ * auVar206._12_4_;
          auVar206._16_4_ = auVar205._16_4_ * auVar206._16_4_;
          auVar206._20_4_ = auVar205._20_4_ * auVar206._20_4_;
          auVar206._24_4_ = auVar205._24_4_ * auVar206._24_4_;
        }
      }
      *(undefined1 (*) [32])((long)top_blob->data + lVar148 * 0x20) = auVar206;
      lVar148 = lVar148 + 1;
    } while (lVar148 != iVar130);
  }
  else {
    local_404 = 0;
    if ((uVar159 != 0x10) || (iVar130 = top_blob->w, (long)iVar130 < 1)) goto LAB_002f0330;
    p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
    uVar5 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var6);
    lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
    uVar143 = local_390 * local_37c;
    auVar300 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar235 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar300);
    auVar255 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar300);
    auVar309 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
    auVar314 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar300);
    lVar148 = 0;
    auVar163 = vxorps_avx512vl(auVar163,auVar163);
    auVar329 = ZEXT1664(auVar163);
    auVar319 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar325 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
    do {
      auVar163 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      auVar334 = ZEXT1664(auVar163);
      if (lVar8 != 0) {
        auVar334 = *(undefined1 (*) [64])(lVar8 + lVar148 * 0x40);
      }
      pauVar151 = (undefined1 (*) [32])
                  ((this->weight_data_tm).w * lVar148 * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
      auVar164 = in_ZMM18._0_16_;
      auVar169 = in_ZMM23._0_16_;
      auVar167 = in_ZMM21._0_16_;
      auVar168 = in_ZMM22._0_16_;
      auVar165 = in_ZMM19._0_16_;
      auVar166 = in_ZMM20._0_16_;
      auVar163 = in_ZMM17._0_16_;
      pauVar136 = local_3a8;
      if ((int)uVar143 < 8) {
        auVar164 = vxorps_avx512vl(auVar164,auVar164);
        auVar336 = ZEXT1664(auVar164);
        auVar164 = vxorps_avx512vl(auVar169,auVar169);
        in_ZMM23 = ZEXT1664(auVar164);
        auVar164 = vxorps_avx512vl(auVar167,auVar167);
        in_ZMM21 = ZEXT1664(auVar164);
        auVar164 = vxorps_avx512vl(auVar168,auVar168);
        in_ZMM22 = ZEXT1664(auVar164);
        auVar164 = vxorps_avx512vl(auVar165,auVar165);
        in_ZMM19 = ZEXT1664(auVar164);
        auVar164 = vxorps_avx512vl(auVar166,auVar166);
        in_ZMM20 = ZEXT1664(auVar164);
        auVar163 = vxorps_avx512vl(auVar163,auVar163);
        auVar335 = ZEXT1664(auVar163);
        uVar159 = 0;
      }
      else {
        auVar163 = vxorps_avx512vl(auVar163,auVar163);
        auVar335 = ZEXT1664(auVar163);
        iVar137 = 7;
        auVar163 = vxorps_avx512vl(auVar166,auVar166);
        in_ZMM20 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar165,auVar165);
        in_ZMM19 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar168,auVar168);
        in_ZMM22 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar167,auVar167);
        in_ZMM21 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar169,auVar169);
        in_ZMM23 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar164,auVar164);
        auVar336 = ZEXT1664(auVar163);
        do {
          auVar215 = vcvtph2ps_avx512f(*pauVar151);
          uVar1 = *(undefined4 *)*pauVar136;
          auVar216._4_4_ = uVar1;
          auVar216._0_4_ = uVar1;
          auVar216._8_4_ = uVar1;
          auVar216._12_4_ = uVar1;
          auVar216._16_4_ = uVar1;
          auVar216._20_4_ = uVar1;
          auVar216._24_4_ = uVar1;
          auVar216._28_4_ = uVar1;
          auVar216._32_4_ = uVar1;
          auVar216._36_4_ = uVar1;
          auVar216._40_4_ = uVar1;
          auVar216._44_4_ = uVar1;
          auVar216._48_4_ = uVar1;
          auVar216._52_4_ = uVar1;
          auVar216._56_4_ = uVar1;
          auVar216._60_4_ = uVar1;
          auVar334 = vfmadd231ps_avx512f(auVar334,auVar215,auVar216);
          auVar216 = vcvtph2ps_avx512f(pauVar151[1]);
          uVar1 = *(undefined4 *)(*pauVar136 + 4);
          auVar215._4_4_ = uVar1;
          auVar215._0_4_ = uVar1;
          auVar215._8_4_ = uVar1;
          auVar215._12_4_ = uVar1;
          auVar215._16_4_ = uVar1;
          auVar215._20_4_ = uVar1;
          auVar215._24_4_ = uVar1;
          auVar215._28_4_ = uVar1;
          auVar215._32_4_ = uVar1;
          auVar215._36_4_ = uVar1;
          auVar215._40_4_ = uVar1;
          auVar215._44_4_ = uVar1;
          auVar215._48_4_ = uVar1;
          auVar215._52_4_ = uVar1;
          auVar215._56_4_ = uVar1;
          auVar215._60_4_ = uVar1;
          auVar335 = vfmadd231ps_avx512f(auVar335,auVar216,auVar215);
          auVar216 = vcvtph2ps_avx512f(pauVar151[2]);
          uVar1 = *(undefined4 *)(*pauVar136 + 8);
          auVar218._4_4_ = uVar1;
          auVar218._0_4_ = uVar1;
          auVar218._8_4_ = uVar1;
          auVar218._12_4_ = uVar1;
          auVar218._16_4_ = uVar1;
          auVar218._20_4_ = uVar1;
          auVar218._24_4_ = uVar1;
          auVar218._28_4_ = uVar1;
          auVar218._32_4_ = uVar1;
          auVar218._36_4_ = uVar1;
          auVar218._40_4_ = uVar1;
          auVar218._44_4_ = uVar1;
          auVar218._48_4_ = uVar1;
          auVar218._52_4_ = uVar1;
          auVar218._56_4_ = uVar1;
          auVar218._60_4_ = uVar1;
          in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar216,auVar218);
          auVar216 = vcvtph2ps_avx512f(pauVar151[3]);
          uVar1 = *(undefined4 *)(*pauVar136 + 0xc);
          auVar101._4_4_ = uVar1;
          auVar101._0_4_ = uVar1;
          auVar101._8_4_ = uVar1;
          auVar101._12_4_ = uVar1;
          auVar101._16_4_ = uVar1;
          auVar101._20_4_ = uVar1;
          auVar101._24_4_ = uVar1;
          auVar101._28_4_ = uVar1;
          auVar101._32_4_ = uVar1;
          auVar101._36_4_ = uVar1;
          auVar101._40_4_ = uVar1;
          auVar101._44_4_ = uVar1;
          auVar101._48_4_ = uVar1;
          auVar101._52_4_ = uVar1;
          auVar101._56_4_ = uVar1;
          auVar101._60_4_ = uVar1;
          in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar216,auVar101);
          auVar216 = vcvtph2ps_avx512f(pauVar151[4]);
          uVar1 = *(undefined4 *)(*pauVar136 + 0x10);
          auVar102._4_4_ = uVar1;
          auVar102._0_4_ = uVar1;
          auVar102._8_4_ = uVar1;
          auVar102._12_4_ = uVar1;
          auVar102._16_4_ = uVar1;
          auVar102._20_4_ = uVar1;
          auVar102._24_4_ = uVar1;
          auVar102._28_4_ = uVar1;
          auVar102._32_4_ = uVar1;
          auVar102._36_4_ = uVar1;
          auVar102._40_4_ = uVar1;
          auVar102._44_4_ = uVar1;
          auVar102._48_4_ = uVar1;
          auVar102._52_4_ = uVar1;
          auVar102._56_4_ = uVar1;
          auVar102._60_4_ = uVar1;
          in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar216,auVar102);
          auVar216 = vcvtph2ps_avx512f(pauVar151[5]);
          uVar1 = *(undefined4 *)(*pauVar136 + 0x14);
          auVar103._4_4_ = uVar1;
          auVar103._0_4_ = uVar1;
          auVar103._8_4_ = uVar1;
          auVar103._12_4_ = uVar1;
          auVar103._16_4_ = uVar1;
          auVar103._20_4_ = uVar1;
          auVar103._24_4_ = uVar1;
          auVar103._28_4_ = uVar1;
          auVar103._32_4_ = uVar1;
          auVar103._36_4_ = uVar1;
          auVar103._40_4_ = uVar1;
          auVar103._44_4_ = uVar1;
          auVar103._48_4_ = uVar1;
          auVar103._52_4_ = uVar1;
          auVar103._56_4_ = uVar1;
          auVar103._60_4_ = uVar1;
          in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar216,auVar103);
          auVar216 = vcvtph2ps_avx512f(pauVar151[6]);
          uVar1 = *(undefined4 *)(*pauVar136 + 0x18);
          auVar104._4_4_ = uVar1;
          auVar104._0_4_ = uVar1;
          auVar104._8_4_ = uVar1;
          auVar104._12_4_ = uVar1;
          auVar104._16_4_ = uVar1;
          auVar104._20_4_ = uVar1;
          auVar104._24_4_ = uVar1;
          auVar104._28_4_ = uVar1;
          auVar104._32_4_ = uVar1;
          auVar104._36_4_ = uVar1;
          auVar104._40_4_ = uVar1;
          auVar104._44_4_ = uVar1;
          auVar104._48_4_ = uVar1;
          auVar104._52_4_ = uVar1;
          auVar104._56_4_ = uVar1;
          auVar104._60_4_ = uVar1;
          in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar216,auVar104);
          auVar216 = vcvtph2ps_avx512f(pauVar151[7]);
          uVar1 = *(undefined4 *)(*pauVar136 + 0x1c);
          auVar105._4_4_ = uVar1;
          auVar105._0_4_ = uVar1;
          auVar105._8_4_ = uVar1;
          auVar105._12_4_ = uVar1;
          auVar105._16_4_ = uVar1;
          auVar105._20_4_ = uVar1;
          auVar105._24_4_ = uVar1;
          auVar105._28_4_ = uVar1;
          auVar105._32_4_ = uVar1;
          auVar105._36_4_ = uVar1;
          auVar105._40_4_ = uVar1;
          auVar105._44_4_ = uVar1;
          auVar105._48_4_ = uVar1;
          auVar105._52_4_ = uVar1;
          auVar105._56_4_ = uVar1;
          auVar105._60_4_ = uVar1;
          auVar336 = vfmadd231ps_avx512f(auVar336,auVar216,auVar105);
          pauVar136 = pauVar136 + 1;
          pauVar151 = pauVar151 + 8;
          iVar137 = iVar137 + 8;
          uVar159 = uVar143 & 0xfffffff8;
        } while (iVar137 < (int)uVar143);
      }
      uVar138 = uVar159 | 3;
      while ((int)uVar138 < (int)uVar143) {
        auVar216 = vcvtph2ps_avx512f(*pauVar151);
        uVar1 = *(undefined4 *)*pauVar136;
        auVar106._4_4_ = uVar1;
        auVar106._0_4_ = uVar1;
        auVar106._8_4_ = uVar1;
        auVar106._12_4_ = uVar1;
        auVar106._16_4_ = uVar1;
        auVar106._20_4_ = uVar1;
        auVar106._24_4_ = uVar1;
        auVar106._28_4_ = uVar1;
        auVar106._32_4_ = uVar1;
        auVar106._36_4_ = uVar1;
        auVar106._40_4_ = uVar1;
        auVar106._44_4_ = uVar1;
        auVar106._48_4_ = uVar1;
        auVar106._52_4_ = uVar1;
        auVar106._56_4_ = uVar1;
        auVar106._60_4_ = uVar1;
        auVar334 = vfmadd231ps_avx512f(auVar334,auVar216,auVar106);
        auVar216 = vcvtph2ps_avx512f(pauVar151[1]);
        uVar1 = *(undefined4 *)(*pauVar136 + 4);
        auVar107._4_4_ = uVar1;
        auVar107._0_4_ = uVar1;
        auVar107._8_4_ = uVar1;
        auVar107._12_4_ = uVar1;
        auVar107._16_4_ = uVar1;
        auVar107._20_4_ = uVar1;
        auVar107._24_4_ = uVar1;
        auVar107._28_4_ = uVar1;
        auVar107._32_4_ = uVar1;
        auVar107._36_4_ = uVar1;
        auVar107._40_4_ = uVar1;
        auVar107._44_4_ = uVar1;
        auVar107._48_4_ = uVar1;
        auVar107._52_4_ = uVar1;
        auVar107._56_4_ = uVar1;
        auVar107._60_4_ = uVar1;
        auVar335 = vfmadd231ps_avx512f(auVar335,auVar216,auVar107);
        auVar216 = vcvtph2ps_avx512f(pauVar151[2]);
        uVar1 = *(undefined4 *)(*pauVar136 + 8);
        auVar108._4_4_ = uVar1;
        auVar108._0_4_ = uVar1;
        auVar108._8_4_ = uVar1;
        auVar108._12_4_ = uVar1;
        auVar108._16_4_ = uVar1;
        auVar108._20_4_ = uVar1;
        auVar108._24_4_ = uVar1;
        auVar108._28_4_ = uVar1;
        auVar108._32_4_ = uVar1;
        auVar108._36_4_ = uVar1;
        auVar108._40_4_ = uVar1;
        auVar108._44_4_ = uVar1;
        auVar108._48_4_ = uVar1;
        auVar108._52_4_ = uVar1;
        auVar108._56_4_ = uVar1;
        auVar108._60_4_ = uVar1;
        in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar216,auVar108);
        auVar216 = vcvtph2ps_avx512f(pauVar151[3]);
        uVar1 = *(undefined4 *)(*pauVar136 + 0xc);
        auVar109._4_4_ = uVar1;
        auVar109._0_4_ = uVar1;
        auVar109._8_4_ = uVar1;
        auVar109._12_4_ = uVar1;
        auVar109._16_4_ = uVar1;
        auVar109._20_4_ = uVar1;
        auVar109._24_4_ = uVar1;
        auVar109._28_4_ = uVar1;
        auVar109._32_4_ = uVar1;
        auVar109._36_4_ = uVar1;
        auVar109._40_4_ = uVar1;
        auVar109._44_4_ = uVar1;
        auVar109._48_4_ = uVar1;
        auVar109._52_4_ = uVar1;
        auVar109._56_4_ = uVar1;
        auVar109._60_4_ = uVar1;
        in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar216,auVar109);
        pauVar136 = (undefined1 (*) [32])(*pauVar136 + 0x10);
        pauVar151 = pauVar151 + 4;
        uVar138 = uVar159 + 7;
        uVar159 = uVar159 + 4;
      }
      if (uVar143 - uVar159 != 0 && (int)uVar159 <= (int)uVar143) {
        lVar153 = 0;
        do {
          auVar194 = vlddqu_avx(*pauVar151);
          auVar216 = vcvtph2ps_avx512f(auVar194);
          uVar1 = *(undefined4 *)(*pauVar136 + lVar153 * 4);
          auVar110._4_4_ = uVar1;
          auVar110._0_4_ = uVar1;
          auVar110._8_4_ = uVar1;
          auVar110._12_4_ = uVar1;
          auVar110._16_4_ = uVar1;
          auVar110._20_4_ = uVar1;
          auVar110._24_4_ = uVar1;
          auVar110._28_4_ = uVar1;
          auVar110._32_4_ = uVar1;
          auVar110._36_4_ = uVar1;
          auVar110._40_4_ = uVar1;
          auVar110._44_4_ = uVar1;
          auVar110._48_4_ = uVar1;
          auVar110._52_4_ = uVar1;
          auVar110._56_4_ = uVar1;
          auVar110._60_4_ = uVar1;
          auVar334 = vfmadd231ps_avx512f(auVar334,auVar216,auVar110);
          pauVar151 = pauVar151 + 1;
          lVar153 = lVar153 + 1;
        } while (uVar143 - uVar159 != (int)lVar153);
      }
      auVar336 = vaddps_avx512f(in_ZMM23,auVar336);
      auVar216 = vaddps_avx512f(in_ZMM21,in_ZMM22);
      auVar336 = vaddps_avx512f(auVar336,auVar216);
      in_ZMM18 = vaddps_avx512f(in_ZMM19,in_ZMM20);
      in_ZMM17 = vaddps_avx512f(in_ZMM18,auVar335);
      auVar335 = vaddps_avx512f(auVar336,in_ZMM17);
      auVar334 = vaddps_avx512f(auVar335,auVar334);
      in_ZMM16 = auVar334;
      switch(uVar5) {
      case 1:
        in_ZMM16 = vmaxps_avx512f(auVar334,auVar329);
        break;
      case 2:
        uVar135 = vcmpps_avx512f(auVar334,auVar329,1);
        uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
        auVar112._4_4_ = uVar1;
        auVar112._0_4_ = uVar1;
        auVar112._8_4_ = uVar1;
        auVar112._12_4_ = uVar1;
        auVar112._16_4_ = uVar1;
        auVar112._20_4_ = uVar1;
        auVar112._24_4_ = uVar1;
        auVar112._28_4_ = uVar1;
        auVar112._32_4_ = uVar1;
        auVar112._36_4_ = uVar1;
        auVar112._40_4_ = uVar1;
        auVar112._44_4_ = uVar1;
        auVar112._48_4_ = uVar1;
        auVar112._52_4_ = uVar1;
        auVar112._56_4_ = uVar1;
        auVar112._60_4_ = uVar1;
        auVar335 = vmulps_avx512f(auVar334,auVar112);
        bVar11 = (bool)((byte)uVar135 & 1);
        in_ZMM16._0_4_ = (uint)bVar11 * auVar335._0_4_ | (uint)!bVar11 * auVar334._0_4_;
        bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
        in_ZMM16._4_4_ = (uint)bVar11 * auVar335._4_4_ | (uint)!bVar11 * auVar334._4_4_;
        bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
        in_ZMM16._8_4_ = (uint)bVar11 * auVar335._8_4_ | (uint)!bVar11 * auVar334._8_4_;
        bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
        in_ZMM16._12_4_ = (uint)bVar11 * auVar335._12_4_ | (uint)!bVar11 * auVar334._12_4_;
        bVar11 = (bool)((byte)(uVar135 >> 4) & 1);
        in_ZMM16._16_4_ = (uint)bVar11 * auVar335._16_4_ | (uint)!bVar11 * auVar334._16_4_;
        bVar11 = (bool)((byte)(uVar135 >> 5) & 1);
        in_ZMM16._20_4_ = (uint)bVar11 * auVar335._20_4_ | (uint)!bVar11 * auVar334._20_4_;
        bVar11 = (bool)((byte)(uVar135 >> 6) & 1);
        in_ZMM16._24_4_ = (uint)bVar11 * auVar335._24_4_ | (uint)!bVar11 * auVar334._24_4_;
        bVar11 = (bool)((byte)(uVar135 >> 7) & 1);
        in_ZMM16._28_4_ = (uint)bVar11 * auVar335._28_4_ | (uint)!bVar11 * auVar334._28_4_;
        bVar11 = (bool)((byte)(uVar135 >> 8) & 1);
        in_ZMM16._32_4_ = (uint)bVar11 * auVar335._32_4_ | (uint)!bVar11 * auVar334._32_4_;
        bVar11 = (bool)((byte)(uVar135 >> 9) & 1);
        in_ZMM16._36_4_ = (uint)bVar11 * auVar335._36_4_ | (uint)!bVar11 * auVar334._36_4_;
        bVar11 = (bool)((byte)(uVar135 >> 10) & 1);
        in_ZMM16._40_4_ = (uint)bVar11 * auVar335._40_4_ | (uint)!bVar11 * auVar334._40_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xb) & 1);
        in_ZMM16._44_4_ = (uint)bVar11 * auVar335._44_4_ | (uint)!bVar11 * auVar334._44_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xc) & 1);
        in_ZMM16._48_4_ = (uint)bVar11 * auVar335._48_4_ | (uint)!bVar11 * auVar334._48_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xd) & 1);
        in_ZMM16._52_4_ = (uint)bVar11 * auVar335._52_4_ | (uint)!bVar11 * auVar334._52_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xe) & 1);
        in_ZMM16._56_4_ = (uint)bVar11 * auVar335._56_4_ | (uint)!bVar11 * auVar334._56_4_;
        bVar11 = SUB81(uVar135 >> 0xf,0);
        in_ZMM16._60_4_ = (uint)bVar11 * auVar335._60_4_ | (uint)!bVar11 * auVar334._60_4_;
        break;
      case 3:
        uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
        auVar111._4_4_ = uVar1;
        auVar111._0_4_ = uVar1;
        auVar111._8_4_ = uVar1;
        auVar111._12_4_ = uVar1;
        auVar111._16_4_ = uVar1;
        auVar111._20_4_ = uVar1;
        auVar111._24_4_ = uVar1;
        auVar111._28_4_ = uVar1;
        auVar111._32_4_ = uVar1;
        auVar111._36_4_ = uVar1;
        auVar111._40_4_ = uVar1;
        auVar111._44_4_ = uVar1;
        auVar111._48_4_ = uVar1;
        auVar111._52_4_ = uVar1;
        auVar111._56_4_ = uVar1;
        auVar111._60_4_ = uVar1;
        auVar335 = vmaxps_avx512f(auVar334,auVar111);
        uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
        auVar334._4_4_ = uVar1;
        auVar334._0_4_ = uVar1;
        auVar334._8_4_ = uVar1;
        auVar334._12_4_ = uVar1;
        auVar334._16_4_ = uVar1;
        auVar334._20_4_ = uVar1;
        auVar334._24_4_ = uVar1;
        auVar334._28_4_ = uVar1;
        auVar334._32_4_ = uVar1;
        auVar334._36_4_ = uVar1;
        auVar334._40_4_ = uVar1;
        auVar334._44_4_ = uVar1;
        auVar334._48_4_ = uVar1;
        auVar334._52_4_ = uVar1;
        auVar334._56_4_ = uVar1;
        auVar334._60_4_ = uVar1;
        in_ZMM16 = vminps_avx512f(auVar335,auVar334);
        break;
      case 4:
        auVar334 = vxorps_avx512dq(auVar334,auVar300);
        auVar334 = vminps_avx512f(auVar334,(undefined1  [64])afVar117);
        auVar334 = vmaxps_avx512f(auVar334,(undefined1  [64])afVar118);
        auVar335 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar334,
                                       (undefined1  [64])afVar125);
        auVar336 = vrndscaleps_avx512f(auVar335,1);
        uVar135 = vcmpps_avx512f(auVar335,auVar336,1);
        auVar335 = vsubps_avx512f(auVar336,(undefined1  [64])afVar116);
        bVar11 = (bool)((byte)uVar135 & 1);
        in_ZMM17._0_4_ = (uint)bVar11 * auVar335._0_4_ | (uint)!bVar11 * auVar336._0_4_;
        bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
        in_ZMM17._4_4_ = (uint)bVar11 * auVar335._4_4_ | (uint)!bVar11 * auVar336._4_4_;
        bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
        in_ZMM17._8_4_ = (uint)bVar11 * auVar335._8_4_ | (uint)!bVar11 * auVar336._8_4_;
        bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
        in_ZMM17._12_4_ = (uint)bVar11 * auVar335._12_4_ | (uint)!bVar11 * auVar336._12_4_;
        bVar11 = (bool)((byte)(uVar135 >> 4) & 1);
        in_ZMM17._16_4_ = (uint)bVar11 * auVar335._16_4_ | (uint)!bVar11 * auVar336._16_4_;
        bVar11 = (bool)((byte)(uVar135 >> 5) & 1);
        in_ZMM17._20_4_ = (uint)bVar11 * auVar335._20_4_ | (uint)!bVar11 * auVar336._20_4_;
        bVar11 = (bool)((byte)(uVar135 >> 6) & 1);
        in_ZMM17._24_4_ = (uint)bVar11 * auVar335._24_4_ | (uint)!bVar11 * auVar336._24_4_;
        bVar11 = (bool)((byte)(uVar135 >> 7) & 1);
        in_ZMM17._28_4_ = (uint)bVar11 * auVar335._28_4_ | (uint)!bVar11 * auVar336._28_4_;
        bVar11 = (bool)((byte)(uVar135 >> 8) & 1);
        in_ZMM17._32_4_ = (uint)bVar11 * auVar335._32_4_ | (uint)!bVar11 * auVar336._32_4_;
        bVar11 = (bool)((byte)(uVar135 >> 9) & 1);
        in_ZMM17._36_4_ = (uint)bVar11 * auVar335._36_4_ | (uint)!bVar11 * auVar336._36_4_;
        bVar11 = (bool)((byte)(uVar135 >> 10) & 1);
        in_ZMM17._40_4_ = (uint)bVar11 * auVar335._40_4_ | (uint)!bVar11 * auVar336._40_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xb) & 1);
        in_ZMM17._44_4_ = (uint)bVar11 * auVar335._44_4_ | (uint)!bVar11 * auVar336._44_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xc) & 1);
        in_ZMM17._48_4_ = (uint)bVar11 * auVar335._48_4_ | (uint)!bVar11 * auVar336._48_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xd) & 1);
        in_ZMM17._52_4_ = (uint)bVar11 * auVar335._52_4_ | (uint)!bVar11 * auVar336._52_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xe) & 1);
        in_ZMM17._56_4_ = (uint)bVar11 * auVar335._56_4_ | (uint)!bVar11 * auVar336._56_4_;
        bVar11 = SUB81(uVar135 >> 0xf,0);
        in_ZMM17._60_4_ = (uint)bVar11 * auVar335._60_4_ | (uint)!bVar11 * auVar336._60_4_;
        auVar334 = vfmadd231ps_avx512f(auVar334,in_ZMM17,auVar235);
        auVar334 = vfmadd231ps_avx512f(auVar334,in_ZMM17,auVar255);
        auVar335 = vmulps_avx512f(auVar334,auVar334);
        auVar336 = vfmadd213ps_avx512f(auVar334,(undefined1  [64])afVar120,
                                       (undefined1  [64])afVar121);
        auVar336 = vfmadd213ps_avx512f(auVar336,auVar334,(undefined1  [64])afVar122);
        auVar336 = vfmadd213ps_avx512f(auVar336,auVar334,(undefined1  [64])afVar123);
        auVar336 = vfmadd213ps_avx512f(auVar336,auVar334,(undefined1  [64])afVar124);
        auVar336 = vfmadd213ps_avx512f(auVar336,auVar334,(undefined1  [64])afVar125);
        in_ZMM18 = vfmadd213ps_avx512f(auVar336,auVar335,auVar334);
        auVar334 = vaddps_avx512f(in_ZMM18,(undefined1  [64])afVar116);
        auVar335 = vcvttps2dq_avx512f(in_ZMM17);
        auVar335 = vpaddd_avx512f(auVar335,auVar309);
        auVar335 = vpslld_avx512f(auVar335,0x17);
        auVar334 = vfmadd213ps_avx512f(auVar335,auVar334,auVar319);
        auVar335 = vrcp14ps_avx512f(auVar334);
        auVar334 = vfmsub213ps_avx512f(auVar334,auVar335,auVar319);
        in_ZMM16 = vfnmadd132ps_avx512vl(auVar334,auVar335,auVar335);
        break;
      case 5:
        auVar335 = vminps_avx512f(auVar334,(undefined1  [64])afVar117);
        auVar335 = vmaxps_avx512f(auVar335,(undefined1  [64])afVar118);
        auVar336 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar335,
                                       (undefined1  [64])afVar125);
        auVar216 = vrndscaleps_avx512f(auVar336,1);
        uVar135 = vcmpps_avx512f(auVar336,auVar216,1);
        auVar336 = vsubps_avx512f(auVar216,(undefined1  [64])afVar116);
        bVar11 = (bool)((byte)uVar135 & 1);
        auVar217._0_4_ = (uint)bVar11 * auVar336._0_4_ | (uint)!bVar11 * auVar216._0_4_;
        bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
        auVar217._4_4_ = (uint)bVar11 * auVar336._4_4_ | (uint)!bVar11 * auVar216._4_4_;
        bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
        auVar217._8_4_ = (uint)bVar11 * auVar336._8_4_ | (uint)!bVar11 * auVar216._8_4_;
        bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
        auVar217._12_4_ = (uint)bVar11 * auVar336._12_4_ | (uint)!bVar11 * auVar216._12_4_;
        bVar11 = (bool)((byte)(uVar135 >> 4) & 1);
        auVar217._16_4_ = (uint)bVar11 * auVar336._16_4_ | (uint)!bVar11 * auVar216._16_4_;
        bVar11 = (bool)((byte)(uVar135 >> 5) & 1);
        auVar217._20_4_ = (uint)bVar11 * auVar336._20_4_ | (uint)!bVar11 * auVar216._20_4_;
        bVar11 = (bool)((byte)(uVar135 >> 6) & 1);
        auVar217._24_4_ = (uint)bVar11 * auVar336._24_4_ | (uint)!bVar11 * auVar216._24_4_;
        bVar11 = (bool)((byte)(uVar135 >> 7) & 1);
        auVar217._28_4_ = (uint)bVar11 * auVar336._28_4_ | (uint)!bVar11 * auVar216._28_4_;
        bVar11 = (bool)((byte)(uVar135 >> 8) & 1);
        auVar217._32_4_ = (uint)bVar11 * auVar336._32_4_ | (uint)!bVar11 * auVar216._32_4_;
        bVar11 = (bool)((byte)(uVar135 >> 9) & 1);
        auVar217._36_4_ = (uint)bVar11 * auVar336._36_4_ | (uint)!bVar11 * auVar216._36_4_;
        bVar11 = (bool)((byte)(uVar135 >> 10) & 1);
        auVar217._40_4_ = (uint)bVar11 * auVar336._40_4_ | (uint)!bVar11 * auVar216._40_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xb) & 1);
        auVar217._44_4_ = (uint)bVar11 * auVar336._44_4_ | (uint)!bVar11 * auVar216._44_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xc) & 1);
        auVar217._48_4_ = (uint)bVar11 * auVar336._48_4_ | (uint)!bVar11 * auVar216._48_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xd) & 1);
        auVar217._52_4_ = (uint)bVar11 * auVar336._52_4_ | (uint)!bVar11 * auVar216._52_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xe) & 1);
        auVar217._56_4_ = (uint)bVar11 * auVar336._56_4_ | (uint)!bVar11 * auVar216._56_4_;
        bVar11 = SUB81(uVar135 >> 0xf,0);
        auVar217._60_4_ = (uint)bVar11 * auVar336._60_4_ | (uint)!bVar11 * auVar216._60_4_;
        auVar335 = vfmadd231ps_avx512f(auVar335,auVar217,auVar235);
        auVar335 = vfmadd231ps_avx512f(auVar335,auVar217,auVar255);
        auVar336 = vmulps_avx512f(auVar335,auVar335);
        auVar216 = vfmadd213ps_avx512f(auVar335,(undefined1  [64])afVar120,
                                       (undefined1  [64])afVar121);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar335,(undefined1  [64])afVar122);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar335,(undefined1  [64])afVar123);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar335,(undefined1  [64])afVar124);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar335,(undefined1  [64])afVar125);
        auVar335 = vfmadd213ps_avx512f(auVar216,auVar336,auVar335);
        auVar335 = vaddps_avx512f(auVar335,(undefined1  [64])afVar116);
        auVar336 = vcvttps2dq_avx512f(auVar217);
        auVar336 = vpaddd_avx512f(auVar336,auVar309);
        auVar336 = vpslld_avx512f(auVar336,0x17);
        auVar335 = vfmadd213ps_avx512f(auVar336,auVar335,auVar319);
        auVar336 = vmaxps_avx512f(auVar335,(undefined1  [64])_ps512_min_norm_pos);
        auVar216 = vpsrld_avx512f(auVar336,0x17);
        auVar336 = vpternlogd_avx512f(auVar336,(undefined1  [64])afVar125,
                                      (undefined1  [64])_ps512_inv_mant_mask,0xec);
        uVar135 = vcmpps_avx512f(auVar336,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar215 = vsubps_avx512f(auVar336,(undefined1  [64])afVar116);
        auVar218 = vaddps_avx512f(auVar215,auVar336);
        bVar11 = (bool)((byte)uVar135 & 1);
        auVar336._0_4_ = (uint)bVar11 * auVar218._0_4_ | (uint)!bVar11 * auVar215._0_4_;
        bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
        auVar336._4_4_ = (uint)bVar11 * auVar218._4_4_ | (uint)!bVar11 * auVar215._4_4_;
        bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
        auVar336._8_4_ = (uint)bVar11 * auVar218._8_4_ | (uint)!bVar11 * auVar215._8_4_;
        bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
        auVar336._12_4_ = (uint)bVar11 * auVar218._12_4_ | (uint)!bVar11 * auVar215._12_4_;
        bVar11 = (bool)((byte)(uVar135 >> 4) & 1);
        auVar336._16_4_ = (uint)bVar11 * auVar218._16_4_ | (uint)!bVar11 * auVar215._16_4_;
        bVar11 = (bool)((byte)(uVar135 >> 5) & 1);
        auVar336._20_4_ = (uint)bVar11 * auVar218._20_4_ | (uint)!bVar11 * auVar215._20_4_;
        bVar11 = (bool)((byte)(uVar135 >> 6) & 1);
        auVar336._24_4_ = (uint)bVar11 * auVar218._24_4_ | (uint)!bVar11 * auVar215._24_4_;
        bVar11 = (bool)((byte)(uVar135 >> 7) & 1);
        auVar336._28_4_ = (uint)bVar11 * auVar218._28_4_ | (uint)!bVar11 * auVar215._28_4_;
        bVar12 = (byte)(uVar135 >> 8);
        bVar11 = (bool)(bVar12 & 1);
        auVar336._32_4_ = (uint)bVar11 * auVar218._32_4_ | (uint)!bVar11 * auVar215._32_4_;
        bVar11 = (bool)((byte)(uVar135 >> 9) & 1);
        auVar336._36_4_ = (uint)bVar11 * auVar218._36_4_ | (uint)!bVar11 * auVar215._36_4_;
        bVar11 = (bool)((byte)(uVar135 >> 10) & 1);
        auVar336._40_4_ = (uint)bVar11 * auVar218._40_4_ | (uint)!bVar11 * auVar215._40_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xb) & 1);
        auVar336._44_4_ = (uint)bVar11 * auVar218._44_4_ | (uint)!bVar11 * auVar215._44_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xc) & 1);
        auVar336._48_4_ = (uint)bVar11 * auVar218._48_4_ | (uint)!bVar11 * auVar215._48_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xd) & 1);
        auVar336._52_4_ = (uint)bVar11 * auVar218._52_4_ | (uint)!bVar11 * auVar215._52_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xe) & 1);
        auVar336._56_4_ = (uint)bVar11 * auVar218._56_4_ | (uint)!bVar11 * auVar215._56_4_;
        bVar11 = SUB81(uVar135 >> 0xf,0);
        auVar336._60_4_ = (uint)bVar11 * auVar218._60_4_ | (uint)!bVar11 * auVar215._60_4_;
        auVar215 = vmulps_avx512f(auVar336,auVar336);
        auVar218 = vfmadd132ps_avx512f(auVar336,(undefined1  [64])_ps512_cephes_log_p1,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar218 = vfmadd213ps_avx512f(auVar218,auVar336,(undefined1  [64])_ps512_cephes_log_p2);
        auVar218 = vfmadd213ps_avx512f(auVar218,auVar336,(undefined1  [64])_ps512_cephes_log_p3);
        auVar218 = vfmadd213ps_avx512f(auVar218,auVar336,(undefined1  [64])_ps512_cephes_log_p4);
        auVar218 = vfmadd213ps_avx512f(auVar218,auVar336,(undefined1  [64])_ps512_cephes_log_p5);
        auVar218 = vfmadd213ps_avx512f(auVar218,auVar336,(undefined1  [64])_ps512_cephes_log_p6);
        auVar218 = vfmadd213ps_avx512f(auVar218,auVar336,(undefined1  [64])afVar126);
        in_ZMM20 = vfmadd213ps_avx512f(auVar218,auVar336,(undefined1  [64])afVar127);
        auVar218 = vmulps_avx512f(auVar215,auVar336);
        auVar336 = vfmadd213ps_avx512f(auVar218,in_ZMM20,auVar336);
        uVar142 = vcmpps_avx512f(auVar335,auVar329,2);
        auVar335 = vpsubd_avx512f(auVar216,auVar309);
        auVar335 = vcvtdq2ps_avx512f(auVar335);
        auVar216 = vaddps_avx512f(auVar335,(undefined1  [64])afVar116);
        bVar11 = (bool)((byte)uVar135 & 1);
        auVar219._0_4_ = (uint)bVar11 * auVar335._0_4_ | (uint)!bVar11 * auVar216._0_4_;
        bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
        auVar219._4_4_ = (uint)bVar11 * auVar335._4_4_ | (uint)!bVar11 * auVar216._4_4_;
        bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
        auVar219._8_4_ = (uint)bVar11 * auVar335._8_4_ | (uint)!bVar11 * auVar216._8_4_;
        bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
        auVar219._12_4_ = (uint)bVar11 * auVar335._12_4_ | (uint)!bVar11 * auVar216._12_4_;
        bVar11 = (bool)((byte)(uVar135 >> 4) & 1);
        auVar219._16_4_ = (uint)bVar11 * auVar335._16_4_ | (uint)!bVar11 * auVar216._16_4_;
        bVar11 = (bool)((byte)(uVar135 >> 5) & 1);
        auVar219._20_4_ = (uint)bVar11 * auVar335._20_4_ | (uint)!bVar11 * auVar216._20_4_;
        bVar11 = (bool)((byte)(uVar135 >> 6) & 1);
        auVar219._24_4_ = (uint)bVar11 * auVar335._24_4_ | (uint)!bVar11 * auVar216._24_4_;
        bVar11 = (bool)((byte)(uVar135 >> 7) & 1);
        auVar219._28_4_ = (uint)bVar11 * auVar335._28_4_ | (uint)!bVar11 * auVar216._28_4_;
        bVar11 = (bool)(bVar12 & 1);
        auVar219._32_4_ = (uint)bVar11 * auVar335._32_4_ | (uint)!bVar11 * auVar216._32_4_;
        bVar11 = (bool)((byte)(uVar135 >> 9) & 1);
        auVar219._36_4_ = (uint)bVar11 * auVar335._36_4_ | (uint)!bVar11 * auVar216._36_4_;
        bVar11 = (bool)((byte)(uVar135 >> 10) & 1);
        auVar219._40_4_ = (uint)bVar11 * auVar335._40_4_ | (uint)!bVar11 * auVar216._40_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xb) & 1);
        auVar219._44_4_ = (uint)bVar11 * auVar335._44_4_ | (uint)!bVar11 * auVar216._44_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xc) & 1);
        auVar219._48_4_ = (uint)bVar11 * auVar335._48_4_ | (uint)!bVar11 * auVar216._48_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xd) & 1);
        auVar219._52_4_ = (uint)bVar11 * auVar335._52_4_ | (uint)!bVar11 * auVar216._52_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xe) & 1);
        auVar219._56_4_ = (uint)bVar11 * auVar335._56_4_ | (uint)!bVar11 * auVar216._56_4_;
        bVar11 = SUB81(uVar135 >> 0xf,0);
        auVar219._60_4_ = (uint)bVar11 * auVar335._60_4_ | (uint)!bVar11 * auVar216._60_4_;
        auVar335 = vfmadd231ps_avx512f(auVar336,auVar219,(undefined1  [64])afVar128);
        auVar335 = vfmadd231ps_avx512f(auVar335,auVar314,auVar215);
        in_ZMM21 = vfmadd231ps_avx512f(auVar335,(undefined1  [64])afVar129,auVar219);
        auVar335 = vmulps_avx512f(in_ZMM21,auVar325);
        auVar336 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        bVar11 = (bool)((byte)uVar142 & 1);
        auVar220._0_4_ = (uint)bVar11 * auVar336._0_4_ | (uint)!bVar11 * auVar335._0_4_;
        bVar11 = (bool)((byte)(uVar142 >> 1) & 1);
        auVar220._4_4_ = (uint)bVar11 * auVar336._4_4_ | (uint)!bVar11 * auVar335._4_4_;
        bVar11 = (bool)((byte)(uVar142 >> 2) & 1);
        auVar220._8_4_ = (uint)bVar11 * auVar336._8_4_ | (uint)!bVar11 * auVar335._8_4_;
        bVar11 = (bool)((byte)(uVar142 >> 3) & 1);
        auVar220._12_4_ = (uint)bVar11 * auVar336._12_4_ | (uint)!bVar11 * auVar335._12_4_;
        bVar11 = (bool)((byte)(uVar142 >> 4) & 1);
        auVar220._16_4_ = (uint)bVar11 * auVar336._16_4_ | (uint)!bVar11 * auVar335._16_4_;
        bVar11 = (bool)((byte)(uVar142 >> 5) & 1);
        auVar220._20_4_ = (uint)bVar11 * auVar336._20_4_ | (uint)!bVar11 * auVar335._20_4_;
        bVar11 = (bool)((byte)(uVar142 >> 6) & 1);
        auVar220._24_4_ = (uint)bVar11 * auVar336._24_4_ | (uint)!bVar11 * auVar335._24_4_;
        bVar11 = (bool)((byte)(uVar142 >> 7) & 1);
        auVar220._28_4_ = (uint)bVar11 * auVar336._28_4_ | (uint)!bVar11 * auVar335._28_4_;
        bVar11 = (bool)((byte)(uVar142 >> 8) & 1);
        auVar220._32_4_ = (uint)bVar11 * auVar336._32_4_ | (uint)!bVar11 * auVar335._32_4_;
        bVar11 = (bool)((byte)(uVar142 >> 9) & 1);
        auVar220._36_4_ = (uint)bVar11 * auVar336._36_4_ | (uint)!bVar11 * auVar335._36_4_;
        bVar11 = (bool)((byte)(uVar142 >> 10) & 1);
        auVar220._40_4_ = (uint)bVar11 * auVar336._40_4_ | (uint)!bVar11 * auVar335._40_4_;
        bVar11 = (bool)((byte)(uVar142 >> 0xb) & 1);
        auVar220._44_4_ = (uint)bVar11 * auVar336._44_4_ | (uint)!bVar11 * auVar335._44_4_;
        bVar11 = (bool)((byte)(uVar142 >> 0xc) & 1);
        auVar220._48_4_ = (uint)bVar11 * auVar336._48_4_ | (uint)!bVar11 * auVar335._48_4_;
        bVar11 = (bool)((byte)(uVar142 >> 0xd) & 1);
        auVar220._52_4_ = (uint)bVar11 * auVar336._52_4_ | (uint)!bVar11 * auVar335._52_4_;
        bVar11 = (bool)((byte)(uVar142 >> 0xe) & 1);
        auVar220._56_4_ = (uint)bVar11 * auVar336._56_4_ | (uint)!bVar11 * auVar335._56_4_;
        bVar11 = SUB81(uVar142 >> 0xf,0);
        auVar220._60_4_ = (uint)bVar11 * auVar336._60_4_ | (uint)!bVar11 * auVar335._60_4_;
        auVar335 = vminps_avx512f(auVar220,(undefined1  [64])afVar117);
        auVar335 = vmaxps_avx512f(auVar335,(undefined1  [64])afVar118);
        auVar336 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar335,
                                       (undefined1  [64])afVar125);
        auVar216 = vrndscaleps_avx512f(auVar336,1);
        uVar135 = vcmpps_avx512f(auVar336,auVar216,1);
        auVar336 = vsubps_avx512f(auVar216,(undefined1  [64])afVar116);
        bVar11 = (bool)((byte)uVar135 & 1);
        in_ZMM18._0_4_ = (uint)bVar11 * auVar336._0_4_ | (uint)!bVar11 * auVar216._0_4_;
        bVar11 = (bool)((byte)(uVar135 >> 1) & 1);
        in_ZMM18._4_4_ = (uint)bVar11 * auVar336._4_4_ | (uint)!bVar11 * auVar216._4_4_;
        bVar11 = (bool)((byte)(uVar135 >> 2) & 1);
        in_ZMM18._8_4_ = (uint)bVar11 * auVar336._8_4_ | (uint)!bVar11 * auVar216._8_4_;
        bVar11 = (bool)((byte)(uVar135 >> 3) & 1);
        in_ZMM18._12_4_ = (uint)bVar11 * auVar336._12_4_ | (uint)!bVar11 * auVar216._12_4_;
        bVar11 = (bool)((byte)(uVar135 >> 4) & 1);
        in_ZMM18._16_4_ = (uint)bVar11 * auVar336._16_4_ | (uint)!bVar11 * auVar216._16_4_;
        bVar11 = (bool)((byte)(uVar135 >> 5) & 1);
        in_ZMM18._20_4_ = (uint)bVar11 * auVar336._20_4_ | (uint)!bVar11 * auVar216._20_4_;
        bVar11 = (bool)((byte)(uVar135 >> 6) & 1);
        in_ZMM18._24_4_ = (uint)bVar11 * auVar336._24_4_ | (uint)!bVar11 * auVar216._24_4_;
        bVar11 = (bool)((byte)(uVar135 >> 7) & 1);
        in_ZMM18._28_4_ = (uint)bVar11 * auVar336._28_4_ | (uint)!bVar11 * auVar216._28_4_;
        bVar11 = (bool)((byte)(uVar135 >> 8) & 1);
        in_ZMM18._32_4_ = (uint)bVar11 * auVar336._32_4_ | (uint)!bVar11 * auVar216._32_4_;
        bVar11 = (bool)((byte)(uVar135 >> 9) & 1);
        in_ZMM18._36_4_ = (uint)bVar11 * auVar336._36_4_ | (uint)!bVar11 * auVar216._36_4_;
        bVar11 = (bool)((byte)(uVar135 >> 10) & 1);
        in_ZMM18._40_4_ = (uint)bVar11 * auVar336._40_4_ | (uint)!bVar11 * auVar216._40_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xb) & 1);
        in_ZMM18._44_4_ = (uint)bVar11 * auVar336._44_4_ | (uint)!bVar11 * auVar216._44_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xc) & 1);
        in_ZMM18._48_4_ = (uint)bVar11 * auVar336._48_4_ | (uint)!bVar11 * auVar216._48_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xd) & 1);
        in_ZMM18._52_4_ = (uint)bVar11 * auVar336._52_4_ | (uint)!bVar11 * auVar216._52_4_;
        bVar11 = (bool)((byte)(uVar135 >> 0xe) & 1);
        in_ZMM18._56_4_ = (uint)bVar11 * auVar336._56_4_ | (uint)!bVar11 * auVar216._56_4_;
        bVar11 = SUB81(uVar135 >> 0xf,0);
        in_ZMM18._60_4_ = (uint)bVar11 * auVar336._60_4_ | (uint)!bVar11 * auVar216._60_4_;
        auVar335 = vfmadd231ps_avx512f(auVar335,in_ZMM18,auVar235);
        auVar335 = vfmadd231ps_avx512f(auVar335,in_ZMM18,auVar255);
        auVar336 = vmulps_avx512f(auVar335,auVar335);
        auVar216 = vfmadd213ps_avx512f(auVar335,(undefined1  [64])afVar120,
                                       (undefined1  [64])afVar121);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar335,(undefined1  [64])afVar122);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar335,(undefined1  [64])afVar123);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar335,(undefined1  [64])afVar124);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar335,(undefined1  [64])afVar125);
        in_ZMM19 = vfmadd213ps_avx512f(auVar216,auVar336,auVar335);
        auVar335 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar116);
        auVar336 = vcvttps2dq_avx512f(in_ZMM18);
        auVar336 = vpaddd_avx512f(auVar336,auVar309);
        auVar336 = vpslld_avx512f(auVar336,0x17);
        auVar335 = vfmadd213ps_avx512f(auVar336,auVar335,auVar319);
        auVar336 = vrcp14ps_avx512f(auVar335);
        auVar335 = vfmsub213ps_avx512f(auVar335,auVar336,auVar319);
        auVar335 = vfnmadd132ps_avx512vl(auVar335,auVar336,auVar336);
        in_ZMM17 = vfnmsub213ps_avx512f(auVar335,auVar325,auVar319);
        in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar334);
        break;
      case 6:
        auVar336 = vbroadcastss_avx512f(ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var6)));
        uVar159 = (*(uint **)(&this->field_0xe8 + (long)p_Var6))[1];
        auVar335._4_4_ = uVar159;
        auVar335._0_4_ = uVar159;
        auVar335._8_4_ = uVar159;
        auVar335._12_4_ = uVar159;
        auVar335._16_4_ = uVar159;
        auVar335._20_4_ = uVar159;
        auVar335._24_4_ = uVar159;
        auVar335._28_4_ = uVar159;
        auVar335._32_4_ = uVar159;
        auVar335._36_4_ = uVar159;
        auVar335._40_4_ = uVar159;
        auVar335._44_4_ = uVar159;
        auVar335._48_4_ = uVar159;
        auVar335._52_4_ = uVar159;
        auVar335._56_4_ = uVar159;
        auVar335._60_4_ = uVar159;
        auVar335 = vfmadd213ps_avx512f(auVar336,auVar334,auVar335);
        auVar335 = vmaxps_avx512f(auVar335,auVar329);
        auVar335 = vminps_avx512f(auVar335,auVar319);
        in_ZMM16 = vmulps_avx512f(auVar335,auVar334);
      }
      *(undefined1 (*) [64])((long)top_blob->data + lVar148 * 0x40) = in_ZMM16;
      lVar148 = lVar148 + 1;
    } while (lVar148 != iVar130);
  }
  local_404 = 0;
LAB_002f0330:
  if (piStack_3a0 != (int *)0x0) {
    LOCK();
    *piStack_3a0 = *piStack_3a0 + -1;
    UNLOCK();
    if (*piStack_3a0 == 0) {
      if (local_388 == (Allocator *)0x0) {
        if (local_3a8 != (undefined1 (*) [32])0x0) {
          free(local_3a8);
        }
      }
      else {
        (*local_388->_vptr_Allocator[3])();
      }
    }
  }
  return local_404;
}

Assistant:

int InnerProduct_x86_avx512::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __AVX512F__
    if (out_elempack == 16)
    {
        innerproduct_fp16s_pack16_avx512(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        innerproduct_fp16s_pack8_avx(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 4)
    {
        innerproduct_fp16s_pack4_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 1)
    {
        innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    return 0;
}